

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

char * duckdb_yyjson::yyjson_mut_write_opts_impl
                 (yyjson_mut_val *val,usize estimated_val_num,yyjson_write_flag flg,
                 yyjson_alc *alc_ptr,usize *dat_len,yyjson_write_err *err)

{
  byte bVar1;
  ushort uVar2;
  undefined4 uVar3;
  _func_void_ptr_void_ptr_size_t *p_Var4;
  _func_void_void_ptr_void_ptr *p_Var5;
  void *pvVar6;
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *p_Var7;
  void *pvVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  ulong uVar103;
  uint64_t uVar104;
  ulong uVar105;
  ulong uVar106;
  ulong uVar107;
  char *pcVar108;
  byte *pbVar109;
  undefined2 uVar110;
  byte *pbVar111;
  uint *puVar112;
  undefined8 uVar113;
  long lVar114;
  long lVar115;
  yyjson_write_err *pyVar116;
  yyjson_write_err *pyVar117;
  uint uVar118;
  int iVar119;
  undefined **ppuVar120;
  ulong uVar121;
  uint *puVar122;
  ulong uVar123;
  size_t sVar124;
  ulong uVar125;
  uint *puVar126;
  ulong *puVar127;
  uint *puVar128;
  undefined8 *puVar129;
  char cVar130;
  undefined1 *puVar131;
  uint uVar132;
  int iVar133;
  size_t sVar134;
  yyjson_mut_val *pyVar135;
  yyjson_mut_val *pyVar136;
  long lVar137;
  int iVar138;
  long lVar139;
  int iVar140;
  uint uVar141;
  undefined2 *puVar142;
  ulong uVar143;
  long lVar144;
  long lVar145;
  int iVar146;
  uint uVar147;
  int iVar148;
  long lVar149;
  long lVar150;
  uint uVar151;
  long lVar152;
  ushort *puVar153;
  uint *puVar154;
  byte bVar155;
  uint uVar156;
  byte *pbVar157;
  size_t sVar158;
  undefined1 *puVar159;
  ulong uVar160;
  bool bVar161;
  bool bVar162;
  long lStack_120;
  uint *local_110;
  char local_fc;
  ulong *local_f8;
  ulong local_f0;
  uint local_e0;
  uint *local_d0;
  ulong local_c0;
  ulong *local_b0;
  yyjson_mut_val *local_80;
  yyjson_write_err dummy_err;
  ulong local_40;
  
  ppuVar120 = &YYJSON_DEFAULT_ALC;
  if (alc_ptr != (yyjson_alc *)0x0) {
    ppuVar120 = &alc_ptr->malloc;
  }
  pyVar117 = err;
  if (err == (yyjson_write_err *)0x0) {
    pyVar117 = &dummy_err;
  }
  if (val == (yyjson_mut_val *)0x0) {
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar116 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar116 = err;
    }
    pyVar116->msg = "input JSON is NULL";
    pyVar117->code = 1;
    return (char *)0x0;
  }
  p_Var4 = ((yyjson_alc *)ppuVar120)->malloc;
  p_Var5 = ((yyjson_alc *)ppuVar120)->free;
  pvVar6 = ((yyjson_alc *)ppuVar120)->ctx;
  uVar106 = val->tag;
  bVar155 = (byte)uVar106;
  local_fc = (char)flg;
  if (0xff < uVar106 && (~bVar155 & 6) == 0) {
    p_Var7 = ((yyjson_alc *)ppuVar120)->realloc;
    if ((flg & 0x41) == 0) {
      if ((flg & 2) == 0) {
        puVar131 = enc_table_cpy;
        puVar159 = enc_table_cpy_slash;
      }
      else {
        puVar131 = enc_table_esc;
        puVar159 = enc_table_esc_slash;
      }
      if ((flg & 4) == 0) {
        puVar159 = puVar131;
      }
      local_f0 = estimated_val_num * 0x12 + 0x4f & 0xfffffffffffffff0;
      local_110 = (uint *)(*p_Var4)(pvVar6,local_f0);
      if (local_110 != (uint *)0x0) {
        uVar106 = val->tag;
        uVar118 = (uint)uVar106 & 7;
        bVar162 = uVar118 == 7;
        local_c0 = (ulong)bVar162;
        *(byte *)local_110 = bVar162 << 5 | 0x5b;
        pyVar135 = (yyjson_mut_val *)(val->uni).u64;
        if (uVar118 == 7) {
          pyVar135 = pyVar135->next;
        }
        puVar154 = (uint *)((long)local_110 + local_f0);
        puVar126 = (uint *)((long)local_110 + 1);
        lVar150 = (uVar106 >> 8) << bVar162;
        local_d0 = puVar154;
LAB_00f30d98:
        do {
          puVar122 = puVar126;
          pyVar136 = pyVar135;
          do {
            pyVar136 = pyVar136->next;
            uVar106 = pyVar136->tag;
            bVar155 = (byte)uVar106 & 7;
            puVar112 = puVar154;
            if (bVar155 == 4) {
              if (puVar154 <= puVar122 + 8) {
                uVar106 = local_f0 >> 1;
                if (local_f0 >> 1 < 0x21) {
                  uVar106 = 0x20;
                }
                sVar134 = (uVar106 + 0xf & 0xfffffffffffffff0) + local_f0;
                pbVar157 = (byte *)(*p_Var7)(pvVar6,local_110,local_f0,sVar134);
                if (pbVar157 == (byte *)0x0) goto LAB_00f33695;
                puVar112 = (uint *)(pbVar157 + (sVar134 - ((long)local_d0 - (long)puVar154)));
                memmove(puVar112,pbVar157 + ((long)puVar154 - (long)local_110),
                        (long)local_d0 - (long)puVar154);
                puVar122 = (uint *)(pbVar157 + ((long)puVar122 - (long)local_110));
                local_d0 = (uint *)(pbVar157 + sVar134);
                uVar106 = pyVar136->tag;
                local_110 = (uint *)pbVar157;
                local_f0 = sVar134;
              }
              uVar160 = (pyVar136->uni).u64;
              uVar118 = (uint)(uVar160 >> 0x20);
              if ((uVar106 & 0x10) == 0) {
                uVar118 = uVar118 >> 0x1f & (uint)(uVar106 >> 3);
                *(byte *)puVar122 = 0x2d;
                uVar106 = -uVar160;
                if (uVar118 == 0) {
                  uVar106 = uVar160;
                }
                pbVar157 = (byte *)((ulong)uVar118 + (long)puVar122);
                if (uVar106 < 100000000) {
                  if (uVar106 < 100) {
                    *(undefined2 *)pbVar157 =
                         *(undefined2 *)(digit_table + (ulong)(uVar106 < 10) + uVar106 * 2);
                    puVar122 = (uint *)(pbVar157 + (2 - (ulong)(uVar106 < 10)));
                  }
                  else {
                    iVar140 = (int)uVar106;
                    if (uVar106 < 10000) {
                      uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
                      uVar106 = (ulong)(uVar106 < 1000);
                      *(undefined2 *)pbVar157 =
                           *(undefined2 *)(digit_table + uVar106 + (ulong)uVar118 * 2);
                      *(undefined2 *)(pbVar157 + (2 - uVar106)) =
                           *(undefined2 *)(digit_table + (uVar118 * -100 + iVar140) * 2);
                      puVar122 = (uint *)(pbVar157 + (4 - uVar106));
                    }
                    else if (uVar106 < 1000000) {
                      iVar140 = (int)(uVar106 * 0x68db9 >> 0x20) * -10000 + iVar140;
                      uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
                      uVar160 = (ulong)(uVar106 < 100000);
                      *(undefined2 *)pbVar157 =
                           *(undefined2 *)(digit_table + uVar160 + (uVar106 * 0x68db9 >> 0x20) * 2);
                      *(undefined2 *)(pbVar157 + (2 - uVar160)) =
                           *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                      *(undefined2 *)(pbVar157 + (4 - uVar160)) =
                           *(undefined2 *)(digit_table + (uVar118 * -100 + iVar140) * 2);
                      puVar122 = (uint *)(pbVar157 + (6 - uVar160));
                    }
                    else {
                      uVar118 = (uint)(uVar106 * 0x68db8bb >> 0x20);
                      uVar132 = uVar118 >> 8;
                      iVar140 = uVar132 * -10000 + iVar140;
                      uVar132 = uVar132 * 0x147b >> 0x13;
                      uVar141 = (uint)(iVar140 * 0x147b) >> 0x13;
                      uVar106 = (ulong)(uVar106 < 10000000);
                      *(undefined2 *)pbVar157 =
                           *(undefined2 *)(digit_table + uVar106 + (ulong)uVar132 * 2);
                      *(undefined2 *)(pbVar157 + (2 - uVar106)) =
                           *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                      *(undefined2 *)(pbVar157 + (4 - uVar106)) =
                           *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                      *(undefined2 *)(pbVar157 + (6 - uVar106)) =
                           *(undefined2 *)(digit_table + (uVar141 * -100 + iVar140) * 2);
                      puVar122 = (uint *)(pbVar157 + (8 - uVar106));
                    }
                  }
                }
                else {
                  auVar17._8_8_ = 0;
                  auVar17._0_8_ = uVar106;
                  lVar152 = SUB168(auVar17 / ZEXT816(100000000),0);
                  uVar160 = lVar152 * 0xfa0a1f00 + uVar106;
                  iVar140 = SUB164(auVar17 / ZEXT816(100000000),0);
                  if (uVar106 < 10000000000000000) {
                    if (uVar106 < 10000000000) {
                      *(undefined2 *)pbVar157 =
                           *(undefined2 *)
                            (digit_table + (ulong)(uVar106 < 1000000000) + lVar152 * 2);
                      pbVar157 = pbVar157 + (2 - (ulong)(uVar106 < 1000000000));
                    }
                    else if (uVar106 < 1000000000000) {
                      uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
                      uVar106 = (ulong)(uVar106 >> 0xb < 0x2e90edd);
                      *(undefined2 *)pbVar157 =
                           *(undefined2 *)(digit_table + uVar106 + (ulong)uVar118 * 2);
                      *(undefined2 *)(pbVar157 + (2 - uVar106)) =
                           *(undefined2 *)(digit_table + (uVar118 * -100 + iVar140) * 2);
                      pbVar157 = pbVar157 + (4 - uVar106);
                    }
                    else if (uVar106 < 100000000000000) {
                      iVar140 = (int)((ulong)(lVar152 * 0x68db9) >> 0x20) * -10000 + iVar140;
                      uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
                      uVar106 = (ulong)(uVar106 >> 0xd < 0x48c27395);
                      *(undefined2 *)pbVar157 =
                           *(undefined2 *)
                            (digit_table + uVar106 + ((ulong)(lVar152 * 0x68db9) >> 0x20) * 2);
                      *(undefined2 *)(pbVar157 + (2 - uVar106)) =
                           *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                      *(undefined2 *)(pbVar157 + (4 - uVar106)) =
                           *(undefined2 *)(digit_table + (uVar118 * -100 + iVar140) * 2);
                      pbVar157 = pbVar157 + (6 - uVar106);
                    }
                    else {
                      uVar118 = (uint)((ulong)(lVar152 * 0x68db8bb) >> 0x20);
                      uVar132 = uVar118 >> 8;
                      iVar140 = uVar132 * -10000 + iVar140;
                      uVar132 = uVar132 * 0x147b >> 0x13;
                      uVar141 = (uint)(iVar140 * 0x147b) >> 0x13;
                      uVar106 = (ulong)(uVar106 < 1000000000000000);
                      *(undefined2 *)pbVar157 =
                           *(undefined2 *)(digit_table + uVar106 + (ulong)uVar132 * 2);
                      *(undefined2 *)(pbVar157 + (2 - uVar106)) =
                           *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                      *(undefined2 *)(pbVar157 + (4 - uVar106)) =
                           *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                      *(undefined2 *)(pbVar157 + (6 - uVar106)) =
                           *(undefined2 *)(digit_table + (uVar141 * -100 + iVar140) * 2);
                      pbVar157 = pbVar157 + (8 - uVar106);
                    }
                    uVar118 = (uint)((uVar160 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar132 = uVar118 >> 8;
                    iVar140 = uVar132 * -10000 + (int)uVar160;
                    uVar132 = uVar132 * 0x147b >> 0x13;
                    uVar141 = (uint)(iVar140 * 0x147b) >> 0x13;
                    *(undefined2 *)pbVar157 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                    *(undefined2 *)(pbVar157 + 2) =
                         *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                    *(undefined2 *)(pbVar157 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                    *(undefined2 *)(pbVar157 + 6) =
                         *(undefined2 *)(digit_table + (uVar141 * 0x7fffff9c + iVar140) * 2);
                    puVar122 = (uint *)(pbVar157 + 8);
                  }
                  else {
                    auVar18._8_8_ = 0;
                    auVar18._0_8_ = uVar106;
                    lVar152 = SUB168(auVar18 / ZEXT816(1000000000000),0);
                    iVar138 = SUB164(auVar18 / ZEXT816(1000000000000),0);
                    if (uVar106 < 1000000000000000000) {
                      uVar105 = lVar152 * 0x68db9;
                      iVar146 = (int)(uVar105 >> 0x20) * -10000 + iVar138;
                      uVar118 = (uint)(iVar146 * 0x147b) >> 0x13;
                      uVar106 = (ulong)(uVar106 < 100000000000000000);
                      *(undefined2 *)pbVar157 =
                           *(undefined2 *)(digit_table + uVar106 + (uVar105 >> 0x20) * 2);
                      *(undefined2 *)(pbVar157 + (2 - uVar106)) =
                           *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                      *(undefined2 *)(pbVar157 + (4 - uVar106)) =
                           *(undefined2 *)(digit_table + (uVar118 * -100 + iVar146) * 2);
                      lVar152 = 6 - uVar106;
                    }
                    else {
                      uVar118 = (uint)((ulong)(lVar152 * 0x68db8bb) >> 0x20);
                      uVar132 = uVar118 >> 8;
                      iVar146 = uVar132 * -10000 + iVar138;
                      uVar132 = uVar132 * 0x147b >> 0x13;
                      uVar141 = (uint)(iVar146 * 0x147b) >> 0x13;
                      uVar106 = (ulong)(uVar106 < 10000000000000000000);
                      *(undefined2 *)pbVar157 =
                           *(undefined2 *)(digit_table + uVar106 + (ulong)uVar132 * 2);
                      *(undefined2 *)(pbVar157 + (2 - uVar106)) =
                           *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                      *(undefined2 *)(pbVar157 + (4 - uVar106)) =
                           *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                      *(undefined2 *)(pbVar157 + (6 - uVar106)) =
                           *(undefined2 *)(digit_table + (uVar141 * -100 + iVar146) * 2);
                      lVar152 = 8 - uVar106;
                    }
                    pbVar157 = pbVar157 + lVar152;
                    iVar140 = iVar140 + iVar138 * -10000;
                    uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
                    *(undefined2 *)pbVar157 = *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                    *(undefined2 *)(pbVar157 + 2) =
                         *(undefined2 *)(digit_table + (uVar118 * 0x7fffff9c + iVar140) * 2);
                    uVar118 = (uint)((uVar160 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar132 = uVar118 >> 8;
                    iVar140 = uVar132 * -10000 + (int)uVar160;
                    uVar132 = uVar132 * 0x147b >> 0x13;
                    uVar141 = (uint)(iVar140 * 0x147b) >> 0x13;
                    *(undefined2 *)(pbVar157 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                    *(undefined2 *)(pbVar157 + 6) =
                         *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                    *(undefined2 *)(pbVar157 + 8) =
                         *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                    *(undefined2 *)(pbVar157 + 10) =
                         *(undefined2 *)(digit_table + (uVar141 * 0x7fffff9c + iVar140) * 2);
                    puVar122 = (uint *)(pbVar157 + 0xc);
                  }
                }
                goto LAB_00f32a6d;
              }
              uVar106 = uVar160 & 0xfffffffffffff;
              uVar118 = uVar118 >> 0x14 & 0x7ff;
              if (uVar118 == 0x7ff) {
                if ((flg & 0x10) == 0) {
                  if ((flg & 8) == 0) goto LAB_00f3372c;
                  if (uVar106 == 0) {
                    *(byte *)puVar122 = 0x2d;
                    puVar129 = (undefined8 *)((long)puVar122 - ((long)uVar160 >> 0x3f));
                    *puVar129 = 0x7974696e69666e49;
                    puVar122 = (uint *)(puVar129 + 1);
                  }
                  else {
                    *puVar122 = 0x4e614e;
LAB_00f32642:
                    puVar122 = (uint *)((long)puVar122 + 3);
                  }
                }
                else {
                  *puVar122 = 0x6c6c756e;
                  puVar122 = puVar122 + 1;
                }
              }
              else {
                *(byte *)puVar122 = 0x2d;
                lVar152 = -((long)uVar160 >> 0x3f);
                puVar129 = (undefined8 *)((long)puVar122 + lVar152);
                if ((uVar160 & 0x7fffffffffffffff) == 0) {
                  *(undefined4 *)puVar129 = 0x302e30;
                  puVar122 = (uint *)((long)puVar129 + 3);
                  goto LAB_00f32a6d;
                }
                if (uVar118 == 0) {
                  uVar160 = (ulong)((uint)uVar160 & 1);
                  uVar106 = uVar106 * 0x20;
                  auVar49._8_8_ = 0;
                  auVar49._0_8_ = uVar106 - 0x10;
                  auVar94._8_8_ = 0;
                  auVar94._0_8_ = SUB168(auVar49 * ZEXT816(0x6c07a2c26a8346d2),8);
                  auVar50._8_8_ = 0;
                  auVar50._0_8_ = uVar106 - 0x10;
                  auVar94 = auVar50 * ZEXT816(0x9e19db92b4e31ba9) + auVar94;
                  auVar51._8_8_ = 0;
                  auVar51._0_8_ = uVar106;
                  auVar95._8_8_ = 0;
                  auVar95._0_8_ = SUB168(auVar51 * ZEXT816(0x6c07a2c26a8346d2),8);
                  auVar52._8_8_ = 0;
                  auVar52._0_8_ = uVar106;
                  auVar95 = auVar52 * ZEXT816(0x9e19db92b4e31ba9) + auVar95;
                  uVar105 = auVar95._8_8_;
                  auVar53._8_8_ = 0;
                  auVar53._0_8_ = uVar106 + 0x10;
                  auVar96._8_8_ = 0;
                  auVar96._0_8_ = SUB168(auVar53 * ZEXT816(0x6c07a2c26a8346d2),8);
                  auVar54._8_8_ = 0;
                  auVar54._0_8_ = uVar106 + 0x10;
                  auVar96 = auVar54 * ZEXT816(0x9e19db92b4e31ba9) + auVar96;
                  uVar106 = ((ulong)((auVar94 & (undefined1  [16])0xfffffffffffffffe) !=
                                    (undefined1  [16])0x0) | auVar94._8_8_) + uVar160;
                  uVar160 = ((ulong)((auVar96 & (undefined1  [16])0xfffffffffffffffe) !=
                                    (undefined1  [16])0x0) | auVar96._8_8_) - uVar160;
                  if (uVar105 < 0x28) {
LAB_00f32da0:
                    uVar107 = (auVar95 & (undefined1  [16])0xfffffffffffffffe) !=
                              (undefined1  [16])0x0 | uVar105;
                    uVar121 = uVar105 & 0x7ffffffffffffffc;
                    bVar162 = true;
                    if (uVar107 <= (uVar121 | 2)) {
                      bVar162 = (bool)((byte)((uVar105 & 0xffffffff) >> 2) & 0x3f &
                                      uVar107 == (uVar121 | 2));
                    }
                    uVar107 = uVar105 >> 2;
                    bVar161 = uVar121 + 4 <= uVar160;
                    if (uVar121 < uVar106 == bVar161) {
                      bVar162 = bVar161;
                    }
                    iVar140 = -0x144;
                  }
                  else {
                    uVar107 = uVar105 / 0x28;
                    bVar162 = uVar107 * 0x28 + 0x28 <= uVar160;
                    if (uVar107 * 0x28 < uVar106 != bVar162) goto LAB_00f32da0;
                    iVar140 = -0x143;
                  }
                  uVar107 = bVar162 + uVar107;
                  pcVar108 = (char *)((long)puVar129 + 1);
                  if (uVar107 < 1000000000000000) {
                    iVar138 = (int)uVar107;
                    if (uVar107 < 100000000) {
                      if (uVar107 < 100) {
                        *(undefined2 *)pcVar108 =
                             *(undefined2 *)(digit_table + (ulong)(uVar107 < 10) + uVar107 * 2);
                        pcVar108 = pcVar108 + (2 - (ulong)(uVar107 < 10));
                      }
                      else if (uVar107 < 10000) {
                        uVar118 = (uint)(iVar138 * 0x147b) >> 0x13;
                        uVar106 = (ulong)(uVar107 < 1000);
                        *(undefined2 *)pcVar108 =
                             *(undefined2 *)(digit_table + uVar106 + (ulong)uVar118 * 2);
                        *(undefined2 *)(pcVar108 + (2 - uVar106)) =
                             *(undefined2 *)(digit_table + (uVar118 * -100 + iVar138) * 2);
                        pcVar108 = pcVar108 + (4 - uVar106);
                      }
                      else {
                        if (999999 < uVar107) {
                          uVar118 = (uint)(uVar107 * 0x68db8bb >> 0x20);
                          uVar132 = uVar118 >> 8;
                          iVar138 = uVar132 * -10000 + iVar138;
                          uVar132 = uVar132 * 0x147b >> 0x13;
                          uVar141 = (uint)(iVar138 * 0x147b) >> 0x13;
                          *(undefined2 *)pcVar108 =
                               *(undefined2 *)
                                (digit_table + (ulong)(uVar107 < 10000000) + (ulong)uVar132 * 2);
                          pcVar108 = pcVar108 + -(ulong)(uVar107 < 10000000);
                          *(undefined2 *)(pcVar108 + 2) =
                               *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                          *(undefined2 *)(pcVar108 + 4) =
                               *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                          uVar110 = *(undefined2 *)(digit_table + (uVar141 * -100 + iVar138) * 2);
                          goto LAB_00f33462;
                        }
                        iVar138 = (int)(uVar107 * 0x68db9 >> 0x20) * -10000 + iVar138;
                        uVar118 = (uint)(iVar138 * 0x147b) >> 0x13;
                        uVar106 = (ulong)(uVar107 < 100000);
                        *(undefined2 *)pcVar108 =
                             *(undefined2 *)
                              (digit_table + uVar106 + (uVar107 * 0x68db9 >> 0x20) * 2);
                        *(undefined2 *)(pcVar108 + (2 - uVar106)) =
                             *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                        *(undefined2 *)(pcVar108 + (4 - uVar106)) =
                             *(undefined2 *)(digit_table + (uVar118 * -100 + iVar138) * 2);
                        pcVar108 = pcVar108 + (6 - uVar106);
                      }
                    }
                    else {
                      auVar24._8_8_ = 0;
                      auVar24._0_8_ = uVar107;
                      lVar152 = SUB168(auVar24 / ZEXT816(100000000),0);
                      iVar146 = SUB164(auVar24 / ZEXT816(100000000),0);
                      if (uVar107 < 10000000000) {
                        *(undefined2 *)pcVar108 =
                             *(undefined2 *)
                              (digit_table + (ulong)(uVar107 < 1000000000) + lVar152 * 2);
                        pcVar108 = pcVar108 + (2 - (ulong)(uVar107 < 1000000000));
                      }
                      else if (uVar107 < 1000000000000) {
                        uVar118 = (uint)(iVar146 * 0x147b) >> 0x13;
                        uVar106 = (ulong)(uVar107 >> 0xb < 0x2e90edd);
                        *(undefined2 *)pcVar108 =
                             *(undefined2 *)(digit_table + uVar106 + (ulong)uVar118 * 2);
                        *(undefined2 *)(pcVar108 + (2 - uVar106)) =
                             *(undefined2 *)(digit_table + (uVar118 * -100 + iVar146) * 2);
                        pcVar108 = pcVar108 + (4 - uVar106);
                      }
                      else if (uVar107 < 100000000000000) {
                        iVar148 = (int)((ulong)(lVar152 * 0x68db9) >> 0x20) * -10000 + iVar146;
                        uVar118 = (uint)(iVar148 * 0x147b) >> 0x13;
                        uVar106 = (ulong)(uVar107 >> 0xd < 0x48c27395);
                        *(undefined2 *)pcVar108 =
                             *(undefined2 *)
                              (digit_table + uVar106 + ((ulong)(lVar152 * 0x68db9) >> 0x20) * 2);
                        *(undefined2 *)(pcVar108 + (2 - uVar106)) =
                             *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                        *(undefined2 *)(pcVar108 + (4 - uVar106)) =
                             *(undefined2 *)(digit_table + (uVar118 * -100 + iVar148) * 2);
                        pcVar108 = pcVar108 + (6 - uVar106);
                      }
                      else {
                        uVar118 = (uint)((ulong)(lVar152 * 0x68db8bb) >> 0x20);
                        uVar132 = uVar118 >> 8;
                        iVar148 = uVar132 * -10000 + iVar146;
                        uVar132 = uVar132 * 0x147b >> 0x13;
                        uVar141 = (uint)(iVar148 * 0x147b) >> 0x13;
                        *(undefined2 *)((long)puVar129 + 1) =
                             *(undefined2 *)(digit_table + (ulong)uVar132 * 2 + 1);
                        *(undefined2 *)((long)puVar129 + 2) =
                             *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                        *(undefined2 *)((long)puVar129 + 4) =
                             *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                        *(undefined2 *)((long)puVar129 + 6) =
                             *(undefined2 *)(digit_table + (uVar141 * -100 + iVar148) * 2);
                        pcVar108 = (char *)(puVar129 + 1);
                      }
                      uVar132 = iVar146 * -100000000 + iVar138;
                      uVar118 = (uint)((ulong)uVar132 * 0x68db8bb >> 0x20);
                      uVar141 = uVar118 >> 8;
                      iVar138 = uVar141 * -10000 + uVar132;
                      uVar132 = uVar141 * 0x147b >> 0x13;
                      uVar141 = (uint)(iVar138 * 0x147b) >> 0x13;
                      *(undefined2 *)pcVar108 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                      *(undefined2 *)(pcVar108 + 2) =
                           *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                      *(undefined2 *)(pcVar108 + 4) =
                           *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                      uVar110 = *(undefined2 *)(digit_table + (uVar141 * 0x7fffff9c + iVar138) * 2);
LAB_00f33462:
                      *(undefined2 *)(pcVar108 + 6) = uVar110;
                      pcVar108 = pcVar108 + 8;
                    }
                  }
                  else {
                    auVar23._8_8_ = 0;
                    auVar23._0_8_ = uVar107;
                    uVar106 = SUB168(auVar23 / ZEXT816(10000000000000000),0) * 0xfa0a1f00 +
                              uVar107 / 100000000;
                    uVar160 = (uVar107 / 100000000) * 0xfa0a1f00 + uVar107;
                    *pcVar108 = SUB161(auVar23 / ZEXT816(10000000000000000),0) + '0';
                    pcVar108 = pcVar108 + (9999999999999999 < uVar107);
                    uVar118 = (uint)((uVar106 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar132 = uVar118 >> 8;
                    iVar138 = uVar132 * -10000 + (int)uVar106;
                    uVar132 = uVar132 * 0x147b >> 0x13;
                    uVar141 = (uint)(iVar138 * 0x147b) >> 0x13;
                    *(undefined2 *)pcVar108 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                    *(undefined2 *)(pcVar108 + 2) =
                         *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                    *(undefined2 *)(pcVar108 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                    *(undefined2 *)(pcVar108 + 6) =
                         *(undefined2 *)(digit_table + (uVar141 * 0x7fffff9c + iVar138) * 2);
                    uVar118 = (uint)((uVar160 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar132 = uVar118 >> 8;
                    iVar138 = uVar132 * -10000 + (int)uVar160;
                    uVar132 = uVar132 * 0x147b >> 0x13;
                    uVar141 = (uint)(iVar138 * 0x147b) >> 0x13;
                    *(undefined2 *)(pcVar108 + 8) =
                         *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                    *(undefined2 *)(pcVar108 + 10) =
                         *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                    *(undefined2 *)(pcVar108 + 0xc) =
                         *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                    *(undefined2 *)(pcVar108 + 0xe) =
                         *(undefined2 *)(digit_table + (uVar141 * 0x7fffff9c + iVar138) * 2);
                    pcVar108 = pcVar108 + 0x10;
                  }
                  *(undefined1 *)puVar129 = *(undefined1 *)((long)puVar129 + 1);
                  *(undefined1 *)((long)puVar129 + 1) = 0x2e;
                  lVar152 = 0;
                  do {
                    lVar149 = lVar152 + -1;
                    lVar152 = lVar152 + -1;
                  } while (pcVar108[lVar149] == '0');
                  iVar140 = ((int)pcVar108 - (int)puVar129) + iVar140 + -2;
                  pcVar108 = pcVar108 + lVar152 + (ulong)(pcVar108[lVar149] != '.');
                  pcVar108[0] = 'e';
                  pcVar108[1] = '-';
                  uVar118 = iVar140 * -0x290;
                  pcVar108[2] = (char)(uVar118 >> 0x10) + '0';
                  *(undefined2 *)(pcVar108 + 3) =
                       *(undefined2 *)(digit_table + ((uVar118 >> 0x10) * 0x7fffff9c - iVar140) * 2)
                  ;
                  puVar122 = (uint *)(pcVar108 + 5);
                  goto LAB_00f32a6d;
                }
                uVar105 = uVar106 + 0x10000000000000;
                if (uVar118 - 0x3ff < 0x35) {
                  lVar149 = 0;
                  if (uVar105 != 0) {
                    for (; (uVar105 >> lVar149 & 1) == 0; lVar149 = lVar149 + 1) {
                    }
                  }
                  if ((uint)lVar149 < 0x433 - uVar118) goto LAB_00f3103c;
                  uVar105 = uVar105 >> ((byte)(0x433 - uVar118) & 0x3f);
                  iVar140 = (int)uVar105;
                  if (uVar105 < 100000000) {
                    if (uVar105 < 100) {
                      *(undefined2 *)puVar129 =
                           *(undefined2 *)(digit_table + (ulong)(uVar105 < 10) + uVar105 * 2);
                      puVar142 = (undefined2 *)((long)puVar129 + (2 - (ulong)(uVar105 < 10)));
                    }
                    else if (uVar105 < 10000) {
                      uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
                      uVar106 = (ulong)(uVar105 < 1000);
                      *(undefined2 *)puVar129 =
                           *(undefined2 *)(digit_table + uVar106 + (ulong)uVar118 * 2);
                      *(undefined2 *)((long)puVar129 + (2 - uVar106)) =
                           *(undefined2 *)(digit_table + (uVar118 * -100 + iVar140) * 2);
                      puVar142 = (undefined2 *)((long)puVar129 + (4 - uVar106));
                    }
                    else if (uVar105 < 1000000) {
                      iVar140 = (int)(uVar105 * 0x68db9 >> 0x20) * -10000 + iVar140;
                      uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
                      uVar106 = (ulong)(uVar105 < 100000);
                      *(undefined2 *)puVar129 =
                           *(undefined2 *)(digit_table + uVar106 + (uVar105 * 0x68db9 >> 0x20) * 2);
                      *(undefined2 *)((long)puVar129 + (2 - uVar106)) =
                           *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                      *(undefined2 *)((long)puVar129 + (4 - uVar106)) =
                           *(undefined2 *)(digit_table + (uVar118 * -100 + iVar140) * 2);
                      puVar142 = (undefined2 *)((long)puVar129 + (6 - uVar106));
                    }
                    else {
                      uVar118 = (uint)(uVar105 * 0x68db8bb >> 0x20);
                      uVar132 = uVar118 >> 8;
                      iVar140 = uVar132 * -10000 + iVar140;
                      uVar132 = uVar132 * 0x147b >> 0x13;
                      uVar141 = (uint)(iVar140 * 0x147b) >> 0x13;
                      uVar106 = (ulong)(uVar105 < 10000000);
                      *(undefined2 *)puVar129 =
                           *(undefined2 *)(digit_table + uVar106 + (ulong)uVar132 * 2);
                      *(undefined2 *)((long)puVar129 + (2 - uVar106)) =
                           *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                      *(undefined2 *)((long)puVar129 + (4 - uVar106)) =
                           *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                      *(undefined2 *)((long)puVar129 + (6 - uVar106)) =
                           *(undefined2 *)(digit_table + (uVar141 * -100 + iVar140) * 2);
                      puVar142 = (undefined2 *)((long)puVar129 + (8 - uVar106));
                    }
                  }
                  else {
                    auVar22._8_8_ = 0;
                    auVar22._0_8_ = uVar105;
                    lVar152 = SUB168(auVar22 / ZEXT816(100000000),0);
                    iVar138 = SUB164(auVar22 / ZEXT816(100000000),0);
                    if (uVar105 < 10000000000) {
                      *(undefined2 *)puVar129 =
                           *(undefined2 *)
                            (digit_table + (ulong)(uVar105 < 1000000000) + lVar152 * 2);
                      puVar142 = (undefined2 *)
                                 ((long)puVar129 + (2 - (ulong)(uVar105 < 1000000000)));
                    }
                    else if (uVar105 < 1000000000000) {
                      uVar118 = (uint)(iVar138 * 0x147b) >> 0x13;
                      uVar106 = (ulong)(uVar105 >> 0xb < 0x2e90edd);
                      *(undefined2 *)puVar129 =
                           *(undefined2 *)(digit_table + uVar106 + (ulong)uVar118 * 2);
                      *(undefined2 *)((long)puVar129 + (2 - uVar106)) =
                           *(undefined2 *)(digit_table + (uVar118 * -100 + iVar138) * 2);
                      puVar142 = (undefined2 *)((long)puVar129 + (4 - uVar106));
                    }
                    else if (uVar105 < 100000000000000) {
                      iVar146 = (int)((ulong)(lVar152 * 0x68db9) >> 0x20) * -10000 + iVar138;
                      uVar118 = (uint)(iVar146 * 0x147b) >> 0x13;
                      uVar106 = (ulong)(uVar105 >> 0xd < 0x48c27395);
                      *(undefined2 *)puVar129 =
                           *(undefined2 *)
                            (digit_table + uVar106 + ((ulong)(lVar152 * 0x68db9) >> 0x20) * 2);
                      *(undefined2 *)((long)puVar129 + (2 - uVar106)) =
                           *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                      *(undefined2 *)((long)puVar129 + (4 - uVar106)) =
                           *(undefined2 *)(digit_table + (uVar118 * -100 + iVar146) * 2);
                      puVar142 = (undefined2 *)((long)puVar129 + (6 - uVar106));
                    }
                    else {
                      uVar118 = (uint)((ulong)(lVar152 * 0x68db8bb) >> 0x20);
                      uVar132 = uVar118 >> 8;
                      iVar146 = uVar132 * -10000 + iVar138;
                      uVar132 = uVar132 * 0x147b >> 0x13;
                      uVar141 = (uint)(iVar146 * 0x147b) >> 0x13;
                      uVar106 = (ulong)(uVar105 < 1000000000000000);
                      *(undefined2 *)puVar129 =
                           *(undefined2 *)(digit_table + uVar106 + (ulong)uVar132 * 2);
                      *(undefined2 *)((long)puVar129 + (2 - uVar106)) =
                           *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                      *(undefined2 *)((long)puVar129 + (4 - uVar106)) =
                           *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                      *(undefined2 *)((long)puVar129 + (6 - uVar106)) =
                           *(undefined2 *)(digit_table + (uVar141 * -100 + iVar146) * 2);
                      puVar142 = (undefined2 *)((long)puVar129 + (8 - uVar106));
                    }
                    uVar132 = iVar138 * -100000000 + iVar140;
                    uVar118 = (uint)((ulong)uVar132 * 0x68db8bb >> 0x20);
                    uVar141 = uVar118 >> 8;
                    iVar140 = uVar141 * -10000 + uVar132;
                    uVar132 = uVar141 * 0x147b >> 0x13;
                    uVar141 = (uint)(iVar140 * 0x147b) >> 0x13;
                    *puVar142 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                    puVar142[1] = *(undefined2 *)
                                   (digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                    puVar142[2] = *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                    puVar142[3] = *(undefined2 *)
                                   (digit_table + (uVar141 * 0x7fffff9c + iVar140) * 2);
                    puVar142 = puVar142 + 4;
                  }
                  *puVar142 = 0x302e;
                }
                else {
LAB_00f3103c:
                  uVar160 = (ulong)((uint)uVar160 & 1);
                  iVar140 = uVar118 * 0x4d105 + -0x200a5;
                  if (uVar118 == 1 || uVar106 != 0) {
                    iVar140 = uVar118 * 0x4d105;
                  }
                  iVar140 = iVar140 + -0x1439b7ff >> 0x14;
                  uVar107 = *(ulong *)(pow10_sig_table + (ulong)(iVar140 * -2 + 0x2ae) * 8);
                  uVar121 = *(long *)(pow10_sig_table + (ulong)(iVar140 * -2 + 0x2af) * 8) +
                            (ulong)(iVar140 - 1U < 0xffffffc8);
                  bVar155 = ((char)((uint)(iVar140 * -0x3526b) >> 0x10) + (char)uVar118) - 0x32;
                  uVar106 = (ulong)(uVar118 != 1 && uVar106 == 0) + uVar105 * 4 + -2 <<
                            (bVar155 & 0x3f);
                  auVar43._8_8_ = 0;
                  auVar43._0_8_ = uVar121;
                  auVar73._8_8_ = 0;
                  auVar73._0_8_ = uVar106;
                  auVar91._8_8_ = 0;
                  auVar91._0_8_ = SUB168(auVar43 * auVar73,8);
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = uVar107;
                  auVar74._8_8_ = 0;
                  auVar74._0_8_ = uVar106;
                  auVar91 = auVar44 * auVar74 + auVar91;
                  uVar106 = uVar105 * 4 << (bVar155 & 0x3f);
                  auVar45._8_8_ = 0;
                  auVar45._0_8_ = uVar121;
                  auVar75._8_8_ = 0;
                  auVar75._0_8_ = uVar106;
                  auVar92._8_8_ = 0;
                  auVar92._0_8_ = SUB168(auVar45 * auVar75,8);
                  auVar46._8_8_ = 0;
                  auVar46._0_8_ = uVar107;
                  auVar76._8_8_ = 0;
                  auVar76._0_8_ = uVar106;
                  auVar92 = auVar46 * auVar76 + auVar92;
                  uVar106 = auVar92._8_8_;
                  uVar105 = uVar105 * 4 + 2 << (bVar155 & 0x3f);
                  auVar47._8_8_ = 0;
                  auVar47._0_8_ = uVar121;
                  auVar77._8_8_ = 0;
                  auVar77._0_8_ = uVar105;
                  auVar93._8_8_ = 0;
                  auVar93._0_8_ = SUB168(auVar47 * auVar77,8);
                  auVar48._8_8_ = 0;
                  auVar48._0_8_ = uVar107;
                  auVar78._8_8_ = 0;
                  auVar78._0_8_ = uVar105;
                  auVar93 = auVar48 * auVar78 + auVar93;
                  uVar105 = ((ulong)((auVar91 & (undefined1  [16])0xfffffffffffffffe) !=
                                    (undefined1  [16])0x0) | auVar91._8_8_) + uVar160;
                  uVar160 = ((ulong)((auVar93 & (undefined1  [16])0xfffffffffffffffe) !=
                                    (undefined1  [16])0x0) | auVar93._8_8_) - uVar160;
                  if (uVar106 < 0x28) {
LAB_00f3118f:
                    uVar121 = (auVar92 & (undefined1  [16])0xfffffffffffffffe) !=
                              (undefined1  [16])0x0 | uVar106;
                    uVar107 = uVar106 & 0xfffffffffffffffc;
                    bVar162 = true;
                    if (uVar121 <= uVar107 + 2) {
                      bVar162 = (bool)((byte)((uVar106 & 0xffffffff) >> 2) & 0x3f &
                                      uVar121 == uVar107 + 2);
                    }
                    bVar161 = uVar107 + 4 <= uVar160;
                    if (uVar107 < uVar105 == bVar161) {
                      bVar162 = bVar161;
                    }
                    uVar106 = (ulong)bVar162 + (uVar106 >> 2);
                  }
                  else {
                    uVar121 = (uVar106 / 0x28) * 0x28;
                    uVar107 = uVar121 + 0x28;
                    if (uVar121 < uVar105 != uVar107 <= uVar160) goto LAB_00f3118f;
                    uVar106 = (uVar106 / 0x28 + 1) - (ulong)(uVar160 < uVar107);
                    iVar140 = iVar140 + 1;
                  }
                  iVar138 = (0x11 - (uint)(uVar106 < 10000000000000000)) -
                            (uint)(uVar106 < 1000000000000000);
                  uVar118 = iVar138 + iVar140;
                  if (iVar138 + iVar140 + 5U < 0x1b) {
                    if ((int)uVar118 < 1) {
                      auVar21._8_8_ = 0;
                      auVar21._0_8_ = uVar106;
                      uVar105 = SUB168(auVar21 / ZEXT816(100000000),0);
                      uVar141 = SUB164(auVar21 / ZEXT816(100000000),0);
                      puVar142 = (undefined2 *)
                                 ((long)puVar129 +
                                 (((ulong)(2 - uVar118) + 1) - (ulong)(uVar141 < 100000000)));
                      uVar160 = (uVar105 & 0xffffffff) / 10000;
                      iVar146 = (int)(uVar160 * 0x28f5d >> 0x18);
                      uVar132 = (uint)(iVar146 * 0x29) >> 0xc;
                      *(char *)((long)puVar129 + (ulong)(2 - uVar118)) = (char)uVar132 + '0';
                      iVar140 = (int)uVar160;
                      iVar138 = iVar140 * -10000 + uVar141;
                      uVar106 = uVar105 * 0xfa0a1f00 + uVar106;
                      uVar147 = uVar132 * -100 + iVar146;
                      uVar132 = iVar146 * -100 + iVar140;
                      uVar160 = (ulong)(uVar147 < 10 && uVar141 < 100000000);
                      *puVar142 = *(undefined2 *)(digit_table + uVar160 + uVar147 * 2);
                      *(undefined2 *)((long)puVar142 + (2 - uVar160)) =
                           *(undefined2 *)(digit_table + uVar132 * 2);
                      iVar140 = (int)uVar106;
                      if (iVar140 == 0) {
                        if (iVar138 == 0) {
                          uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar147];
                          if (uVar132 != 0) {
                            uVar106 = 0;
                          }
                          uVar106 = uVar106 + (byte)dec_trailing_zero_table[uVar132];
                          lStack_120 = 4;
                        }
                        else {
                          uVar132 = (uint)(iVar138 * 0x147b) >> 0x13;
                          uVar141 = uVar132 * -100 + iVar138;
                          *(undefined2 *)((long)puVar142 + (4 - uVar160)) =
                               *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                          *(undefined2 *)((long)puVar142 + (6 - uVar160)) =
                               *(undefined2 *)(digit_table + uVar141 * 2);
                          uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar132] + 2;
                          if (uVar141 != 0) {
                            uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar141];
                          }
                          lStack_120 = 8;
                        }
                        uVar106 = lStack_120 - uVar106;
                      }
                      else {
                        uVar147 = (uint)(iVar138 * 0x147b) >> 0x13;
                        uVar132 = (uint)((uVar106 & 0xffffffff) * 0x68db8bb >> 0x20);
                        uVar151 = uVar132 >> 8;
                        uVar141 = uVar151 * 0x147b >> 0x13;
                        uVar106 = (ulong)uVar141;
                        uVar132 = uVar141 * -100 + (uVar132 >> 8);
                        *(undefined2 *)((long)puVar142 + (4 - uVar160)) =
                             *(undefined2 *)(digit_table + (ulong)uVar147 * 2);
                        *(undefined2 *)((long)puVar142 + (6 - uVar160)) =
                             *(undefined2 *)(digit_table + (uVar147 * 0x7fffff9c + iVar138) * 2);
                        *(undefined2 *)((long)puVar142 + (8 - uVar160)) =
                             *(undefined2 *)(digit_table + uVar106 * 2);
                        *(undefined2 *)((long)puVar142 + (10 - uVar160)) =
                             *(undefined2 *)(digit_table + uVar132 * 2);
                        lVar152 = 0xc;
                        iVar140 = uVar151 * -10000 + iVar140;
                        if (iVar140 != 0) {
                          uVar132 = (uint)(iVar140 * 0x147b) >> 0x13;
                          uVar106 = (ulong)uVar132;
                          uVar132 = uVar132 * -100 + iVar140;
                          *(undefined2 *)((long)puVar142 + (0xc - uVar160)) =
                               *(undefined2 *)(digit_table + uVar106 * 2);
                          *(undefined2 *)((long)puVar142 + (0xe - uVar160)) =
                               *(undefined2 *)(digit_table + uVar132 * 2);
                          lVar152 = 0x10;
                        }
                        uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar106] + 2;
                        if (uVar132 != 0) {
                          uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar132];
                        }
                        uVar106 = lVar152 - uVar106;
                      }
                      *(undefined2 *)puVar129 = 0x2e30;
                      for (uVar105 = 0;
                          puVar122 = (uint *)((long)puVar142 + ((uVar106 & 0xffffffff) - uVar160)),
                          -uVar118 != uVar105; uVar105 = uVar105 + 1) {
                        *(undefined1 *)((long)puVar129 + uVar105 + 2) = 0x30;
                      }
                    }
                    else {
                      auVar19._8_8_ = 0;
                      auVar19._0_8_ = uVar106;
                      uVar105 = SUB168(auVar19 / ZEXT816(100000000),0);
                      uVar141 = SUB164(auVar19 / ZEXT816(100000000),0);
                      puVar142 = (undefined2 *)((long)puVar129 + (2 - (ulong)(uVar141 < 100000000)))
                      ;
                      uVar160 = (uVar105 & 0xffffffff) / 10000;
                      iVar140 = (int)uVar160;
                      iVar146 = iVar140 * -10000 + uVar141;
                      uVar106 = uVar105 * 0xfa0a1f00 + uVar106;
                      iVar138 = (int)(uVar160 * 0x28f5d >> 0x18);
                      uVar151 = (uint)(iVar138 * 0x29) >> 0xc;
                      uVar147 = uVar151 * -100 + iVar138;
                      uVar132 = iVar138 * -100 + iVar140;
                      *puVar129 = 0x3030303030303030;
                      puVar129[1] = 0x3030303030303030;
                      puVar129[2] = 0x3030303030303030;
                      *(char *)((long)puVar129 + 1) = (char)uVar151 + '0';
                      uVar160 = (ulong)(uVar147 < 10 && uVar141 < 100000000);
                      *puVar142 = *(undefined2 *)(digit_table + uVar160 + uVar147 * 2);
                      *(undefined2 *)((long)puVar142 + (2 - uVar160)) =
                           *(undefined2 *)(digit_table + uVar132 * 2);
                      iVar140 = (int)uVar106;
                      if (iVar140 == 0) {
                        if (iVar146 == 0) {
                          uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar147];
                          if (uVar132 != 0) {
                            uVar106 = 0;
                          }
                          uVar106 = uVar106 + (byte)dec_trailing_zero_table[uVar132];
                          lStack_120 = 4;
                        }
                        else {
                          uVar132 = (uint)(iVar146 * 0x147b) >> 0x13;
                          uVar141 = uVar132 * -100 + iVar146;
                          *(undefined2 *)((long)puVar142 + (4 - uVar160)) =
                               *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                          *(undefined2 *)((long)puVar142 + (6 - uVar160)) =
                               *(undefined2 *)(digit_table + uVar141 * 2);
                          uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar132] + 2;
                          if (uVar141 != 0) {
                            uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar141];
                          }
                          lStack_120 = 8;
                        }
                        uVar106 = lStack_120 - uVar106;
                      }
                      else {
                        uVar147 = (uint)(iVar146 * 0x147b) >> 0x13;
                        uVar132 = (uint)((uVar106 & 0xffffffff) * 0x68db8bb >> 0x20);
                        uVar151 = uVar132 >> 8;
                        uVar141 = uVar151 * 0x147b >> 0x13;
                        uVar106 = (ulong)uVar141;
                        uVar132 = uVar141 * -100 + (uVar132 >> 8);
                        *(undefined2 *)((long)puVar142 + (4 - uVar160)) =
                             *(undefined2 *)(digit_table + (ulong)uVar147 * 2);
                        *(undefined2 *)((long)puVar142 + (6 - uVar160)) =
                             *(undefined2 *)(digit_table + (uVar147 * 0x7fffff9c + iVar146) * 2);
                        *(undefined2 *)((long)puVar142 + (8 - uVar160)) =
                             *(undefined2 *)(digit_table + uVar106 * 2);
                        *(undefined2 *)((long)puVar142 + (10 - uVar160)) =
                             *(undefined2 *)(digit_table + uVar132 * 2);
                        lVar149 = 0xc;
                        iVar140 = uVar151 * -10000 + iVar140;
                        if (iVar140 != 0) {
                          uVar132 = (uint)(iVar140 * 0x147b) >> 0x13;
                          uVar106 = (ulong)uVar132;
                          uVar132 = uVar132 * -100 + iVar140;
                          *(undefined2 *)((long)puVar142 + (0xc - uVar160)) =
                               *(undefined2 *)(digit_table + uVar106 * 2);
                          *(undefined2 *)((long)puVar142 + (0xe - uVar160)) =
                               *(undefined2 *)(digit_table + uVar132 * 2);
                          lVar149 = 0x10;
                        }
                        uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar106] + 2;
                        if (uVar132 != 0) {
                          uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar132];
                        }
                        uVar106 = lVar149 - uVar106;
                      }
                      puVar154 = (uint *)((long)puVar142 + ((uVar106 & 0xffffffff) - uVar160));
                      for (uVar106 = 0; uVar118 != uVar106; uVar106 = uVar106 + 1) {
                        *(byte *)((long)puVar122 + uVar106 + lVar152) =
                             *(byte *)((long)puVar122 + uVar106 + lVar152 + 1);
                      }
                      puVar131 = (undefined1 *)((ulong)uVar118 + (long)puVar129);
                      puVar122 = (uint *)(puVar131 + 2);
                      *puVar131 = 0x2e;
                      if (puVar122 < puVar154) {
                        puVar122 = puVar154;
                      }
                    }
                    goto LAB_00f32a6d;
                  }
                  auVar20._8_8_ = 0;
                  auVar20._0_8_ = uVar106;
                  uVar105 = SUB168(auVar20 / ZEXT816(100000000),0);
                  uVar141 = SUB164(auVar20 / ZEXT816(100000000),0);
                  lVar152 = 2 - (ulong)(uVar141 < 100000000);
                  uVar160 = (uVar105 & 0xffffffff) / 10000;
                  iVar140 = (int)uVar160;
                  iVar146 = iVar140 * -10000 + uVar141;
                  uVar106 = uVar105 * 0xfa0a1f00 + uVar106;
                  iVar138 = (int)(uVar160 * 0x28f5d >> 0x18);
                  uVar151 = (uint)(iVar138 * 0x29) >> 0xc;
                  uVar147 = uVar151 * -100 + iVar138;
                  uVar132 = iVar138 * -100 + iVar140;
                  *(char *)((long)puVar129 + 1) = (char)uVar151 + '0';
                  uVar160 = (ulong)(uVar147 < 10 && uVar141 < 100000000);
                  *(undefined2 *)((long)puVar129 + lVar152) =
                       *(undefined2 *)(digit_table + uVar160 + uVar147 * 2);
                  lVar152 = lVar152 - uVar160;
                  *(undefined2 *)((long)puVar129 + lVar152 + 2) =
                       *(undefined2 *)(digit_table + uVar132 * 2);
                  iVar140 = (int)uVar106;
                  if (iVar140 == 0) {
                    if (iVar146 == 0) {
                      uVar141 = (uint)(byte)dec_trailing_zero_table[uVar147];
                      if (uVar132 != 0) {
                        uVar141 = 0;
                      }
                      uVar141 = uVar141 + (byte)dec_trailing_zero_table[uVar132];
                      iVar140 = 4;
                    }
                    else {
                      uVar132 = (uint)(iVar146 * 0x147b) >> 0x13;
                      uVar147 = uVar132 * -100 + iVar146;
                      *(undefined2 *)((long)puVar129 + lVar152 + 4) =
                           *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                      *(undefined2 *)((long)puVar129 + lVar152 + 6) =
                           *(undefined2 *)(digit_table + uVar147 * 2);
                      uVar141 = (byte)dec_trailing_zero_table[uVar132] + 2;
                      if (uVar147 != 0) {
                        uVar141 = (uint)(byte)dec_trailing_zero_table[uVar147];
                      }
                      iVar140 = 8;
                    }
                    uVar141 = iVar140 - uVar141;
                  }
                  else {
                    uVar147 = (uint)(iVar146 * 0x147b) >> 0x13;
                    uVar132 = (uint)((uVar106 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar151 = uVar132 >> 8;
                    uVar141 = uVar151 * 0x147b >> 0x13;
                    uVar132 = uVar141 * -100 + (uVar132 >> 8);
                    *(undefined2 *)((long)puVar129 + lVar152 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar147 * 2);
                    *(undefined2 *)((long)puVar129 + lVar152 + 6) =
                         *(undefined2 *)(digit_table + (uVar147 * 0x7fffff9c + iVar146) * 2);
                    *(undefined2 *)((long)puVar129 + lVar152 + 8) =
                         *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                    *(undefined2 *)((long)puVar129 + lVar152 + 10) =
                         *(undefined2 *)(digit_table + uVar132 * 2);
                    iVar140 = uVar151 * -10000 + iVar140;
                    if (iVar140 == 0) {
                      uVar141 = (byte)dec_trailing_zero_table[uVar141] + 2;
                      if (uVar132 != 0) {
                        uVar141 = (uint)(byte)dec_trailing_zero_table[uVar132];
                      }
                      uVar141 = 0xc - uVar141;
                    }
                    else {
                      uVar132 = (uint)(iVar140 * 0x147b) >> 0x13;
                      uVar147 = uVar132 * -100 + iVar140;
                      *(undefined2 *)((long)puVar129 + lVar152 + 0xc) =
                           *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                      *(undefined2 *)((long)puVar129 + lVar152 + 0xe) =
                           *(undefined2 *)(digit_table + uVar147 * 2);
                      uVar141 = (byte)dec_trailing_zero_table[uVar132] + 2;
                      if (uVar147 != 0) {
                        uVar141 = (uint)(byte)dec_trailing_zero_table[uVar147];
                      }
                      uVar141 = 0x10 - uVar141;
                    }
                  }
                  puVar142 = (undefined2 *)
                             ((long)puVar129 +
                             (((ulong)uVar141 + lVar152) - (ulong)((ulong)uVar141 + lVar152 == 2)));
                  uVar118 = uVar118 - 1;
                  *(undefined1 *)puVar129 = *(undefined1 *)((long)puVar129 + 1);
                  *(undefined1 *)((long)puVar129 + 1) = 0x2e;
                  *puVar142 = 0x2d65;
                  puVar122 = (uint *)((long)puVar142 + (ulong)(uVar118 >> 0x1f) + 1);
                  uVar132 = -uVar118;
                  if (0 < (int)uVar118) {
                    uVar132 = uVar118;
                  }
                  if (99 < uVar132) {
                    *(byte *)puVar122 = (char)(uVar132 * 0x290 >> 0x10) + 0x30;
                    *(undefined2 *)((long)puVar142 + (ulong)(uVar118 >> 0x1f) + 2) =
                         *(undefined2 *)
                          (digit_table + ((uVar132 * 0x290 >> 0x10) * 0x7fffff9c + uVar132) * 2);
                    goto LAB_00f32642;
                  }
                  *(ushort *)puVar122 =
                       *(ushort *)(digit_table + (ulong)(uVar132 < 10) + (ulong)uVar132 * 2);
                  puVar142 = (undefined2 *)((long)puVar122 - (ulong)(uVar132 < 10));
                }
                puVar122 = (uint *)(puVar142 + 1);
              }
LAB_00f32a6d:
              *(byte *)puVar122 = 0x2c;
              puVar122 = (uint *)((long)puVar122 + 1);
            }
            else if (((uint)uVar106 & 7) == 5) {
              uVar160 = uVar106 >> 8;
              pbVar157 = (byte *)(pyVar136->uni).str;
              if (puVar154 <= (uint *)((long)puVar122 + uVar160 * 6 + 0x10)) {
                uVar107 = uVar160 * 6 + 0x10;
                uVar105 = local_f0 >> 1;
                if (local_f0 >> 1 <= uVar107) {
                  uVar105 = uVar107;
                }
                sVar134 = (uVar105 + 0xf & 0xfffffffffffffff0) + local_f0;
                pbVar111 = (byte *)(*p_Var7)(pvVar6,local_110,local_f0,sVar134);
                if (pbVar111 == (byte *)0x0) goto LAB_00f33695;
                puVar112 = (uint *)(pbVar111 + (sVar134 - ((long)local_d0 - (long)puVar154)));
                memmove(puVar112,pbVar111 + ((long)puVar154 - (long)local_110),
                        (long)local_d0 - (long)puVar154);
                puVar122 = (uint *)(pbVar111 + ((long)puVar122 - (long)local_110));
                local_d0 = (uint *)(pbVar111 + sVar134);
                local_110 = (uint *)pbVar111;
                local_f0 = sVar134;
              }
              if ((puVar159 != enc_table_cpy) || ((pyVar136->tag & 0x18) == 0)) {
                puVar154 = (uint *)(pbVar157 + uVar160);
                *(byte *)puVar122 = 0x22;
LAB_00f31202:
                lVar149 = (long)puVar154 - (long)pbVar157;
                lVar152 = 0;
                while( true ) {
                  puVar126 = (uint *)(pbVar157 + lVar152);
                  puVar128 = (uint *)((long)puVar122 + lVar152 + 1);
                  if (lVar149 < 0x10) break;
                  bVar155 = (byte)*puVar126;
                  if (puVar159[bVar155] != '\0') {
                    puVar126 = (uint *)(pbVar157 + lVar152);
                    puVar128 = (uint *)((long)puVar122 + lVar152 + 1);
                    goto LAB_00f315a9;
                  }
                  if (puVar159[pbVar157[lVar152 + 1]] != '\0') {
                    puVar126 = (uint *)(pbVar157 + lVar152);
                    puVar128 = (uint *)((long)puVar122 + lVar152 + 1);
                    goto LAB_00f31598;
                  }
                  if (puVar159[pbVar157[lVar152 + 2]] != '\0') {
                    puVar126 = (uint *)(pbVar157 + lVar152);
                    puVar128 = (uint *)((long)puVar122 + lVar152 + 1);
                    goto LAB_00f313dc;
                  }
                  if (puVar159[pbVar157[lVar152 + 3]] != '\0') {
                    puVar126 = (uint *)(pbVar157 + lVar152);
                    puVar128 = (uint *)((long)puVar122 + lVar152 + 1);
                    goto LAB_00f313fc;
                  }
                  if (puVar159[pbVar157[lVar152 + 4]] != '\0') {
                    puVar126 = (uint *)(pbVar157 + lVar152 + 4);
                    puVar128 = (uint *)((long)puVar122 + lVar152 + 5);
                    *(undefined4 *)((long)puVar122 + lVar152 + 1) =
                         *(undefined4 *)(pbVar157 + lVar152);
                    goto LAB_00f315a9;
                  }
                  if (puVar159[pbVar157[lVar152 + 5]] != '\0') {
                    pbVar157 = pbVar157 + lVar152;
                    puVar126 = (uint *)(pbVar157 + 5);
                    puVar128 = (uint *)((long)puVar122 + lVar152 + 6);
                    *(byte *)((long)puVar128 + -1) = pbVar157[4];
                    *(undefined4 *)((long)puVar128 + -5) = *(undefined4 *)pbVar157;
                    goto LAB_00f315a9;
                  }
                  if (puVar159[pbVar157[lVar152 + 6]] != '\0') {
                    pbVar157 = pbVar157 + lVar152;
                    puVar126 = (uint *)(pbVar157 + 6);
                    puVar128 = (uint *)((long)puVar122 + lVar152 + 7);
                    *(ushort *)((long)puVar128 + -2) = *(ushort *)(pbVar157 + 4);
                    *(undefined4 *)((long)puVar128 + -6) = *(undefined4 *)pbVar157;
                    goto LAB_00f315a9;
                  }
                  if (puVar159[pbVar157[lVar152 + 7]] != '\0') {
                    pbVar157 = pbVar157 + lVar152;
                    puVar126 = (uint *)(pbVar157 + 7);
                    uVar3 = *(undefined4 *)pbVar157;
                    puVar128 = (uint *)((long)puVar122 + lVar152 + 8);
                    *(undefined4 *)((long)puVar122 + lVar152 + 4) = *(undefined4 *)(pbVar157 + 3);
                    *(undefined4 *)((long)puVar122 + lVar152 + 1) = uVar3;
                    goto LAB_00f315a9;
                  }
                  if (puVar159[pbVar157[lVar152 + 8]] != '\0') {
                    puVar126 = (uint *)(pbVar157 + lVar152 + 8);
                    puVar128 = (uint *)((long)puVar122 + lVar152 + 9);
                    *(undefined8 *)((long)puVar122 + lVar152 + 1) =
                         *(undefined8 *)(pbVar157 + lVar152);
                    goto LAB_00f315a9;
                  }
                  if (puVar159[pbVar157[lVar152 + 9]] != '\0') {
                    pbVar157 = pbVar157 + lVar152;
                    puVar126 = (uint *)(pbVar157 + 9);
                    puVar128 = (uint *)((long)puVar122 + lVar152 + 10);
                    *(byte *)((long)puVar128 + -1) = pbVar157[8];
                    *(undefined8 *)((long)puVar128 + -9) = *(undefined8 *)pbVar157;
                    goto LAB_00f315a9;
                  }
                  if (puVar159[pbVar157[lVar152 + 10]] != '\0') {
                    pbVar157 = pbVar157 + lVar152;
                    puVar126 = (uint *)(pbVar157 + 10);
                    puVar128 = (uint *)((long)puVar122 + lVar152 + 0xb);
                    *(ushort *)((long)puVar128 + -2) = *(ushort *)(pbVar157 + 8);
                    *(undefined8 *)((long)puVar128 + -10) = *(undefined8 *)pbVar157;
                    goto LAB_00f315a9;
                  }
                  if (puVar159[pbVar157[lVar152 + 0xb]] != '\0') {
                    pbVar157 = pbVar157 + lVar152;
                    puVar126 = (uint *)(pbVar157 + 0xb);
                    puVar128 = (uint *)((long)puVar122 + lVar152 + 0xc);
                    puVar128[-1] = *(uint *)(pbVar157 + 7);
                    *(undefined8 *)((long)puVar128 + -0xb) = *(undefined8 *)pbVar157;
                    goto LAB_00f315a9;
                  }
                  if (puVar159[pbVar157[lVar152 + 0xc]] != '\0') {
                    pbVar157 = pbVar157 + lVar152;
                    puVar126 = (uint *)(pbVar157 + 0xc);
                    puVar128 = (uint *)((long)puVar122 + lVar152 + 0xd);
                    puVar128[-1] = *(uint *)(pbVar157 + 8);
                    *(undefined8 *)(puVar128 + -3) = *(undefined8 *)pbVar157;
                    goto LAB_00f315a9;
                  }
                  if (puVar159[pbVar157[lVar152 + 0xd]] != '\0') {
                    pbVar157 = pbVar157 + lVar152;
                    puVar126 = (uint *)(pbVar157 + 0xd);
                    uVar113 = *(undefined8 *)pbVar157;
                    puVar128 = (uint *)((long)puVar122 + lVar152 + 0xe);
                    *(undefined8 *)((long)puVar122 + lVar152 + 6) = *(undefined8 *)(pbVar157 + 5);
                    *(undefined8 *)((long)puVar122 + lVar152 + 1) = uVar113;
                    goto LAB_00f315a9;
                  }
                  if (puVar159[pbVar157[lVar152 + 0xe]] != '\0') {
                    pbVar157 = pbVar157 + lVar152;
                    puVar126 = (uint *)(pbVar157 + 0xe);
                    uVar113 = *(undefined8 *)pbVar157;
                    puVar128 = (uint *)((long)puVar122 + lVar152 + 0xf);
                    *(undefined8 *)((long)puVar122 + lVar152 + 7) = *(undefined8 *)(pbVar157 + 6);
                    *(undefined8 *)((long)puVar122 + lVar152 + 1) = uVar113;
                    goto LAB_00f315a9;
                  }
                  if (puVar159[pbVar157[lVar152 + 0xf]] != '\0') {
                    pbVar157 = pbVar157 + lVar152;
                    puVar126 = (uint *)(pbVar157 + 0xf);
                    uVar113 = *(undefined8 *)pbVar157;
                    puVar128 = (uint *)((long)puVar122 + lVar152 + 0x10);
                    *(undefined8 *)((long)puVar122 + lVar152 + 8) = *(undefined8 *)(pbVar157 + 7);
                    *(undefined8 *)((long)puVar122 + lVar152 + 1) = uVar113;
                    goto LAB_00f315a9;
                  }
                  uVar113 = *(undefined8 *)(puVar126 + 2);
                  *(undefined8 *)puVar128 = *(undefined8 *)puVar126;
                  *(undefined8 *)((long)puVar122 + lVar152 + 9) = uVar113;
                  lVar152 = lVar152 + 0x10;
                  lVar149 = lVar149 + -0x10;
                }
LAB_00f31350:
                if (3 < lVar149) {
                  if (puVar159[(byte)*puVar126] == '\0') {
                    if (puVar159[*(byte *)((long)puVar126 + 1)] == '\0') {
                      if (puVar159[*(byte *)((long)puVar126 + 2)] == '\0') {
                        if (puVar159[*(byte *)((long)puVar126 + 3)] == '\0') goto LAB_00f31340;
LAB_00f313fc:
                        *(byte *)((long)puVar128 + 2) = *(byte *)((long)puVar126 + 2);
                        *(ushort *)puVar128 = (ushort)*puVar126;
                        puVar128 = (uint *)((long)puVar128 + 3);
                        puVar126 = (uint *)((long)puVar126 + 3);
                      }
                      else {
LAB_00f313dc:
                        *(ushort *)puVar128 = (ushort)*puVar126;
                        puVar128 = (uint *)((long)puVar128 + 2);
                        puVar126 = (uint *)((long)puVar126 + 2);
                      }
                    }
                    else {
                      bVar155 = (byte)*puVar126;
LAB_00f31598:
                      *(byte *)puVar128 = bVar155;
                      puVar128 = (uint *)((long)puVar128 + 1);
                      puVar126 = (uint *)((long)puVar126 + 1);
                    }
                  }
                  goto LAB_00f315a9;
                }
                goto LAB_00f31393;
              }
              *(byte *)puVar122 = 0x22;
              pbVar111 = (byte *)((long)puVar122 + 1);
              for (uVar105 = uVar160; 0xf < uVar105; uVar105 = uVar105 - 0x10) {
                uVar113 = *(undefined8 *)(pbVar157 + 8);
                *(undefined8 *)pbVar111 = *(undefined8 *)pbVar157;
                *(undefined8 *)(pbVar111 + 8) = uVar113;
                pbVar111 = pbVar111 + 0x10;
                pbVar157 = pbVar157 + 0x10;
              }
              for (uVar160 = uVar160 - (uVar106 >> 8 & 0xfffffffffffff0); 3 < uVar160;
                  uVar160 = uVar160 - 4) {
                *(undefined4 *)pbVar111 = *(undefined4 *)pbVar157;
                pbVar111 = pbVar111 + 4;
                pbVar157 = pbVar157 + 4;
              }
              for (uVar106 = 0; uVar160 != uVar106; uVar106 = uVar106 + 1) {
                pbVar111[uVar106] = pbVar157[uVar106];
              }
              puVar128 = (uint *)(pbVar111 + uVar106);
switchD_00f315d6_default:
              local_e0 = (uint)(local_c0 & 0xff);
              bVar155 = 0x3a;
              if ((~(uint)lVar150 & local_e0) == 0) {
                bVar155 = 0x2c;
              }
              *(byte *)puVar128 = 0x22;
              *(byte *)((long)puVar128 + 1) = bVar155;
              puVar122 = (uint *)((long)puVar128 + 2);
            }
            else if ((~(byte)uVar106 & 6) == 0) {
              if (puVar154 <= puVar122 + 4) {
                uVar160 = local_f0 >> 1;
                if (local_f0 >> 1 < 0x11) {
                  uVar160 = 0x10;
                }
                sVar134 = (uVar160 + 0xf & 0xfffffffffffffff0) + local_f0;
                pbVar157 = (byte *)(*p_Var7)(pvVar6,local_110,local_f0,sVar134);
                if (pbVar157 == (byte *)0x0) goto LAB_00f33695;
                sVar124 = (long)local_d0 - (long)puVar154;
                memmove(pbVar157 + (sVar134 - sVar124),pbVar157 + ((long)puVar154 - (long)local_110)
                        ,sVar124);
                puVar122 = (uint *)(pbVar157 + ((long)puVar122 - (long)local_110));
                local_d0 = (uint *)(pbVar157 + sVar134);
                puVar112 = (uint *)(pbVar157 + (sVar134 - sVar124));
                local_f0 = sVar134;
                local_110 = (uint *)pbVar157;
              }
              if (0xff < uVar106) {
                lVar152 = (uVar106 >> 8) << (bVar155 == 7);
                puVar154 = puVar112 + -4;
                puVar126 = (uint *)((long)puVar122 + 1);
                *(ulong *)(puVar112 + -4) = (local_c0 & 0xff) + lVar150 * 2;
                *(yyjson_mut_val **)(puVar112 + -2) = val;
                *(byte *)puVar122 = (bVar155 == 7) << 5 | 0x5b;
                local_c0 = 0;
                pyVar135 = (yyjson_mut_val *)(pyVar136->uni).u64;
                val = pyVar136;
                lVar150 = lVar152;
                if (bVar155 == 7) {
                  pyVar135 = pyVar135->next;
                  local_c0 = 1;
                }
                goto LAB_00f30d98;
              }
              bVar155 = (bVar155 == 7) * ' ';
              *(byte *)puVar122 = bVar155 + 0x5b;
              *(byte *)((long)puVar122 + 1) = bVar155 | 0x5d;
              *(byte *)((long)puVar122 + 2) = 0x2c;
              puVar122 = (uint *)((long)puVar122 + 3);
            }
            else if (bVar155 == 1) {
              uVar106 = uVar106 >> 8;
              pvVar8 = (pyVar136->uni).ptr;
              if (puVar154 <= (uint *)((long)puVar122 + uVar106 + 2)) {
                uVar160 = local_f0 >> 1;
                if (local_f0 >> 1 <= uVar106 + 2) {
                  uVar160 = uVar106 + 2;
                }
                sVar134 = (uVar160 + 0xf & 0xfffffffffffffff0) + local_f0;
                pbVar157 = (byte *)(*p_Var7)(pvVar6,local_110,local_f0,sVar134);
                if (pbVar157 == (byte *)0x0) goto LAB_00f33695;
                sVar124 = (long)local_d0 - (long)puVar154;
                memmove(pbVar157 + (sVar134 - sVar124),pbVar157 + ((long)puVar154 - (long)local_110)
                        ,sVar124);
                puVar122 = (uint *)(pbVar157 + ((long)puVar122 - (long)local_110));
                local_d0 = (uint *)(pbVar157 + sVar134);
                puVar112 = (uint *)(pbVar157 + (sVar134 - sVar124));
                local_110 = (uint *)pbVar157;
                local_f0 = sVar134;
              }
              switchD_00917c1c::default(puVar122,pvVar8,uVar106);
              pbVar157 = (byte *)((long)puVar122 + uVar106);
              puVar122 = (uint *)(pbVar157 + 1);
              *pbVar157 = 0x2c;
            }
            else {
              uVar118 = (uint)uVar106 & 7;
              if (uVar118 == 2) {
                if (puVar154 <= puVar122 + 4) {
                  uVar106 = local_f0 >> 1;
                  if (local_f0 >> 1 < 0x11) {
                    uVar106 = 0x10;
                  }
                  sVar134 = (uVar106 + 0xf & 0xfffffffffffffff0) + local_f0;
                  pbVar157 = (byte *)(*p_Var7)(pvVar6,local_110,local_f0,sVar134);
                  if (pbVar157 == (byte *)0x0) goto LAB_00f33695;
                  puVar112 = (uint *)(pbVar157 + (sVar134 - ((long)local_d0 - (long)puVar154)));
                  memmove(puVar112,pbVar157 + ((long)puVar154 - (long)local_110),
                          (long)local_d0 - (long)puVar154);
                  puVar122 = (uint *)(pbVar157 + ((long)puVar122 - (long)local_110));
                  local_d0 = (uint *)(pbVar157 + sVar134);
                  local_110 = (uint *)pbVar157;
                  local_f0 = sVar134;
                }
                puVar122[0] = 0x6c6c756e;
                puVar122[1] = 0xa2c;
                puVar122 = (uint *)((long)puVar122 + 5);
              }
              else {
                if (uVar118 != 3) goto LAB_00f336ed;
                if (puVar154 <= puVar122 + 4) {
                  uVar106 = local_f0 >> 1;
                  if (local_f0 >> 1 < 0x11) {
                    uVar106 = 0x10;
                  }
                  sVar134 = (uVar106 + 0xf & 0xfffffffffffffff0) + local_f0;
                  pbVar157 = (byte *)(*p_Var7)(pvVar6,local_110,local_f0,sVar134);
                  if (pbVar157 == (byte *)0x0) goto LAB_00f33695;
                  puVar112 = (uint *)(pbVar157 + (sVar134 - ((long)local_d0 - (long)puVar154)));
                  memmove(puVar112,pbVar157 + ((long)puVar154 - (long)local_110),
                          (long)local_d0 - (long)puVar154);
                  puVar122 = (uint *)(pbVar157 + ((long)puVar122 - (long)local_110));
                  local_d0 = (uint *)(pbVar157 + sVar134);
                  uVar106 = pyVar136->tag;
                  local_110 = (uint *)pbVar157;
                  local_f0 = sVar134;
                }
                bVar162 = (uVar106 & 0x18) != 0;
                uVar113 = 0xa2c65736c6166;
                if (bVar162) {
                  uVar113 = 0xa2c65757274;
                }
                *(undefined8 *)puVar122 = uVar113;
                puVar122 = (uint *)((long)puVar122 + (6 - (ulong)bVar162));
              }
            }
            lVar150 = lVar150 + -1;
            puVar154 = puVar112;
          } while (lVar150 != 0);
          pbVar157 = (byte *)((long)local_110 + ~(ulong)puVar122);
          lVar152 = 0;
          do {
            pyVar135 = val;
            *(byte *)((long)puVar122 + -1) = (char)local_c0 * ' ' + 0x5d;
            puVar126 = (uint *)((long)puVar122 + 1);
            *(byte *)puVar122 = 0x2c;
            if (local_d0 <= (uint *)((long)puVar112 + lVar152)) {
              if (local_fc < '\0') {
                if ((uint *)((long)puVar112 + lVar152) <= (uint *)((long)puVar122 + 3)) {
                  uVar106 = 2;
                  if (2 < local_f0 >> 1) {
                    uVar106 = local_f0 >> 1;
                  }
                  uVar106 = uVar106 + 0xf & 0xfffffffffffffff0;
                  pbVar111 = (byte *)(*p_Var7)(pvVar6,local_110,local_f0,uVar106 + local_f0);
                  if (pbVar111 == (byte *)0x0) goto LAB_00f33695;
                  memmove(pbVar111 +
                          (long)((long)puVar112 + lVar152 + ((uVar106 + local_f0) - (long)local_d0))
                          ,(byte *)((long)puVar112 + (lVar152 - (long)local_110)) + (long)pbVar111,
                          (size_t)((long)local_d0 + (-lVar152 - (long)puVar112)));
                  puVar126 = (uint *)(pbVar111 + -(long)pbVar157);
                  local_110 = (uint *)pbVar111;
                }
                *(byte *)((long)puVar126 + -1) = 10;
                puVar122 = puVar126;
              }
              *(byte *)puVar122 = 0;
              if (dat_len != (usize *)0x0) {
                *dat_len = (long)puVar122 - (long)local_110;
              }
              goto LAB_00f35866;
            }
            puVar127 = (ulong *)((long)puVar112 + lVar152);
            val = *(yyjson_mut_val **)((long)puVar112 + lVar152 + 8);
            local_c0 = *puVar127 & 0xffffffffffffff01;
            lVar152 = lVar152 + 0x10;
            pbVar157 = pbVar157 + -1;
            lVar150 = (*puVar127 >> 1) - 1;
            puVar122 = puVar126;
          } while (lVar150 == 0);
          puVar154 = (uint *)((long)puVar112 + lVar152);
        } while( true );
      }
    }
    else {
      puVar159 = enc_table_cpy;
      if ((flg & 2) == 0) {
        puVar131 = enc_table_cpy_slash;
      }
      else {
        puVar159 = enc_table_esc;
        puVar131 = enc_table_esc_slash;
      }
      if ((flg & 4) == 0) {
        puVar131 = puVar159;
      }
      sVar134 = estimated_val_num * 0x20 + 0x40;
      local_110 = (uint *)(*p_Var4)(pvVar6,sVar134);
      if (local_110 != (uint *)0x0) {
        uVar106 = (ulong)((flg & 0x40) == 0);
        uVar118 = (uint)val->tag & 7;
        bVar162 = uVar118 == 7;
        local_40 = (ulong)bVar162;
        lVar152 = (val->tag >> 8) << bVar162;
        lVar150 = uVar106 * 2 + 2;
        *(byte *)local_110 = bVar162 << 5 | 0x5b;
        *(byte *)((long)local_110 + 1) = 10;
        uVar104 = (val->uni).u64;
        if (uVar118 == 7) {
          uVar104 = *(uint64_t *)(uVar104 + 0x10);
        }
        lVar149 = 1;
        local_f8 = (ulong *)((long)local_110 + (estimated_val_num * 8 + 0x10) * 4);
        puVar154 = (uint *)((long)local_110 + 2);
        pyVar135 = *(yyjson_mut_val **)(uVar104 + 0x10);
        local_b0 = local_f8;
        local_80 = val;
LAB_00f2dc2c:
        uVar107 = local_40 & 0xff;
        uVar160 = lVar149 * 4 + 0x20;
        uVar105 = lVar149 * 4 + 0x10;
        pyVar136 = pyVar135;
LAB_00f2dc62:
        uVar121 = pyVar136->tag;
        bVar155 = (byte)uVar121 & 7;
        uVar118 = (uint)uVar107;
        uVar132 = (uint)lVar152;
        if (bVar155 == 4) {
          uVar121 = 0x20;
          if ((uVar132 & uVar118) == 0) {
            uVar121 = uVar160;
          }
          if (local_f8 <= (ulong *)(uVar121 + (long)puVar154)) {
            uVar103 = sVar134 >> 1;
            if (sVar134 >> 1 <= uVar121) {
              uVar103 = uVar121;
            }
            sVar158 = (uVar103 + 0xf & 0xfffffffffffffff0) + sVar134;
            pbVar157 = (byte *)(*p_Var7)(pvVar6,local_110,sVar134,sVar158);
            if (pbVar157 == (byte *)0x0) goto LAB_00f33695;
            sVar124 = (long)local_b0 - (long)local_f8;
            memmove(pbVar157 + (sVar158 - sVar124),pbVar157 + ((long)local_f8 - (long)local_110),
                    sVar124);
            puVar154 = (uint *)(pbVar157 + ((long)puVar154 - (long)local_110));
            local_b0 = (ulong *)(pbVar157 + sVar158);
            sVar134 = sVar158;
            local_110 = (uint *)pbVar157;
            local_f8 = (ulong *)(pbVar157 + (sVar158 - sVar124));
          }
          lVar137 = 0;
          if ((uVar132 & uVar118) == 0) {
            lVar137 = lVar149;
          }
          iVar138 = (int)puVar154;
          iVar140 = -2 - iVar138;
          puVar153 = (ushort *)((long)puVar154 + 2);
          lVar139 = 0;
          puVar126 = puVar154;
          while (bVar162 = lVar137 != 0, lVar137 = lVar137 + -1, bVar162) {
            pbVar157 = (byte *)((long)puVar154 + lVar139);
            pbVar157[0] = 0x20;
            pbVar157[1] = 0x20;
            pbVar157[2] = 0x20;
            pbVar157[3] = 0x20;
            lVar139 = lVar139 + lVar150;
            iVar140 = iVar140 - (int)lVar150;
            puVar126 = (uint *)((long)puVar126 + lVar150);
            puVar153 = puVar153 + uVar106 + 1;
          }
          uVar121 = (pyVar136->uni).u64;
          uVar118 = (uint)(uVar121 >> 0x20);
          if ((pyVar136->tag & 0x10) == 0) {
            uVar118 = uVar118 >> 0x1f & (uint)(pyVar136->tag >> 3);
            uVar125 = (ulong)uVar118;
            *(byte *)((long)puVar154 + lVar139) = 0x2d;
            uVar103 = -uVar121;
            if (uVar118 == 0) {
              uVar103 = uVar121;
            }
            if (uVar103 < 100000000) {
              if (uVar103 < 100) {
                *(undefined2 *)((long)puVar154 + lVar139 + uVar125) =
                     *(undefined2 *)(digit_table + (ulong)(uVar103 < 10) + uVar103 * 2);
                pbVar157 = (byte *)((long)puVar154 + lVar139 + (uVar125 - (uVar103 < 10)) + 2);
              }
              else {
                iVar140 = (int)uVar103;
                if (uVar103 < 10000) {
                  uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
                  *(undefined2 *)((long)puVar154 + lVar139 + uVar125) =
                       *(undefined2 *)(digit_table + (ulong)(uVar103 < 1000) + (ulong)uVar118 * 2);
                  lVar139 = lVar139 + (uVar125 - (uVar103 < 1000));
                  pbVar157 = (byte *)((long)puVar154 + lVar139 + 4);
                  *(undefined2 *)((long)puVar154 + lVar139 + 2) =
                       *(undefined2 *)(digit_table + (uVar118 * -100 + iVar140) * 2);
                }
                else {
                  if (uVar103 < 1000000) {
                    iVar140 = (int)(uVar103 * 0x68db9 >> 0x20) * -10000 + iVar140;
                    uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
                    *(undefined2 *)((long)puVar154 + lVar139 + uVar125) =
                         *(undefined2 *)
                          (digit_table + (ulong)(uVar103 < 100000) + (uVar103 * 0x68db9 >> 0x20) * 2
                          );
                    lVar139 = lVar139 + (uVar125 - (uVar103 < 100000));
                    lVar137 = lVar139 + 6;
                    *(undefined2 *)((long)puVar154 + lVar139 + 2) =
                         *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                    uVar110 = *(undefined2 *)(digit_table + (uVar118 * -100 + iVar140) * 2);
                  }
                  else {
                    uVar118 = (uint)(uVar103 * 0x68db8bb >> 0x20);
                    uVar132 = uVar118 >> 8;
                    iVar140 = uVar132 * -10000 + iVar140;
                    uVar132 = uVar132 * 0x147b >> 0x13;
                    uVar141 = (uint)(iVar140 * 0x147b) >> 0x13;
                    *(undefined2 *)((long)puVar154 + lVar139 + uVar125) =
                         *(undefined2 *)
                          (digit_table + (ulong)(uVar103 < 10000000) + (ulong)uVar132 * 2);
                    lVar139 = lVar139 + (uVar125 - (uVar103 < 10000000));
                    lVar137 = lVar139 + 8;
                    *(undefined2 *)((long)puVar154 + lVar139 + 2) =
                         *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                    *(undefined2 *)((long)puVar154 + lVar139 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                    uVar110 = *(undefined2 *)(digit_table + (uVar141 * -100 + iVar140) * 2);
                  }
                  *(undefined2 *)((byte *)((long)puVar154 + lVar137) + -2) = uVar110;
                  pbVar157 = (byte *)((long)puVar154 + lVar137);
                }
              }
            }
            else {
              auVar9._8_8_ = 0;
              auVar9._0_8_ = uVar103;
              lVar137 = SUB168(auVar9 / ZEXT816(100000000),0);
              uVar121 = lVar137 * 0xfa0a1f00 + uVar103;
              iVar140 = SUB164(auVar9 / ZEXT816(100000000),0);
              if (uVar103 < 10000000000000000) {
                if (uVar103 < 10000000000) {
                  *(undefined2 *)((long)puVar154 + lVar139 + uVar125) =
                       *(undefined2 *)(digit_table + (ulong)(uVar103 < 1000000000) + lVar137 * 2);
                  pbVar157 = (byte *)((long)puVar154 +
                                     lVar139 + (uVar125 - (uVar103 < 1000000000)) + 2);
                }
                else if (uVar103 < 1000000000000) {
                  uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
                  uVar103 = (ulong)(uVar103 >> 0xb < 0x2e90edd);
                  *(undefined2 *)((long)puVar154 + lVar139 + uVar125) =
                       *(undefined2 *)(digit_table + uVar103 + (ulong)uVar118 * 2);
                  lVar139 = lVar139 + (uVar125 - uVar103);
                  pbVar157 = (byte *)((long)puVar154 + lVar139 + 4);
                  *(undefined2 *)((long)puVar154 + lVar139 + 2) =
                       *(undefined2 *)(digit_table + (uVar118 * -100 + iVar140) * 2);
                }
                else {
                  if (uVar103 < 100000000000000) {
                    iVar140 = (int)((ulong)(lVar137 * 0x68db9) >> 0x20) * -10000 + iVar140;
                    uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
                    uVar103 = (ulong)(uVar103 >> 0xd < 0x48c27395);
                    *(undefined2 *)((long)puVar154 + lVar139 + uVar125) =
                         *(undefined2 *)
                          (digit_table + uVar103 + ((ulong)(lVar137 * 0x68db9) >> 0x20) * 2);
                    lVar139 = lVar139 + (uVar125 - uVar103);
                    lVar137 = lVar139 + 6;
                    *(undefined2 *)((long)puVar154 + lVar139 + 2) =
                         *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                    uVar110 = *(undefined2 *)(digit_table + (uVar118 * -100 + iVar140) * 2);
                  }
                  else {
                    uVar118 = (uint)((ulong)(lVar137 * 0x68db8bb) >> 0x20);
                    uVar132 = uVar118 >> 8;
                    iVar140 = uVar132 * -10000 + iVar140;
                    uVar132 = uVar132 * 0x147b >> 0x13;
                    uVar141 = (uint)(iVar140 * 0x147b) >> 0x13;
                    *(undefined2 *)((long)puVar154 + lVar139 + uVar125) =
                         *(undefined2 *)
                          (digit_table + (ulong)(uVar103 < 1000000000000000) + (ulong)uVar132 * 2);
                    lVar139 = lVar139 + (uVar125 - (uVar103 < 1000000000000000));
                    lVar137 = lVar139 + 8;
                    *(undefined2 *)((long)puVar154 + lVar139 + 2) =
                         *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                    *(undefined2 *)((long)puVar154 + lVar139 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                    uVar110 = *(undefined2 *)(digit_table + (uVar141 * -100 + iVar140) * 2);
                  }
                  pbVar157 = (byte *)((long)puVar154 + lVar137);
                  *(undefined2 *)(pbVar157 + -2) = uVar110;
                }
                uVar118 = (uint)((uVar121 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar132 = uVar118 >> 8;
                iVar140 = uVar132 * -10000 + (int)uVar121;
                uVar132 = uVar132 * 0x147b >> 0x13;
                uVar141 = (uint)(iVar140 * 0x147b) >> 0x13;
                *(undefined2 *)pbVar157 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                *(undefined2 *)(pbVar157 + 2) =
                     *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                *(undefined2 *)(pbVar157 + 4) = *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                *(undefined2 *)(pbVar157 + 6) =
                     *(undefined2 *)(digit_table + (uVar141 * 0x7fffff9c + iVar140) * 2);
                pbVar157 = pbVar157 + 8;
              }
              else {
                auVar10._8_8_ = 0;
                auVar10._0_8_ = uVar103;
                lVar137 = SUB168(auVar10 / ZEXT816(1000000000000),0);
                iVar138 = SUB164(auVar10 / ZEXT816(1000000000000),0);
                if (uVar103 < 1000000000000000000) {
                  uVar123 = lVar137 * 0x68db9;
                  iVar146 = (int)(uVar123 >> 0x20) * -10000 + iVar138;
                  uVar118 = (uint)(iVar146 * 0x147b) >> 0x13;
                  *(undefined2 *)((long)puVar154 + lVar139 + uVar125) =
                       *(undefined2 *)
                        (digit_table + (ulong)(uVar103 < 100000000000000000) + (uVar123 >> 0x20) * 2
                        );
                  lVar139 = lVar139 + (uVar125 - (uVar103 < 100000000000000000));
                  lVar137 = lVar139 + 6;
                  *(undefined2 *)((long)puVar154 + lVar139 + 2) =
                       *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                  uVar110 = *(undefined2 *)(digit_table + (uVar118 * -100 + iVar146) * 2);
                }
                else {
                  uVar118 = (uint)((ulong)(lVar137 * 0x68db8bb) >> 0x20);
                  uVar132 = uVar118 >> 8;
                  iVar146 = uVar132 * -10000 + iVar138;
                  uVar132 = uVar132 * 0x147b >> 0x13;
                  uVar141 = (uint)(iVar146 * 0x147b) >> 0x13;
                  *(undefined2 *)((long)puVar154 + lVar139 + uVar125) =
                       *(undefined2 *)
                        (digit_table + (ulong)(uVar103 < 10000000000000000000) + (ulong)uVar132 * 2)
                  ;
                  lVar139 = lVar139 + (uVar125 - (uVar103 < 10000000000000000000));
                  lVar137 = lVar139 + 8;
                  *(undefined2 *)((long)puVar154 + lVar139 + 2) =
                       *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                  *(undefined2 *)((long)puVar154 + lVar139 + 4) =
                       *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                  uVar110 = *(undefined2 *)(digit_table + (uVar141 * -100 + iVar146) * 2);
                }
                pbVar157 = (byte *)((long)puVar154 + lVar137);
                *(undefined2 *)(pbVar157 + -2) = uVar110;
                iVar140 = iVar140 + iVar138 * -10000;
                uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
                *(undefined2 *)pbVar157 = *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                *(undefined2 *)(pbVar157 + 2) =
                     *(undefined2 *)(digit_table + (uVar118 * 0x7fffff9c + iVar140) * 2);
                uVar118 = (uint)((uVar121 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar132 = uVar118 >> 8;
                iVar140 = uVar132 * -10000 + (int)uVar121;
                uVar132 = uVar132 * 0x147b >> 0x13;
                uVar141 = (uint)(iVar140 * 0x147b) >> 0x13;
                *(undefined2 *)(pbVar157 + 4) = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                *(undefined2 *)(pbVar157 + 6) =
                     *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                *(undefined2 *)(pbVar157 + 8) = *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                *(undefined2 *)(pbVar157 + 10) =
                     *(undefined2 *)(digit_table + (uVar141 * 0x7fffff9c + iVar140) * 2);
                pbVar157 = pbVar157 + 0xc;
              }
            }
          }
          else {
            uVar103 = uVar121 & 0xfffffffffffff;
            uVar118 = uVar118 >> 0x14 & 0x7ff;
            if (uVar118 == 0x7ff) {
              if ((flg & 0x10) == 0) {
                if ((flg & 8) == 0) goto LAB_00f3372c;
                if (uVar103 == 0) {
                  *(byte *)((long)puVar154 + lVar139) = 0x2d;
                  pbVar111 = (byte *)((long)puVar154 + (lVar139 - ((long)uVar121 >> 0x3f)));
                  pbVar157 = pbVar111 + 8;
                  pbVar111[0] = 0x49;
                  pbVar111[1] = 0x6e;
                  pbVar111[2] = 0x66;
                  pbVar111[3] = 0x69;
                  pbVar111[4] = 0x6e;
                  pbVar111[5] = 0x69;
                  pbVar111[6] = 0x74;
                  pbVar111[7] = 0x79;
                }
                else {
                  pbVar111 = (byte *)((long)puVar154 + lVar139);
                  pbVar157 = pbVar111 + 3;
                  pbVar111[0] = 0x4e;
                  pbVar111[1] = 0x61;
                  pbVar111[2] = 0x4e;
                  pbVar111[3] = 0;
                }
              }
              else {
                pbVar111 = (byte *)((long)puVar154 + lVar139);
                pbVar157 = pbVar111 + 4;
                pbVar111[0] = 0x6e;
                pbVar111[1] = 0x75;
                pbVar111[2] = 0x6c;
                pbVar111[3] = 0x6c;
              }
            }
            else {
              *(byte *)((long)puVar154 + lVar139) = 0x2d;
              lVar137 = -((long)uVar121 >> 0x3f);
              pbVar157 = (byte *)((long)puVar154 + lVar137 + lVar139);
              if ((uVar121 & 0x7fffffffffffffff) == 0) {
                pbVar157[0] = 0x30;
                pbVar157[1] = 0x2e;
                pbVar157[2] = 0x30;
                pbVar157[3] = 0;
                pbVar157 = (byte *)((long)puVar154 + lVar139 + lVar137 + 3);
              }
              else if (uVar118 == 0) {
                uVar121 = (ulong)((uint)uVar121 & 1);
                uVar103 = uVar103 * 0x20;
                auVar37._8_8_ = 0;
                auVar37._0_8_ = uVar103 - 0x10;
                auVar88._8_8_ = 0;
                auVar88._0_8_ = SUB168(auVar37 * ZEXT816(0x6c07a2c26a8346d2),8);
                auVar38._8_8_ = 0;
                auVar38._0_8_ = uVar103 - 0x10;
                auVar88 = auVar38 * ZEXT816(0x9e19db92b4e31ba9) + auVar88;
                auVar39._8_8_ = 0;
                auVar39._0_8_ = uVar103;
                auVar89._8_8_ = 0;
                auVar89._0_8_ = SUB168(auVar39 * ZEXT816(0x6c07a2c26a8346d2),8);
                auVar40._8_8_ = 0;
                auVar40._0_8_ = uVar103;
                auVar89 = auVar40 * ZEXT816(0x9e19db92b4e31ba9) + auVar89;
                uVar125 = auVar89._8_8_;
                auVar41._8_8_ = 0;
                auVar41._0_8_ = uVar103 + 0x10;
                auVar90._8_8_ = 0;
                auVar90._0_8_ = SUB168(auVar41 * ZEXT816(0x6c07a2c26a8346d2),8);
                auVar42._8_8_ = 0;
                auVar42._0_8_ = uVar103 + 0x10;
                auVar90 = auVar42 * ZEXT816(0x9e19db92b4e31ba9) + auVar90;
                uVar103 = ((ulong)((auVar88 & (undefined1  [16])0xfffffffffffffffe) !=
                                  (undefined1  [16])0x0) | auVar88._8_8_) + uVar121;
                uVar121 = ((ulong)((auVar90 & (undefined1  [16])0xfffffffffffffffe) !=
                                  (undefined1  [16])0x0) | auVar90._8_8_) - uVar121;
                if (uVar125 < 0x28) {
LAB_00f3013d:
                  uVar123 = (auVar89 & (undefined1  [16])0xfffffffffffffffe) !=
                            (undefined1  [16])0x0 | uVar125;
                  uVar143 = uVar125 & 0x7ffffffffffffffc;
                  bVar162 = true;
                  if (uVar123 <= (uVar143 | 2)) {
                    bVar162 = (bool)((byte)((uVar125 & 0xffffffff) >> 2) & 0x3f &
                                    uVar123 == (uVar143 | 2));
                  }
                  uVar123 = uVar125 >> 2;
                  bVar161 = uVar143 + 4 <= uVar121;
                  if (uVar143 < uVar103 == bVar161) {
                    bVar162 = bVar161;
                  }
                  iVar146 = -0x144;
                }
                else {
                  uVar123 = uVar125 / 0x28;
                  bVar162 = uVar123 * 0x28 + 0x28 <= uVar121;
                  if (uVar123 * 0x28 < uVar103 != bVar162) goto LAB_00f3013d;
                  iVar146 = -0x143;
                }
                uVar123 = bVar162 + uVar123;
                if (uVar123 < 1000000000000000) {
                  iVar148 = (int)uVar123;
                  if (uVar123 < 100000000) {
                    if (uVar123 < 100) {
                      *(undefined2 *)((long)puVar154 + lVar139 + lVar137 + 1) =
                           *(undefined2 *)(digit_table + (ulong)(uVar123 < 10) + uVar123 * 2);
                      pbVar111 = (byte *)((long)puVar154 +
                                         lVar139 + (lVar137 - (ulong)(uVar123 < 10)) + 3);
                    }
                    else {
                      if (9999 < uVar123) {
                        if (uVar123 < 1000000) {
                          iVar148 = (int)(uVar123 * 0x68db9 >> 0x20) * -10000 + iVar148;
                          uVar118 = (uint)(iVar148 * 0x147b) >> 0x13;
                          *(undefined2 *)((long)puVar154 + lVar139 + lVar137 + 1) =
                               *(undefined2 *)
                                (digit_table +
                                (ulong)(uVar123 < 100000) + (uVar123 * 0x68db9 >> 0x20) * 2);
                          lVar114 = lVar139 + (lVar137 - (ulong)(uVar123 < 100000));
                          pbVar111 = (byte *)((long)puVar154 + lVar114 + 7);
                          *(undefined2 *)((long)puVar154 + lVar114 + 3) =
                               *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                          uVar110 = *(undefined2 *)(digit_table + (uVar118 * -100 + iVar148) * 2);
                        }
                        else {
                          uVar118 = (uint)(uVar123 * 0x68db8bb >> 0x20);
                          uVar132 = uVar118 >> 8;
                          iVar148 = uVar132 * -10000 + iVar148;
                          uVar132 = uVar132 * 0x147b >> 0x13;
                          uVar141 = (uint)(iVar148 * 0x147b) >> 0x13;
                          *(undefined2 *)((long)puVar154 + lVar139 + lVar137 + 1) =
                               *(undefined2 *)
                                (digit_table + (ulong)(uVar123 < 10000000) + (ulong)uVar132 * 2);
                          lVar114 = lVar139 + (lVar137 - (ulong)(uVar123 < 10000000));
                          pbVar111 = (byte *)((long)puVar154 + lVar114 + 9);
                          *(undefined2 *)((long)puVar154 + lVar114 + 3) =
                               *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                          *(undefined2 *)((long)puVar154 + lVar114 + 5) =
                               *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                          uVar110 = *(undefined2 *)(digit_table + (uVar141 * -100 + iVar148) * 2);
                        }
                        goto LAB_00f304e0;
                      }
                      uVar118 = (uint)(iVar148 * 0x147b) >> 0x13;
                      *(undefined2 *)((long)puVar154 + lVar139 + lVar137 + 1) =
                           *(undefined2 *)
                            (digit_table + (ulong)(uVar123 < 1000) + (ulong)uVar118 * 2);
                      lVar114 = lVar139 + (lVar137 - (ulong)(uVar123 < 1000));
                      pbVar111 = (byte *)((long)puVar154 + lVar114 + 5);
                      *(undefined2 *)((long)puVar154 + lVar114 + 3) =
                           *(undefined2 *)(digit_table + (uVar118 * -100 + iVar148) * 2);
                    }
                  }
                  else {
                    auVar16._8_8_ = 0;
                    auVar16._0_8_ = uVar123;
                    lVar114 = SUB168(auVar16 / ZEXT816(100000000),0);
                    iVar119 = SUB164(auVar16 / ZEXT816(100000000),0);
                    if (uVar123 < 10000000000) {
                      *(undefined2 *)((long)puVar154 + lVar139 + lVar137 + 1) =
                           *(undefined2 *)
                            (digit_table + (ulong)(uVar123 < 1000000000) + lVar114 * 2);
                      pbVar111 = (byte *)((long)puVar154 +
                                         lVar139 + (lVar137 - (ulong)(uVar123 < 1000000000)) + 3);
                    }
                    else {
                      if (uVar123 < 1000000000000) {
                        uVar118 = (uint)(iVar119 * 0x147b) >> 0x13;
                        uVar121 = (ulong)(uVar123 >> 0xb < 0x2e90edd);
                        *(undefined2 *)((long)puVar154 + lVar139 + lVar137 + 1) =
                             *(undefined2 *)(digit_table + uVar121 + (ulong)uVar118 * 2);
                        uVar110 = *(undefined2 *)(digit_table + (uVar118 * -100 + iVar119) * 2);
                        pbVar111 = (byte *)((long)puVar154 + lVar139 + (lVar137 - uVar121) + 5);
                      }
                      else if (uVar123 < 100000000000000) {
                        iVar133 = (int)((ulong)(lVar114 * 0x68db9) >> 0x20) * -10000 + iVar119;
                        uVar118 = (uint)(iVar133 * 0x147b) >> 0x13;
                        uVar121 = (ulong)(uVar123 >> 0xd < 0x48c27395);
                        *(undefined2 *)((long)puVar154 + lVar139 + lVar137 + 1) =
                             *(undefined2 *)
                              (digit_table + uVar121 + ((ulong)(lVar114 * 0x68db9) >> 0x20) * 2);
                        lVar114 = lVar139 + (lVar137 - uVar121);
                        pbVar111 = (byte *)((long)puVar154 + lVar114 + 7);
                        *(undefined2 *)((long)puVar154 + lVar114 + 3) =
                             *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                        uVar110 = *(undefined2 *)(digit_table + (uVar118 * -100 + iVar133) * 2);
                      }
                      else {
                        uVar118 = (uint)((ulong)(lVar114 * 0x68db8bb) >> 0x20);
                        uVar132 = uVar118 >> 8;
                        iVar133 = uVar132 * -10000 + iVar119;
                        uVar141 = uVar132 * 0x147b >> 0x13;
                        uVar132 = (uint)(iVar133 * 0x147b) >> 0x13;
                        *(undefined2 *)((long)puVar154 + lVar139 + lVar137 + 1) =
                             *(undefined2 *)(digit_table + (ulong)uVar141 * 2 + 1);
                        lVar114 = lVar139 + lVar137;
                        pbVar111 = (byte *)((long)puVar154 + lVar114 + 8);
                        *(undefined2 *)((long)puVar154 + lVar114 + 2) =
                             *(undefined2 *)(digit_table + (uVar141 * -100 + (uVar118 >> 8)) * 2);
                        *(undefined2 *)((long)puVar154 + lVar114 + 4) =
                             *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                        uVar110 = *(undefined2 *)(digit_table + (uVar132 * -100 + iVar133) * 2);
                      }
                      *(undefined2 *)(pbVar111 + -2) = uVar110;
                    }
                    uVar132 = iVar119 * -100000000 + iVar148;
                    uVar118 = (uint)((ulong)uVar132 * 0x68db8bb >> 0x20);
                    uVar141 = uVar118 >> 8;
                    iVar148 = uVar141 * -10000 + uVar132;
                    uVar132 = uVar141 * 0x147b >> 0x13;
                    uVar141 = (uint)(iVar148 * 0x147b) >> 0x13;
                    *(undefined2 *)pbVar111 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                    *(undefined2 *)(pbVar111 + 2) =
                         *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                    *(undefined2 *)(pbVar111 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                    *(undefined2 *)(pbVar111 + 6) =
                         *(undefined2 *)(digit_table + (uVar141 * 0x7fffff9c + iVar148) * 2);
                    pbVar111 = pbVar111 + 8;
                  }
                }
                else {
                  auVar15._8_8_ = 0;
                  auVar15._0_8_ = uVar123;
                  uVar121 = SUB168(auVar15 / ZEXT816(10000000000000000),0) * 0xfa0a1f00 +
                            uVar123 / 100000000;
                  uVar103 = (uVar123 / 100000000) * 0xfa0a1f00 + uVar123;
                  *(byte *)((long)puVar154 + lVar139 + lVar137 + 1) =
                       SUB161(auVar15 / ZEXT816(10000000000000000),0) + 0x30;
                  uVar118 = (uint)((uVar121 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar132 = uVar118 >> 8;
                  iVar148 = uVar132 * -10000 + (int)uVar121;
                  uVar132 = uVar132 * 0x147b >> 0x13;
                  uVar141 = (uint)(iVar148 * 0x147b) >> 0x13;
                  lVar114 = lVar139 + lVar137 + (ulong)(9999999999999999 < uVar123);
                  pbVar111 = (byte *)((long)puVar154 + lVar114 + 0x11);
                  *(undefined2 *)((long)puVar154 + lVar114 + 1) =
                       *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                  *(undefined2 *)((long)puVar154 + lVar114 + 3) =
                       *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                  *(undefined2 *)((long)puVar154 + lVar114 + 5) =
                       *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                  *(undefined2 *)((long)puVar154 + lVar114 + 7) =
                       *(undefined2 *)(digit_table + (uVar141 * 0x7fffff9c + iVar148) * 2);
                  uVar118 = (uint)((uVar103 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar132 = uVar118 >> 8;
                  iVar148 = uVar132 * -10000 + (int)uVar103;
                  uVar132 = uVar132 * 0x147b >> 0x13;
                  uVar141 = (uint)(iVar148 * 0x147b) >> 0x13;
                  *(undefined2 *)((long)puVar154 + lVar114 + 9) =
                       *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                  *(undefined2 *)((long)puVar154 + lVar114 + 0xb) =
                       *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                  *(undefined2 *)((long)puVar154 + lVar114 + 0xd) =
                       *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                  uVar110 = *(undefined2 *)(digit_table + (uVar141 * 0x7fffff9c + iVar148) * 2);
LAB_00f304e0:
                  *(undefined2 *)(pbVar111 + -2) = uVar110;
                }
                *pbVar157 = *(byte *)((long)puVar154 + lVar139 + lVar137 + 1);
                *(byte *)((long)puVar154 + lVar139 + lVar137 + 1) = 0x2e;
                pbVar157 = pbVar111 + 5;
                do {
                  pbVar109 = pbVar157;
                  pbVar157 = pbVar109 + -1;
                } while (pbVar109[-6] == 0x30);
                iVar148 = (iVar146 + (int)pbVar111) - (int)lVar137;
                uVar121 = (ulong)(pbVar109[-6] != 0x2e);
                (pbVar109 + (uVar121 - 6))[0] = 0x65;
                (pbVar109 + (uVar121 - 6))[1] = 0x2d;
                pbVar109[uVar121 - 4] =
                     (char)((uint)(((iVar148 - iVar138) - (int)lVar139) * -0x290 + 0x520) >> 0x10) +
                     0x30;
                *(undefined2 *)(pbVar109 + (uVar121 - 3)) =
                     *(undefined2 *)
                      (digit_table +
                      (((((int)lVar137 - iVar146) - (int)pbVar111) + iVar138 + (int)lVar139 +
                       ((uint)((iVar148 + iVar140) * -0x290) >> 0x10) * 0x7fffff9c) * 2 + 4));
                pbVar157 = pbVar109 + -1 + uVar121;
              }
              else {
                uVar125 = uVar103 + 0x10000000000000;
                if (uVar118 - 0x3ff < 0x35) {
                  lVar114 = 0;
                  if (uVar125 != 0) {
                    for (; (uVar125 >> lVar114 & 1) == 0; lVar114 = lVar114 + 1) {
                    }
                  }
                  if (0x433 - uVar118 <= (uint)lVar114) {
                    uVar125 = uVar125 >> ((byte)(0x433 - uVar118) & 0x3f);
                    iVar140 = (int)uVar125;
                    if (uVar125 < 100000000) {
                      if (uVar125 < 100) {
                        *(undefined2 *)pbVar157 =
                             *(undefined2 *)(digit_table + (ulong)(uVar125 < 10) + uVar125 * 2);
                        pbVar157 = (byte *)((long)puVar154 +
                                           lVar139 + (lVar137 - (ulong)(uVar125 < 10)) + 2);
                      }
                      else if (uVar125 < 10000) {
                        uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
                        *(undefined2 *)pbVar157 =
                             *(undefined2 *)
                              (digit_table + (ulong)(uVar125 < 1000) + (ulong)uVar118 * 2);
                        lVar139 = lVar139 + (lVar137 - (ulong)(uVar125 < 1000));
                        pbVar157 = (byte *)((long)puVar154 + lVar139 + 4);
                        *(undefined2 *)((long)puVar154 + lVar139 + 2) =
                             *(undefined2 *)(digit_table + (uVar118 * -100 + iVar140) * 2);
                      }
                      else {
                        if (uVar125 < 1000000) {
                          iVar140 = (int)(uVar125 * 0x68db9 >> 0x20) * -10000 + iVar140;
                          uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
                          *(undefined2 *)pbVar157 =
                               *(undefined2 *)
                                (digit_table +
                                (ulong)(uVar125 < 100000) + (uVar125 * 0x68db9 >> 0x20) * 2);
                          lVar139 = lVar139 + (lVar137 - (ulong)(uVar125 < 100000));
                          lVar137 = lVar139 + 6;
                          *(undefined2 *)((long)puVar154 + lVar139 + 2) =
                               *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                          uVar110 = *(undefined2 *)(digit_table + (uVar118 * -100 + iVar140) * 2);
                        }
                        else {
                          uVar118 = (uint)(uVar125 * 0x68db8bb >> 0x20);
                          uVar132 = uVar118 >> 8;
                          iVar140 = uVar132 * -10000 + iVar140;
                          uVar132 = uVar132 * 0x147b >> 0x13;
                          uVar141 = (uint)(iVar140 * 0x147b) >> 0x13;
                          *(undefined2 *)pbVar157 =
                               *(undefined2 *)
                                (digit_table + (ulong)(uVar125 < 10000000) + (ulong)uVar132 * 2);
                          lVar139 = lVar139 + (lVar137 - (ulong)(uVar125 < 10000000));
                          lVar137 = lVar139 + 8;
                          *(undefined2 *)((long)puVar154 + lVar139 + 2) =
                               *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                          *(undefined2 *)((long)puVar154 + lVar139 + 4) =
                               *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                          uVar110 = *(undefined2 *)(digit_table + (uVar141 * -100 + iVar140) * 2);
                        }
                        pbVar157 = (byte *)((long)puVar154 + lVar137);
                        *(undefined2 *)(pbVar157 + -2) = uVar110;
                      }
                    }
                    else {
                      auVar14._8_8_ = 0;
                      auVar14._0_8_ = uVar125;
                      lVar114 = SUB168(auVar14 / ZEXT816(100000000),0);
                      iVar138 = SUB164(auVar14 / ZEXT816(100000000),0);
                      if (uVar125 < 10000000000) {
                        *(undefined2 *)pbVar157 =
                             *(undefined2 *)
                              (digit_table + (ulong)(uVar125 < 1000000000) + lVar114 * 2);
                        pbVar157 = (byte *)((long)puVar154 +
                                           lVar139 + (lVar137 - (ulong)(uVar125 < 1000000000)) + 2);
                      }
                      else {
                        if (uVar125 < 1000000000000) {
                          uVar118 = (uint)(iVar138 * 0x147b) >> 0x13;
                          uVar121 = (ulong)(uVar125 >> 0xb < 0x2e90edd);
                          *(undefined2 *)pbVar157 =
                               *(undefined2 *)(digit_table + uVar121 + (ulong)uVar118 * 2);
                          uVar110 = *(undefined2 *)(digit_table + (uVar118 * -100 + iVar138) * 2);
                          pbVar157 = (byte *)((long)puVar154 + lVar139 + (lVar137 - uVar121) + 4);
                        }
                        else if (uVar125 < 100000000000000) {
                          iVar146 = (int)((ulong)(lVar114 * 0x68db9) >> 0x20) * -10000 + iVar138;
                          uVar118 = (uint)(iVar146 * 0x147b) >> 0x13;
                          uVar121 = (ulong)(uVar125 >> 0xd < 0x48c27395);
                          *(undefined2 *)pbVar157 =
                               *(undefined2 *)
                                (digit_table + uVar121 + ((ulong)(lVar114 * 0x68db9) >> 0x20) * 2);
                          lVar139 = lVar139 + (lVar137 - uVar121);
                          pbVar157 = (byte *)((long)puVar154 + lVar139 + 6);
                          *(undefined2 *)((long)puVar154 + lVar139 + 2) =
                               *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                          uVar110 = *(undefined2 *)(digit_table + (uVar118 * -100 + iVar146) * 2);
                        }
                        else {
                          uVar118 = (uint)((ulong)(lVar114 * 0x68db8bb) >> 0x20);
                          uVar132 = uVar118 >> 8;
                          iVar146 = uVar132 * -10000 + iVar138;
                          uVar132 = uVar132 * 0x147b >> 0x13;
                          uVar141 = (uint)(iVar146 * 0x147b) >> 0x13;
                          *(undefined2 *)pbVar157 =
                               *(undefined2 *)
                                (digit_table +
                                (ulong)(uVar125 < 1000000000000000) + (ulong)uVar132 * 2);
                          lVar139 = lVar139 + (lVar137 - (ulong)(uVar125 < 1000000000000000));
                          pbVar157 = (byte *)((long)puVar154 + lVar139 + 8);
                          *(undefined2 *)((long)puVar154 + lVar139 + 2) =
                               *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                          *(undefined2 *)((long)puVar154 + lVar139 + 4) =
                               *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                          uVar110 = *(undefined2 *)(digit_table + (uVar141 * -100 + iVar146) * 2);
                        }
                        *(undefined2 *)(pbVar157 + -2) = uVar110;
                      }
                      uVar132 = iVar138 * -100000000 + iVar140;
                      uVar118 = (uint)((ulong)uVar132 * 0x68db8bb >> 0x20);
                      uVar141 = uVar118 >> 8;
                      iVar140 = uVar141 * -10000 + uVar132;
                      uVar132 = uVar141 * 0x147b >> 0x13;
                      uVar141 = (uint)(iVar140 * 0x147b) >> 0x13;
                      *(undefined2 *)pbVar157 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                      *(undefined2 *)(pbVar157 + 2) =
                           *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                      *(undefined2 *)(pbVar157 + 4) =
                           *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                      *(undefined2 *)(pbVar157 + 6) =
                           *(undefined2 *)(digit_table + (uVar141 * 0x7fffff9c + iVar140) * 2);
                      pbVar157 = pbVar157 + 8;
                    }
                    pbVar157[0] = 0x2e;
                    pbVar157[1] = 0x30;
                    pbVar157 = pbVar157 + 2;
                    goto LAB_00f2fb03;
                  }
                }
                uVar121 = (ulong)((uint)uVar121 & 1);
                iVar140 = uVar118 * 0x4d105 + -0x200a5;
                if (uVar118 == 1 || uVar103 != 0) {
                  iVar140 = uVar118 * 0x4d105;
                }
                iVar140 = iVar140 + -0x1439b7ff >> 0x14;
                uVar123 = *(ulong *)(pow10_sig_table + (ulong)(iVar140 * -2 + 0x2ae) * 8);
                uVar143 = *(long *)(pow10_sig_table + (ulong)(iVar140 * -2 + 0x2af) * 8) +
                          (ulong)(iVar140 - 1U < 0xffffffc8);
                bVar155 = ((char)((uint)(iVar140 * -0x3526b) >> 0x10) + (char)uVar118) - 0x32;
                uVar103 = (ulong)(uVar118 != 1 && uVar103 == 0) + uVar125 * 4 + -2 <<
                          (bVar155 & 0x3f);
                auVar31._8_8_ = 0;
                auVar31._0_8_ = uVar143;
                auVar67._8_8_ = 0;
                auVar67._0_8_ = uVar103;
                auVar85._8_8_ = 0;
                auVar85._0_8_ = SUB168(auVar31 * auVar67,8);
                auVar32._8_8_ = 0;
                auVar32._0_8_ = uVar123;
                auVar68._8_8_ = 0;
                auVar68._0_8_ = uVar103;
                auVar85 = auVar32 * auVar68 + auVar85;
                uVar103 = uVar125 * 4 << (bVar155 & 0x3f);
                auVar33._8_8_ = 0;
                auVar33._0_8_ = uVar143;
                auVar69._8_8_ = 0;
                auVar69._0_8_ = uVar103;
                auVar86._8_8_ = 0;
                auVar86._0_8_ = SUB168(auVar33 * auVar69,8);
                auVar34._8_8_ = 0;
                auVar34._0_8_ = uVar123;
                auVar70._8_8_ = 0;
                auVar70._0_8_ = uVar103;
                auVar86 = auVar34 * auVar70 + auVar86;
                uVar103 = auVar86._8_8_;
                uVar125 = uVar125 * 4 + 2 << (bVar155 & 0x3f);
                auVar35._8_8_ = 0;
                auVar35._0_8_ = uVar143;
                auVar71._8_8_ = 0;
                auVar71._0_8_ = uVar125;
                auVar87._8_8_ = 0;
                auVar87._0_8_ = SUB168(auVar35 * auVar71,8);
                auVar36._8_8_ = 0;
                auVar36._0_8_ = uVar123;
                auVar72._8_8_ = 0;
                auVar72._0_8_ = uVar125;
                auVar87 = auVar36 * auVar72 + auVar87;
                uVar125 = ((ulong)((auVar85 & (undefined1  [16])0xfffffffffffffffe) !=
                                  (undefined1  [16])0x0) | auVar85._8_8_) + uVar121;
                uVar121 = ((ulong)((auVar87 & (undefined1  [16])0xfffffffffffffffe) !=
                                  (undefined1  [16])0x0) | auVar87._8_8_) - uVar121;
                if (uVar103 < 0x28) {
LAB_00f2e149:
                  uVar143 = (auVar86 & (undefined1  [16])0xfffffffffffffffe) !=
                            (undefined1  [16])0x0 | uVar103;
                  uVar123 = uVar103 & 0xfffffffffffffffc;
                  bVar162 = true;
                  if (uVar143 <= uVar123 + 2) {
                    bVar162 = (bool)((byte)((uVar103 & 0xffffffff) >> 2) & 0x3f &
                                    uVar143 == uVar123 + 2);
                  }
                  bVar161 = uVar123 + 4 <= uVar121;
                  if (uVar123 < uVar125 == bVar161) {
                    bVar162 = bVar161;
                  }
                  uVar121 = (ulong)bVar162 + (uVar103 >> 2);
                }
                else {
                  uVar143 = (uVar103 / 0x28) * 0x28;
                  uVar123 = uVar143 + 0x28;
                  if (uVar143 < uVar125 != uVar123 <= uVar121) goto LAB_00f2e149;
                  uVar121 = (uVar103 / 0x28 + 1) - (ulong)(uVar121 < uVar123);
                  iVar140 = iVar140 + 1;
                }
                iVar138 = (0x11 - (uint)(uVar121 < 10000000000000000)) -
                          (uint)(uVar121 < 1000000000000000);
                uVar118 = iVar138 + iVar140;
                if (iVar138 + iVar140 + 5U < 0x1b) {
                  if ((int)uVar118 < 1) {
                    uVar123 = (ulong)(2 - uVar118);
                    auVar13._8_8_ = 0;
                    auVar13._0_8_ = uVar121;
                    uVar103 = SUB168(auVar13 / ZEXT816(100000000),0);
                    uVar121 = uVar103 * 0xfa0a1f00 + uVar121;
                    uVar141 = SUB164(auVar13 / ZEXT816(100000000),0);
                    uVar103 = (uVar103 & 0xffffffff) / 10000;
                    iVar140 = (int)uVar103;
                    iVar138 = iVar140 * -10000 + uVar141;
                    iVar146 = (int)(uVar103 * 0x28f5d >> 0x18);
                    uVar147 = (uint)(iVar146 * 0x29) >> 0xc;
                    uVar151 = uVar147 * -100 + iVar146;
                    uVar132 = iVar146 * -100 + iVar140;
                    *(byte *)((long)puVar154 + lVar139 + uVar123 + lVar137) = (char)uVar147 + 0x30;
                    uVar125 = (ulong)(uVar141 >= 100000000);
                    uVar103 = (ulong)(uVar151 < 10 && uVar141 < 100000000);
                    *(undefined2 *)((long)puVar154 + lVar139 + lVar137 + uVar125 + uVar123) =
                         *(undefined2 *)(digit_table + uVar103 + uVar151 * 2);
                    *(undefined2 *)
                     ((long)puVar154 + lVar139 + 2 + ((lVar137 + uVar125) - uVar103) + uVar123) =
                         *(undefined2 *)(digit_table + uVar132 * 2);
                    lVar114 = -uVar103;
                    iVar140 = (int)uVar121;
                    if (iVar140 == 0) {
                      if (iVar138 == 0) {
                        uVar121 = (ulong)(byte)dec_trailing_zero_table[uVar151];
                        if (uVar132 != 0) {
                          uVar121 = 0;
                        }
                        uVar121 = 4 - (uVar121 + (byte)dec_trailing_zero_table[uVar132]);
                      }
                      else {
                        uVar132 = (uint)(iVar138 * 0x147b) >> 0x13;
                        uVar141 = uVar132 * -100 + iVar138;
                        lVar144 = lVar137 + lVar114 + uVar125 + uVar123;
                        *(undefined2 *)((long)puVar154 + lVar139 + 4 + lVar144) =
                             *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                        *(undefined2 *)((long)puVar154 + lVar139 + 6 + lVar144) =
                             *(undefined2 *)(digit_table + uVar141 * 2);
                        uVar121 = (ulong)(byte)dec_trailing_zero_table[uVar132] + 2;
                        if (uVar141 != 0) {
                          uVar121 = (ulong)(byte)dec_trailing_zero_table[uVar141];
                        }
                        uVar121 = 8 - uVar121;
                      }
                    }
                    else {
                      uVar151 = (uint)(iVar138 * 0x147b) >> 0x13;
                      lVar145 = lVar137 + lVar114 + uVar123 + uVar125;
                      uVar132 = (uint)((uVar121 & 0xffffffff) * 0x68db8bb >> 0x20);
                      uVar141 = uVar132 >> 8;
                      uVar147 = uVar141 * 0x147b >> 0x13;
                      uVar121 = (ulong)uVar147;
                      *(undefined2 *)((long)puVar154 + lVar139 + 4 + lVar145) =
                           *(undefined2 *)(digit_table + (ulong)uVar151 * 2);
                      uVar141 = uVar147 * -100 + uVar141;
                      *(undefined2 *)((long)puVar154 + lVar139 + 6 + lVar145) =
                           *(undefined2 *)(digit_table + (uVar151 * 0x7fffff9c + iVar138) * 2);
                      *(undefined2 *)((long)puVar154 + lVar139 + 8 + lVar145) =
                           *(undefined2 *)(digit_table + uVar121 * 2);
                      *(undefined2 *)((long)puVar154 + lVar139 + 10 + lVar145) =
                           *(undefined2 *)(digit_table + uVar141 * 2);
                      lVar144 = 0xc;
                      iVar140 = (uVar132 >> 8) * -10000 + iVar140;
                      if (iVar140 != 0) {
                        uVar132 = (uint)(iVar140 * 0x147b) >> 0x13;
                        uVar121 = (ulong)uVar132;
                        uVar141 = uVar132 * -100 + iVar140;
                        *(undefined2 *)((long)puVar154 + lVar139 + 0xc + lVar145) =
                             *(undefined2 *)(digit_table + uVar121 * 2);
                        *(undefined2 *)((long)puVar154 + lVar139 + 0xe + lVar145) =
                             *(undefined2 *)(digit_table + uVar141 * 2);
                        lVar144 = 0x10;
                      }
                      uVar121 = (ulong)(byte)dec_trailing_zero_table[uVar121] + 2;
                      if (uVar141 != 0) {
                        uVar121 = (ulong)(byte)dec_trailing_zero_table[uVar141];
                      }
                      uVar121 = lVar144 - uVar121;
                    }
                    *pbVar157 = 0x30;
                    *(byte *)((long)puVar154 + lVar139 + 1 + lVar137) = 0x2e;
                    for (uVar103 = 0;
                        pbVar157 = (byte *)((long)puVar154 +
                                           (uVar121 & 0xffffffff) +
                                           lVar139 + uVar125 + uVar123 + lVar114 + lVar137),
                        -uVar118 != uVar103; uVar103 = uVar103 + 1) {
                      *(byte *)((long)puVar153 + uVar103 + lVar137) = 0x30;
                    }
                  }
                  else {
                    auVar11._8_8_ = 0;
                    auVar11._0_8_ = uVar121;
                    uVar103 = SUB168(auVar11 / ZEXT816(100000000),0);
                    uVar121 = uVar103 * 0xfa0a1f00 + uVar121;
                    uVar132 = SUB164(auVar11 / ZEXT816(100000000),0);
                    uVar103 = (uVar103 & 0xffffffff) / 10000;
                    iVar140 = (int)uVar103;
                    iVar146 = iVar140 * -10000 + uVar132;
                    iVar138 = (int)(uVar103 * 0x28f5d >> 0x18);
                    uVar151 = (uint)(iVar138 * 0x29) >> 0xc;
                    uVar147 = uVar151 * -100 + iVar138;
                    uVar141 = iVar138 * -100 + iVar140;
                    pbVar157[0x10] = 0x30;
                    pbVar157[0x11] = 0x30;
                    pbVar157[0x12] = 0x30;
                    pbVar157[0x13] = 0x30;
                    pbVar157[0x14] = 0x30;
                    pbVar157[0x15] = 0x30;
                    pbVar157[0x16] = 0x30;
                    pbVar157[0x17] = 0x30;
                    pbVar157[0] = 0x30;
                    pbVar157[1] = 0x30;
                    pbVar157[2] = 0x30;
                    pbVar157[3] = 0x30;
                    pbVar157[4] = 0x30;
                    pbVar157[5] = 0x30;
                    pbVar157[6] = 0x30;
                    pbVar157[7] = 0x30;
                    pbVar157[8] = 0x30;
                    pbVar157[9] = 0x30;
                    pbVar157[10] = 0x30;
                    pbVar157[0xb] = 0x30;
                    pbVar157[0xc] = 0x30;
                    pbVar157[0xd] = 0x30;
                    pbVar157[0xe] = 0x30;
                    pbVar157[0xf] = 0x30;
                    *(byte *)((long)puVar154 + lVar139 + 1 + lVar137) = (char)uVar151 + 0x30;
                    uVar103 = (ulong)(uVar132 >= 100000000);
                    uVar125 = (ulong)(uVar147 < 10 && uVar132 < 100000000);
                    *(undefined2 *)((long)puVar154 + lVar139 + 1 + lVar137 + uVar103) =
                         *(undefined2 *)(digit_table + uVar125 + uVar147 * 2);
                    *(undefined2 *)((long)puVar154 + lVar139 + 3 + ((lVar137 + uVar103) - uVar125))
                         = *(undefined2 *)(digit_table + uVar141 * 2);
                    lVar114 = -uVar125;
                    iVar140 = (int)uVar121;
                    if (iVar140 == 0) {
                      if (iVar146 == 0) {
                        uVar121 = (ulong)(byte)dec_trailing_zero_table[uVar147];
                        if (uVar141 != 0) {
                          uVar121 = 0;
                        }
                        uVar121 = uVar121 + (byte)dec_trailing_zero_table[uVar141];
                        lStack_120 = 4;
                        goto LAB_00f2f090;
                      }
                      uVar132 = (uint)(iVar146 * 0x147b) >> 0x13;
                      uVar141 = uVar132 * -100 + iVar146;
                      lVar144 = uVar103 + lVar137 + lVar114;
                      *(undefined2 *)((long)puVar154 + lVar139 + 5 + lVar144) =
                           *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                      *(undefined2 *)((long)puVar154 + lVar139 + 7 + lVar144) =
                           *(undefined2 *)(digit_table + uVar141 * 2);
                      uVar121 = (ulong)(byte)dec_trailing_zero_table[uVar132] + 2;
                      if (uVar141 != 0) {
                        uVar121 = (ulong)(byte)dec_trailing_zero_table[uVar141];
                      }
                      uVar121 = 8 - uVar121;
                    }
                    else {
                      uVar141 = (uint)(iVar146 * 0x147b) >> 0x13;
                      uVar132 = (uint)((uVar121 & 0xffffffff) * 0x68db8bb >> 0x20);
                      uVar151 = uVar132 >> 8;
                      uVar147 = uVar151 * 0x147b >> 0x13;
                      uVar121 = (ulong)uVar147;
                      uVar132 = uVar147 * -100 + (uVar132 >> 8);
                      lVar144 = uVar103 + lVar137 + lVar114;
                      *(undefined2 *)((long)puVar154 + lVar139 + 5 + lVar144) =
                           *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                      *(undefined2 *)((long)puVar154 + lVar139 + 7 + lVar144) =
                           *(undefined2 *)(digit_table + (uVar141 * 0x7fffff9c + iVar146) * 2);
                      *(undefined2 *)((long)puVar154 + lVar139 + 9 + lVar144) =
                           *(undefined2 *)(digit_table + uVar121 * 2);
                      *(undefined2 *)((long)puVar154 + lVar139 + 0xb + lVar144) =
                           *(undefined2 *)(digit_table + uVar132 * 2);
                      lStack_120 = 0xc;
                      iVar140 = uVar151 * -10000 + iVar140;
                      if (iVar140 != 0) {
                        uVar132 = (uint)(iVar140 * 0x147b) >> 0x13;
                        uVar121 = (ulong)uVar132;
                        uVar132 = uVar132 * -100 + iVar140;
                        *(undefined2 *)((long)puVar154 + lVar139 + 0xd + lVar144) =
                             *(undefined2 *)(digit_table + uVar121 * 2);
                        *(undefined2 *)((long)puVar154 + lVar139 + 0xf + lVar144) =
                             *(undefined2 *)(digit_table + uVar132 * 2);
                        lStack_120 = 0x10;
                      }
                      uVar121 = (ulong)(byte)dec_trailing_zero_table[uVar121] + 2;
                      if (uVar132 != 0) {
                        uVar121 = (ulong)(byte)dec_trailing_zero_table[uVar132];
                      }
LAB_00f2f090:
                      uVar121 = lStack_120 - uVar121;
                    }
                    pbVar111 = (byte *)((long)puVar154 +
                                       lVar139 + (uVar121 & 0xffffffff) +
                                                 lVar114 + lVar137 + uVar103 + 1);
                    for (uVar121 = 0; uVar118 != uVar121; uVar121 = uVar121 + 1) {
                      *(byte *)((long)puVar126 + uVar121 + lVar137) =
                           *(byte *)((long)puVar126 + uVar121 + lVar137 + 1);
                    }
                    pbVar109 = (byte *)((long)puVar154 + lVar139 + lVar137 + (ulong)uVar118);
                    pbVar157 = pbVar109 + 2;
                    *pbVar109 = 0x2e;
                    if (pbVar157 < pbVar111) {
                      pbVar157 = pbVar111;
                    }
                  }
                }
                else {
                  auVar12._8_8_ = 0;
                  auVar12._0_8_ = uVar121;
                  uVar125 = SUB168(auVar12 / ZEXT816(100000000),0);
                  uVar147 = SUB164(auVar12 / ZEXT816(100000000),0);
                  lVar114 = 2 - (ulong)(uVar147 < 100000000);
                  uVar103 = (uVar125 & 0xffffffff) / 10000;
                  iVar140 = (int)uVar103;
                  iVar146 = iVar140 * -10000 + uVar147;
                  uVar121 = uVar125 * 0xfa0a1f00 + uVar121;
                  iVar138 = (int)(uVar103 * 0x28f5d >> 0x18);
                  uVar132 = (uint)(iVar138 * 0x29) >> 0xc;
                  uVar151 = uVar132 * -100 + iVar138;
                  uVar141 = iVar138 * -100 + iVar140;
                  *(byte *)((long)puVar154 + lVar139 + 1 + lVar137) = (char)uVar132 + 0x30;
                  lVar144 = lVar137 + lVar114;
                  uVar103 = (ulong)(uVar151 < 10 && uVar147 < 100000000);
                  *(undefined2 *)((long)puVar154 + lVar139 + lVar144) =
                       *(undefined2 *)(digit_table + uVar103 + uVar151 * 2);
                  *(undefined2 *)((long)puVar154 + lVar139 + 2 + (lVar144 - uVar103)) =
                       *(undefined2 *)(digit_table + uVar141 * 2);
                  lVar145 = -uVar103;
                  iVar140 = (int)uVar121;
                  if (iVar140 == 0) {
                    if (iVar146 == 0) {
                      uVar132 = (uint)(byte)dec_trailing_zero_table[uVar151];
                      if (uVar141 != 0) {
                        uVar132 = 0;
                      }
                      uVar132 = uVar132 + (byte)dec_trailing_zero_table[uVar141];
                      iVar140 = 4;
                    }
                    else {
                      uVar132 = (uint)(iVar146 * 0x147b) >> 0x13;
                      uVar141 = uVar132 * -100 + iVar146;
                      *(undefined2 *)((long)puVar154 + lVar139 + 4 + lVar145 + lVar144) =
                           *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                      *(undefined2 *)((long)puVar154 + lVar139 + 6 + lVar145 + lVar144) =
                           *(undefined2 *)(digit_table + uVar141 * 2);
                      uVar132 = (byte)dec_trailing_zero_table[uVar132] + 2;
                      if (uVar141 != 0) {
                        uVar132 = (uint)(byte)dec_trailing_zero_table[uVar141];
                      }
                      iVar140 = 8;
                    }
                    uVar132 = iVar140 - uVar132;
                  }
                  else {
                    uVar151 = (uint)(iVar146 * 0x147b) >> 0x13;
                    uVar132 = (uint)((uVar121 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar141 = uVar132 >> 8;
                    uVar156 = uVar141 * 0x147b >> 0x13;
                    uVar147 = uVar156 * -100 + (uVar132 >> 8);
                    lVar115 = lVar145 + lVar144;
                    *(undefined2 *)((long)puVar154 + lVar139 + 4 + lVar115) =
                         *(undefined2 *)(digit_table + (ulong)uVar151 * 2);
                    *(undefined2 *)((long)puVar154 + lVar139 + 6 + lVar115) =
                         *(undefined2 *)(digit_table + (uVar151 * 0x7fffff9c + iVar146) * 2);
                    *(undefined2 *)((long)puVar154 + lVar139 + 8 + lVar115) =
                         *(undefined2 *)(digit_table + (ulong)uVar156 * 2);
                    *(undefined2 *)((long)puVar154 + lVar139 + 10 + lVar115) =
                         *(undefined2 *)(digit_table + uVar147 * 2);
                    iVar140 = uVar141 * -10000 + iVar140;
                    if (iVar140 == 0) {
                      uVar132 = (byte)dec_trailing_zero_table[uVar156] + 2;
                      if (uVar147 != 0) {
                        uVar132 = (uint)(byte)dec_trailing_zero_table[uVar147];
                      }
                      iVar140 = 0xc;
                    }
                    else {
                      uVar132 = (uint)(iVar140 * 0x147b) >> 0x13;
                      uVar141 = uVar132 * -100 + iVar140;
                      *(undefined2 *)((long)puVar154 + lVar139 + 0xc + lVar115) =
                           *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
                      *(undefined2 *)((long)puVar154 + lVar139 + 0xe + lVar115) =
                           *(undefined2 *)(digit_table + uVar141 * 2);
                      uVar132 = (byte)dec_trailing_zero_table[uVar132] + 2;
                      if (uVar141 != 0) {
                        uVar132 = (uint)(byte)dec_trailing_zero_table[uVar141];
                      }
                      iVar140 = 0x10;
                    }
                    uVar132 = iVar140 - uVar132;
                  }
                  uVar125 = (ulong)uVar132;
                  uVar121 = (ulong)((lVar114 - uVar103) + uVar125 == 2);
                  lVar115 = -uVar121;
                  lVar114 = (lVar144 - uVar121) + lVar145 + uVar125;
                  uVar118 = uVar118 - 1;
                  *pbVar157 = *(byte *)((long)puVar154 + lVar139 + lVar137 + 1);
                  *(byte *)((long)puVar154 + lVar139 + lVar137 + 1) = 0x2e;
                  pbVar157 = (byte *)((long)puVar154 + lVar139 + lVar114);
                  pbVar157[0] = 0x65;
                  pbVar157[1] = 0x2d;
                  uVar121 = (ulong)(uVar118 >> 0x1f);
                  lVar114 = uVar121 + lVar114;
                  uVar132 = -uVar118;
                  if (0 < (int)uVar118) {
                    uVar132 = uVar118;
                  }
                  if (uVar132 < 100) {
                    *(undefined2 *)((long)puVar154 + lVar139 + lVar114 + 1) =
                         *(undefined2 *)(digit_table + (ulong)(uVar132 < 10) + (ulong)uVar132 * 2);
                    pbVar157 = (byte *)((long)puVar154 +
                                       lVar139 + ((lVar144 + uVar121 + lVar115) -
                                                 (ulong)(uVar132 < 10)) + lVar145 + uVar125 + 3);
                  }
                  else {
                    *(byte *)((long)puVar154 + lVar139 + lVar114 + 1) =
                         (char)(uVar132 * 0x290 >> 0x10) + 0x30;
                    lVar139 = lVar139 + lVar115 + lVar144 + uVar121 + lVar145 + uVar125;
                    pbVar157 = (byte *)((long)puVar154 + lVar139 + 4);
                    *(undefined2 *)((long)puVar154 + lVar139 + 2) =
                         *(undefined2 *)
                          (digit_table + ((uVar132 * 0x290 >> 0x10) * 0x7fffff9c + uVar132) * 2);
                  }
                }
              }
            }
          }
LAB_00f2fb03:
          pbVar157[0] = 0x2c;
          pbVar157[1] = 10;
          puVar154 = (uint *)(pbVar157 + 2);
        }
        else if (((uint)uVar121 & 7) == 5) {
          uVar125 = uVar121 >> 8;
          uVar103 = 0x10;
          if ((uVar132 & uVar118) == 0) {
            uVar103 = uVar105;
          }
          pbVar157 = (byte *)(pyVar136->uni).str;
          uVar103 = uVar103 + uVar125 * 6;
          if (local_f8 <= (ulong *)(uVar103 + (long)puVar154)) {
            uVar123 = sVar134 >> 1;
            if (sVar134 >> 1 <= uVar103) {
              uVar123 = uVar103;
            }
            sVar158 = (uVar123 + 0xf & 0xfffffffffffffff0) + sVar134;
            pbVar111 = (byte *)(*p_Var7)(pvVar6,local_110,sVar134,sVar158);
            if (pbVar111 == (byte *)0x0) goto LAB_00f33695;
            sVar124 = (long)local_b0 - (long)local_f8;
            memmove(pbVar111 + (sVar158 - sVar124),pbVar111 + ((long)local_f8 - (long)local_110),
                    sVar124);
            puVar154 = (uint *)(pbVar111 + ((long)puVar154 - (long)local_110));
            local_b0 = (ulong *)(pbVar111 + sVar158);
            sVar134 = sVar158;
            local_110 = (uint *)pbVar111;
            local_f8 = (ulong *)(pbVar111 + (sVar158 - sVar124));
          }
          lVar137 = 0;
          if ((uVar132 & uVar118) == 0) {
            lVar137 = lVar149;
          }
          while (lVar137 != 0) {
            *puVar154 = 0x20202020;
            puVar154 = (uint *)((long)puVar154 + lVar150);
            lVar137 = lVar137 + -1;
          }
          if ((puVar131 != enc_table_cpy) || ((pyVar136->tag & 0x18) == 0)) {
            puVar126 = (uint *)(pbVar157 + uVar125);
            *(byte *)puVar154 = 0x22;
LAB_00f2e1b2:
            lVar139 = (long)puVar126 - (long)pbVar157;
            lVar137 = 0;
            while( true ) {
              puVar122 = (uint *)(pbVar157 + lVar137);
              puVar112 = (uint *)((long)puVar154 + lVar137 + 1);
              if (lVar139 < 0x10) break;
              bVar155 = (byte)*puVar122;
              if (puVar131[bVar155] != '\0') {
                puVar122 = (uint *)(pbVar157 + lVar137);
                puVar112 = (uint *)((long)puVar154 + lVar137 + 1);
                goto LAB_00f2e5f0;
              }
              if (puVar131[pbVar157[lVar137 + 1]] != '\0') {
                puVar122 = (uint *)(pbVar157 + lVar137);
                puVar112 = (uint *)((long)puVar154 + lVar137 + 1);
                goto LAB_00f2e5a2;
              }
              if (puVar131[pbVar157[lVar137 + 2]] != '\0') {
                puVar122 = (uint *)(pbVar157 + lVar137);
                puVar112 = (uint *)((long)puVar154 + lVar137 + 1);
                goto LAB_00f2e5b3;
              }
              if (puVar131[pbVar157[lVar137 + 3]] != '\0') {
                puVar122 = (uint *)(pbVar157 + lVar137);
                puVar112 = (uint *)((long)puVar154 + lVar137 + 1);
                goto LAB_00f2e5ca;
              }
              if (puVar131[pbVar157[lVar137 + 4]] != '\0') {
                puVar122 = (uint *)(pbVar157 + lVar137 + 4);
                puVar112 = (uint *)((long)puVar154 + lVar137 + 5);
                *(undefined4 *)((long)puVar154 + lVar137 + 1) = *(undefined4 *)(pbVar157 + lVar137);
                goto LAB_00f2e5f0;
              }
              if (puVar131[pbVar157[lVar137 + 5]] != '\0') {
                pbVar157 = pbVar157 + lVar137;
                puVar122 = (uint *)(pbVar157 + 5);
                puVar112 = (uint *)((long)puVar154 + lVar137 + 6);
                *(byte *)((long)puVar112 + -1) = pbVar157[4];
                *(undefined4 *)((long)puVar112 + -5) = *(undefined4 *)pbVar157;
                goto LAB_00f2e5f0;
              }
              if (puVar131[pbVar157[lVar137 + 6]] != '\0') {
                pbVar157 = pbVar157 + lVar137;
                puVar122 = (uint *)(pbVar157 + 6);
                puVar112 = (uint *)((long)puVar154 + lVar137 + 7);
                *(ushort *)((long)puVar112 + -2) = *(ushort *)(pbVar157 + 4);
                *(undefined4 *)((long)puVar112 + -6) = *(undefined4 *)pbVar157;
                goto LAB_00f2e5f0;
              }
              if (puVar131[pbVar157[lVar137 + 7]] != '\0') {
                pbVar157 = pbVar157 + lVar137;
                puVar122 = (uint *)(pbVar157 + 7);
                uVar3 = *(undefined4 *)pbVar157;
                puVar112 = (uint *)((long)puVar154 + lVar137 + 8);
                *(undefined4 *)((long)puVar154 + lVar137 + 4) = *(undefined4 *)(pbVar157 + 3);
                *(undefined4 *)((long)puVar154 + lVar137 + 1) = uVar3;
                goto LAB_00f2e5f0;
              }
              if (puVar131[pbVar157[lVar137 + 8]] != '\0') {
                puVar122 = (uint *)(pbVar157 + lVar137 + 8);
                puVar112 = (uint *)((long)puVar154 + lVar137 + 9);
                *(undefined8 *)((long)puVar154 + lVar137 + 1) = *(undefined8 *)(pbVar157 + lVar137);
                goto LAB_00f2e5f0;
              }
              if (puVar131[pbVar157[lVar137 + 9]] != '\0') {
                pbVar157 = pbVar157 + lVar137;
                puVar122 = (uint *)(pbVar157 + 9);
                puVar112 = (uint *)((long)puVar154 + lVar137 + 10);
                *(byte *)((long)puVar112 + -1) = pbVar157[8];
                *(undefined8 *)((long)puVar112 + -9) = *(undefined8 *)pbVar157;
                goto LAB_00f2e5f0;
              }
              if (puVar131[pbVar157[lVar137 + 10]] != '\0') {
                pbVar157 = pbVar157 + lVar137;
                puVar122 = (uint *)(pbVar157 + 10);
                puVar112 = (uint *)((long)puVar154 + lVar137 + 0xb);
                *(ushort *)((long)puVar112 + -2) = *(ushort *)(pbVar157 + 8);
                *(undefined8 *)((long)puVar112 + -10) = *(undefined8 *)pbVar157;
                goto LAB_00f2e5f0;
              }
              if (puVar131[pbVar157[lVar137 + 0xb]] != '\0') {
                pbVar157 = pbVar157 + lVar137;
                puVar122 = (uint *)(pbVar157 + 0xb);
                puVar112 = (uint *)((long)puVar154 + lVar137 + 0xc);
                puVar112[-1] = *(uint *)(pbVar157 + 7);
                *(undefined8 *)((long)puVar112 + -0xb) = *(undefined8 *)pbVar157;
                goto LAB_00f2e5f0;
              }
              if (puVar131[pbVar157[lVar137 + 0xc]] != '\0') {
                pbVar157 = pbVar157 + lVar137;
                puVar122 = (uint *)(pbVar157 + 0xc);
                puVar112 = (uint *)((long)puVar154 + lVar137 + 0xd);
                puVar112[-1] = *(uint *)(pbVar157 + 8);
                *(undefined8 *)(puVar112 + -3) = *(undefined8 *)pbVar157;
                goto LAB_00f2e5f0;
              }
              if (puVar131[pbVar157[lVar137 + 0xd]] != '\0') {
                pbVar157 = pbVar157 + lVar137;
                puVar122 = (uint *)(pbVar157 + 0xd);
                uVar113 = *(undefined8 *)pbVar157;
                puVar112 = (uint *)((long)puVar154 + lVar137 + 0xe);
                *(undefined8 *)((long)puVar154 + lVar137 + 6) = *(undefined8 *)(pbVar157 + 5);
                *(undefined8 *)((long)puVar154 + lVar137 + 1) = uVar113;
                goto LAB_00f2e5f0;
              }
              if (puVar131[pbVar157[lVar137 + 0xe]] != '\0') {
                pbVar157 = pbVar157 + lVar137;
                puVar122 = (uint *)(pbVar157 + 0xe);
                uVar113 = *(undefined8 *)pbVar157;
                puVar112 = (uint *)((long)puVar154 + lVar137 + 0xf);
                *(undefined8 *)((long)puVar154 + lVar137 + 7) = *(undefined8 *)(pbVar157 + 6);
                *(undefined8 *)((long)puVar154 + lVar137 + 1) = uVar113;
                goto LAB_00f2e5f0;
              }
              if (puVar131[pbVar157[lVar137 + 0xf]] != '\0') {
                pbVar157 = pbVar157 + lVar137;
                puVar122 = (uint *)(pbVar157 + 0xf);
                uVar113 = *(undefined8 *)pbVar157;
                puVar112 = (uint *)((long)puVar154 + lVar137 + 0x10);
                *(undefined8 *)((long)puVar154 + lVar137 + 8) = *(undefined8 *)(pbVar157 + 7);
                *(undefined8 *)((long)puVar154 + lVar137 + 1) = uVar113;
                goto LAB_00f2e5f0;
              }
              uVar113 = *(undefined8 *)(puVar122 + 2);
              *(undefined8 *)puVar112 = *(undefined8 *)puVar122;
              *(undefined8 *)((long)puVar154 + lVar137 + 9) = uVar113;
              lVar137 = lVar137 + 0x10;
              lVar139 = lVar139 + -0x10;
            }
LAB_00f2e2f6:
            if (3 < lVar139) {
              if (puVar131[(byte)*puVar122] == '\0') {
                if (puVar131[*(byte *)((long)puVar122 + 1)] == '\0') {
                  if (puVar131[*(byte *)((long)puVar122 + 2)] == '\0') {
                    if (puVar131[*(byte *)((long)puVar122 + 3)] == '\0') goto code_r0x00f2e333;
LAB_00f2e5ca:
                    *(byte *)((long)puVar112 + 2) = *(byte *)((long)puVar122 + 2);
                    *(ushort *)puVar112 = (ushort)*puVar122;
                    puVar112 = (uint *)((long)puVar112 + 3);
                    puVar122 = (uint *)((long)puVar122 + 3);
                  }
                  else {
LAB_00f2e5b3:
                    *(ushort *)puVar112 = (ushort)*puVar122;
                    puVar112 = (uint *)((long)puVar112 + 2);
                    puVar122 = (uint *)((long)puVar122 + 2);
                  }
                }
                else {
                  bVar155 = (byte)*puVar122;
LAB_00f2e5a2:
                  *(byte *)puVar112 = bVar155;
                  puVar112 = (uint *)((long)puVar112 + 1);
                  puVar122 = (uint *)((long)puVar122 + 1);
                }
              }
              goto LAB_00f2e5f0;
            }
            goto LAB_00f2e34c;
          }
          *(byte *)puVar154 = 0x22;
          pbVar111 = (byte *)((long)puVar154 + 1);
          for (uVar103 = uVar125; 0xf < uVar103; uVar103 = uVar103 - 0x10) {
            uVar113 = *(undefined8 *)(pbVar157 + 8);
            *(undefined8 *)pbVar111 = *(undefined8 *)pbVar157;
            *(undefined8 *)(pbVar111 + 8) = uVar113;
            pbVar111 = pbVar111 + 0x10;
            pbVar157 = pbVar157 + 0x10;
          }
          for (uVar125 = uVar125 - (uVar121 >> 8 & 0xfffffffffffff0); 3 < uVar125;
              uVar125 = uVar125 - 4) {
            *(undefined4 *)pbVar111 = *(undefined4 *)pbVar157;
            pbVar111 = pbVar111 + 4;
            pbVar157 = pbVar157 + 4;
          }
          for (uVar121 = 0; uVar125 != uVar121; uVar121 = uVar121 + 1) {
            pbVar111[uVar121] = pbVar157[uVar121];
          }
          puVar112 = (uint *)(pbVar111 + uVar121);
switchD_00f2e61f_default:
          bVar162 = (~uVar132 & uVar118) == 0;
          *(byte *)puVar112 = 0x22;
          bVar155 = 0x3a;
          if (bVar162) {
            bVar155 = 0x2c;
          }
          *(byte *)((long)puVar112 + 1) = bVar155;
          bVar155 = 0x20;
          if (bVar162) {
            bVar155 = 10;
          }
          *(byte *)((long)puVar112 + 2) = bVar155;
          puVar154 = (uint *)((long)puVar112 + 3);
        }
        else if ((~(byte)uVar121 & 6) == 0) {
          if (0xff < uVar121) {
            local_40 = (ulong)(bVar155 == 7);
            if ((uVar132 & uVar118) != 0) {
              uVar160 = 0x20;
            }
            if (local_f8 <= (ulong *)(uVar160 + (long)puVar154)) {
              uVar105 = sVar134 >> 1;
              if (sVar134 >> 1 <= uVar160) {
                uVar105 = uVar160;
              }
              sVar158 = (uVar105 + 0xf & 0xfffffffffffffff0) + sVar134;
              pbVar157 = (byte *)(*p_Var7)(pvVar6,local_110,sVar134,sVar158);
              if (pbVar157 == (byte *)0x0) goto LAB_00f33695;
              sVar124 = (long)local_b0 - (long)local_f8;
              memmove(pbVar157 + (sVar158 - sVar124),pbVar157 + ((long)local_f8 - (long)local_110),
                      sVar124);
              puVar154 = (uint *)(pbVar157 + ((long)puVar154 - (long)local_110));
              local_b0 = (ulong *)(pbVar157 + sVar158);
              sVar134 = sVar158;
              local_f8 = (ulong *)(pbVar157 + (sVar158 - sVar124));
              local_110 = (uint *)pbVar157;
            }
            local_f8[-2] = uVar107 + lVar152 * 2;
            local_f8[-1] = (ulong)local_80;
            local_f8 = local_f8 + -2;
            lVar152 = 0;
            if ((uVar132 & uVar118) == 0) {
              lVar152 = lVar149;
            }
            puVar154 = (uint *)((long)puVar154 + 2);
            while (bVar162 = lVar152 != 0, lVar152 = lVar152 + -1, bVar162) {
              ((ushort *)((long)puVar154 + -2))[0] = 0x2020;
              ((ushort *)((long)puVar154 + -2))[1] = 0x2020;
              puVar154 = (uint *)((long)puVar154 + lVar150);
            }
            lVar152 = (uVar121 >> 8) << (bVar155 == 7);
            *(byte *)((long)puVar154 + -2) = (bVar155 == 7) << 5 | 0x5b;
            *(byte *)((long)puVar154 + -1) = 10;
            uVar104 = (pyVar136->uni).u64;
            if (bVar155 == 7) {
              uVar104 = *(uint64_t *)(uVar104 + 0x10);
            }
            lVar149 = lVar149 + 1;
            pyVar135 = *(yyjson_mut_val **)(uVar104 + 0x10);
            local_80 = pyVar136;
            goto LAB_00f2dc2c;
          }
          uVar121 = 0x10;
          if ((uVar132 & uVar118) == 0) {
            uVar121 = uVar105;
          }
          if (local_f8 <= (ulong *)(uVar121 + (long)puVar154)) {
            uVar103 = sVar134 >> 1;
            if (sVar134 >> 1 <= uVar121) {
              uVar103 = uVar121;
            }
            sVar158 = (uVar103 + 0xf & 0xfffffffffffffff0) + sVar134;
            pbVar157 = (byte *)(*p_Var7)(pvVar6,local_110,sVar134,sVar158);
            if (pbVar157 == (byte *)0x0) goto LAB_00f33695;
            sVar124 = (long)local_b0 - (long)local_f8;
            memmove(pbVar157 + (sVar158 - sVar124),pbVar157 + ((long)local_f8 - (long)local_110),
                    sVar124);
            puVar154 = (uint *)(pbVar157 + ((long)puVar154 - (long)local_110));
            local_b0 = (ulong *)(pbVar157 + sVar158);
            sVar134 = sVar158;
            local_f8 = (ulong *)(pbVar157 + (sVar158 - sVar124));
            local_110 = (uint *)pbVar157;
          }
          lVar137 = 0;
          if ((uVar132 & uVar118) == 0) {
            lVar137 = lVar149;
          }
          puVar154 = puVar154 + 1;
          while (bVar162 = lVar137 != 0, lVar137 = lVar137 + -1, bVar162) {
            puVar154[-1] = 0x20202020;
            puVar154 = (uint *)((long)puVar154 + lVar150);
          }
          bVar155 = (bVar155 == 7) * ' ';
          *(byte *)(puVar154 + -1) = bVar155 + 0x5b;
          *(byte *)((long)puVar154 + -3) = bVar155 | 0x5d;
          *(ushort *)((long)puVar154 + -2) = 0xa2c;
        }
        else if (bVar155 == 1) {
          uVar121 = uVar121 >> 8;
          pvVar8 = (pyVar136->uni).ptr;
          if (local_f8 <= (ulong *)((long)puVar154 + uVar121 + 3)) {
            uVar103 = sVar134 >> 1;
            if (sVar134 >> 1 <= uVar121 + 3) {
              uVar103 = uVar121 + 3;
            }
            sVar158 = (uVar103 + 0xf & 0xfffffffffffffff0) + sVar134;
            pbVar157 = (byte *)(*p_Var7)(pvVar6,local_110,sVar134,sVar158);
            if (pbVar157 == (byte *)0x0) goto LAB_00f33695;
            sVar124 = (long)local_b0 - (long)local_f8;
            memmove(pbVar157 + (sVar158 - sVar124),pbVar157 + ((long)local_f8 - (long)local_110),
                    sVar124);
            puVar154 = (uint *)(pbVar157 + ((long)puVar154 - (long)local_110));
            local_b0 = (ulong *)(pbVar157 + sVar158);
            local_f8 = (ulong *)(pbVar157 + (sVar158 - sVar124));
            sVar134 = sVar158;
            local_110 = (uint *)pbVar157;
          }
          switchD_00917c1c::default(puVar154,pvVar8,uVar121);
          pbVar157 = (byte *)((long)puVar154 + uVar121);
          puVar154 = (uint *)(pbVar157 + 2);
          pbVar157[0] = 0x2c;
          pbVar157[1] = 10;
        }
        else if (bVar155 == 2) {
          uVar121 = 0x10;
          if ((uVar132 & uVar118) == 0) {
            uVar121 = uVar105;
          }
          if (local_f8 <= (ulong *)(uVar121 + (long)puVar154)) {
            uVar103 = sVar134 >> 1;
            if (sVar134 >> 1 <= uVar121) {
              uVar103 = uVar121;
            }
            sVar158 = (uVar103 + 0xf & 0xfffffffffffffff0) + sVar134;
            pbVar157 = (byte *)(*p_Var7)(pvVar6,local_110,sVar134,sVar158);
            if (pbVar157 == (byte *)0x0) goto LAB_00f33695;
            sVar124 = (long)local_b0 - (long)local_f8;
            memmove(pbVar157 + (sVar158 - sVar124),pbVar157 + ((long)local_f8 - (long)local_110),
                    sVar124);
            puVar154 = (uint *)(pbVar157 + ((long)puVar154 - (long)local_110));
            local_b0 = (ulong *)(pbVar157 + sVar158);
            sVar134 = sVar158;
            local_f8 = (ulong *)(pbVar157 + (sVar158 - sVar124));
            local_110 = (uint *)pbVar157;
          }
          lVar137 = 0;
          if ((uVar132 & uVar118) == 0) {
            lVar137 = lVar149;
          }
          puVar154 = (uint *)((long)puVar154 + 6);
          while (bVar162 = lVar137 != 0, lVar137 = lVar137 + -1, bVar162) {
            ((ushort *)((long)puVar154 + -6))[0] = 0x2020;
            ((ushort *)((long)puVar154 + -6))[1] = 0x2020;
            puVar154 = (uint *)((long)puVar154 + lVar150);
          }
          puVar153 = (ushort *)((long)puVar154 + -6);
          puVar153[0] = 0x756e;
          puVar153[1] = 0x6c6c;
          puVar153[2] = 0xa2c;
          puVar153[3] = 0;
        }
        else {
          if (bVar155 != 3) goto LAB_00f336ed;
          uVar121 = 0x10;
          if ((uVar132 & uVar118) == 0) {
            uVar121 = uVar105;
          }
          if (local_f8 <= (ulong *)(uVar121 + (long)puVar154)) {
            uVar103 = sVar134 >> 1;
            if (sVar134 >> 1 <= uVar121) {
              uVar103 = uVar121;
            }
            sVar158 = (uVar103 + 0xf & 0xfffffffffffffff0) + sVar134;
            pbVar157 = (byte *)(*p_Var7)(pvVar6,local_110,sVar134,sVar158);
            if (pbVar157 == (byte *)0x0) goto LAB_00f33695;
            sVar124 = (long)local_b0 - (long)local_f8;
            memmove(pbVar157 + (sVar158 - sVar124),pbVar157 + ((long)local_f8 - (long)local_110),
                    sVar124);
            puVar154 = (uint *)(pbVar157 + ((long)puVar154 - (long)local_110));
            local_b0 = (ulong *)(pbVar157 + sVar158);
            sVar134 = sVar158;
            local_f8 = (ulong *)(pbVar157 + (sVar158 - sVar124));
            local_110 = (uint *)pbVar157;
          }
          lVar137 = 0;
          if ((uVar132 & uVar118) == 0) {
            lVar137 = lVar149;
          }
          pbVar157 = (byte *)((long)puVar154 + 7);
          while (bVar162 = lVar137 != 0, lVar137 = lVar137 + -1, bVar162) {
            pbVar157[-7] = 0x20;
            pbVar157[-6] = 0x20;
            pbVar157[-5] = 0x20;
            pbVar157[-4] = 0x20;
            pbVar157 = pbVar157 + lVar150;
          }
          bVar162 = (pyVar136->tag & 0x18) != 0;
          uVar113 = 0xa2c65736c6166;
          if (bVar162) {
            uVar113 = 0xa2c65757274;
          }
          *(undefined8 *)(pbVar157 + -7) = uVar113;
          puVar154 = (uint *)(pbVar157 + -(ulong)bVar162);
        }
        lVar152 = lVar152 + -1;
        sVar158 = sVar134;
        lVar137 = lVar149;
        if (lVar152 == 0) goto LAB_00f30b13;
        pyVar136 = pyVar136->next;
        goto LAB_00f2dc62;
      }
    }
    local_110 = (uint *)0x0;
LAB_00f33695:
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar116 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar116 = err;
    }
    pyVar117->code = 2;
    pyVar116->msg = "memory allocation failed";
    goto LAB_00f336d3;
  }
  if ((flg & 2) == 0) {
    puVar159 = enc_table_cpy_slash;
    if ((flg & 4) == 0) {
      puVar159 = enc_table_cpy;
    }
    switch(bVar155 & 7) {
    case 0:
      goto switchD_00f2db12_caseD_0;
    case 1:
switchD_00f2db12_caseD_1:
      uVar106 = uVar106 >> 8;
      pvVar8 = (val->uni).ptr;
      local_110 = (uint *)(*p_Var4)(pvVar6,uVar106 + 2);
      if (local_110 != (uint *)0x0) {
        switchD_00917c1c::default(local_110,pvVar8,uVar106);
        puVar154 = (uint *)((long)local_110 + uVar106);
        goto LAB_00f35188;
      }
      break;
    case 2:
switchD_00f2db12_caseD_2:
      puVar154 = (uint *)(*p_Var4)(pvVar6,8);
      if (puVar154 != (uint *)0x0) {
        puVar154[0] = 0x6c6c756e;
        puVar154[1] = 0xa2c;
        local_110 = puVar154;
LAB_00f338cb:
        puVar154 = puVar154 + 1;
        goto LAB_00f35188;
      }
      break;
    case 3:
switchD_00f2db12_caseD_3:
      local_110 = (uint *)(*p_Var4)(pvVar6,8);
      if (local_110 != (uint *)0x0) {
        bVar162 = (val->tag & 0x18) != 0;
        uVar113 = 0xa2c65736c6166;
        if (bVar162) {
          uVar113 = 0xa2c65757274;
        }
        *(undefined8 *)local_110 = uVar113;
        puVar154 = (uint *)((long)local_110 + (5 - (ulong)bVar162));
        goto LAB_00f35188;
      }
      break;
    case 4:
switchD_00f2db12_caseD_4:
      local_110 = (uint *)(*p_Var4)(pvVar6,0x22);
      if (local_110 != (uint *)0x0) {
        uVar106 = (val->uni).u64;
        uVar118 = (uint)(uVar106 >> 0x20);
        if ((val->tag & 0x10) == 0) {
          uVar118 = uVar118 >> 0x1f & (uint)(val->tag >> 3);
          uVar160 = -uVar106;
          if (uVar118 == 0) {
            uVar160 = uVar106;
          }
          *(byte *)local_110 = 0x2d;
          pbVar157 = (byte *)((long)local_110 + (ulong)uVar118);
          if (99999999 < uVar160) {
            auVar25._8_8_ = 0;
            auVar25._0_8_ = uVar160;
            lVar150 = SUB168(auVar25 / ZEXT816(100000000),0);
            uVar106 = lVar150 * 0xfa0a1f00 + uVar160;
            iVar140 = SUB164(auVar25 / ZEXT816(100000000),0);
            if (9999999999999999 < uVar160) {
              auVar26._8_8_ = 0;
              auVar26._0_8_ = uVar160;
              lVar150 = SUB168(auVar26 / ZEXT816(1000000000000),0);
              iVar138 = SUB164(auVar26 / ZEXT816(1000000000000),0);
              iVar140 = iVar140 + iVar138 * -10000;
              if (uVar160 < 1000000000000000000) {
                uVar105 = lVar150 * 0x68db9;
                iVar138 = (int)(uVar105 >> 0x20) * -10000 + iVar138;
                uVar118 = (uint)(iVar138 * 0x147b) >> 0x13;
                uVar160 = (ulong)(uVar160 < 100000000000000000);
                *(undefined2 *)pbVar157 =
                     *(undefined2 *)(digit_table + uVar160 + (uVar105 >> 0x20) * 2);
                *(undefined2 *)(pbVar157 + (2 - uVar160)) =
                     *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                *(undefined2 *)(pbVar157 + (4 - uVar160)) =
                     *(undefined2 *)(digit_table + (uVar118 * -100 + iVar138) * 2);
                lVar150 = 6 - uVar160;
              }
              else {
                uVar118 = (uint)((ulong)(lVar150 * 0x68db8bb) >> 0x20);
                uVar132 = uVar118 >> 8;
                iVar138 = uVar132 * -10000 + iVar138;
                uVar132 = uVar132 * 0x147b >> 0x13;
                uVar141 = (uint)(iVar138 * 0x147b) >> 0x13;
                uVar160 = (ulong)(uVar160 < 10000000000000000000);
                *(undefined2 *)pbVar157 =
                     *(undefined2 *)(digit_table + uVar160 + (ulong)uVar132 * 2);
                *(undefined2 *)(pbVar157 + (2 - uVar160)) =
                     *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                *(undefined2 *)(pbVar157 + (4 - uVar160)) =
                     *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                *(undefined2 *)(pbVar157 + (6 - uVar160)) =
                     *(undefined2 *)(digit_table + (uVar141 * -100 + iVar138) * 2);
                lVar150 = 8 - uVar160;
              }
              pbVar157 = pbVar157 + lVar150;
              uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
              *(undefined2 *)pbVar157 = *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
              *(undefined2 *)(pbVar157 + 2) =
                   *(undefined2 *)(digit_table + (uVar118 * 0x7fffff9c + iVar140) * 2);
              uVar118 = (uint)((uVar106 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar132 = uVar118 >> 8;
              iVar140 = uVar132 * -10000 + (int)uVar106;
              uVar132 = uVar132 * 0x147b >> 0x13;
              uVar141 = (uint)(iVar140 * 0x147b) >> 0x13;
              *(undefined2 *)(pbVar157 + 4) = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
              *(undefined2 *)(pbVar157 + 6) =
                   *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
              *(undefined2 *)(pbVar157 + 8) = *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
              *(undefined2 *)(pbVar157 + 10) =
                   *(undefined2 *)(digit_table + (uVar141 * 0x7fffff9c + iVar140) * 2);
              puVar154 = (uint *)(pbVar157 + 0xc);
              goto LAB_00f35188;
            }
            if (uVar160 >> 10 < 0x9502f9) {
              *(undefined2 *)pbVar157 =
                   *(undefined2 *)(digit_table + (ulong)(uVar160 < 1000000000) + lVar150 * 2);
              pbVar157 = pbVar157 + (2 - (ulong)(uVar160 < 1000000000));
            }
            else if (uVar160 >> 0xc < 0xe8d4a51) {
              uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
              uVar160 = (ulong)(uVar160 >> 0xb < 0x2e90edd);
              *(undefined2 *)pbVar157 = *(undefined2 *)(digit_table + uVar160 + (ulong)uVar118 * 2);
              *(undefined2 *)(pbVar157 + (2 - uVar160)) =
                   *(undefined2 *)(digit_table + (uVar118 * -100 + iVar140) * 2);
              pbVar157 = pbVar157 + (4 - uVar160);
            }
            else if (uVar160 < 100000000000000) {
              iVar140 = (int)((ulong)(lVar150 * 0x68db9) >> 0x20) * -10000 + iVar140;
              uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
              uVar160 = (ulong)(uVar160 >> 0xd < 0x48c27395);
              *(undefined2 *)pbVar157 =
                   *(undefined2 *)(digit_table + uVar160 + ((ulong)(lVar150 * 0x68db9) >> 0x20) * 2)
              ;
              *(undefined2 *)(pbVar157 + (2 - uVar160)) =
                   *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
              *(undefined2 *)(pbVar157 + (4 - uVar160)) =
                   *(undefined2 *)(digit_table + (uVar118 * -100 + iVar140) * 2);
              pbVar157 = pbVar157 + (6 - uVar160);
            }
            else {
              uVar118 = (uint)((ulong)(lVar150 * 0x68db8bb) >> 0x20);
              uVar132 = uVar118 >> 8;
              iVar140 = uVar132 * -10000 + iVar140;
              uVar132 = uVar132 * 0x147b >> 0x13;
              uVar141 = (uint)(iVar140 * 0x147b) >> 0x13;
              uVar160 = (ulong)(uVar160 < 1000000000000000);
              *(undefined2 *)pbVar157 = *(undefined2 *)(digit_table + uVar160 + (ulong)uVar132 * 2);
              *(undefined2 *)(pbVar157 + (2 - uVar160)) =
                   *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
              *(undefined2 *)(pbVar157 + (4 - uVar160)) =
                   *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
              *(undefined2 *)(pbVar157 + (6 - uVar160)) =
                   *(undefined2 *)(digit_table + (uVar141 * -100 + iVar140) * 2);
              pbVar157 = pbVar157 + (8 - uVar160);
            }
            uVar118 = (uint)((uVar106 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar132 = uVar118 >> 8;
            iVar140 = uVar132 * -10000 + (int)uVar106;
            uVar132 = uVar132 * 0x147b >> 0x13;
            uVar141 = (uint)(iVar140 * 0x147b) >> 0x13;
            iVar140 = uVar141 * 0x7fffff9c + iVar140;
            *(undefined2 *)pbVar157 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
            *(undefined2 *)(pbVar157 + 2) =
                 *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
            uVar110 = *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
LAB_00f350da:
            *(undefined2 *)(pbVar157 + 4) = uVar110;
            *(undefined2 *)(pbVar157 + 6) = *(undefined2 *)(digit_table + (uint)(iVar140 * 2));
            puVar154 = (uint *)(pbVar157 + 8);
            goto LAB_00f35188;
          }
          if (uVar160 < 100) {
            *(undefined2 *)pbVar157 =
                 *(undefined2 *)(digit_table + (ulong)(uVar160 < 10) + uVar160 * 2);
            puVar154 = (uint *)(pbVar157 + -(ulong)(uVar160 < 10));
            goto LAB_00f339da;
          }
          iVar140 = (int)uVar160;
          if (9999 < uVar160) {
            if (uVar160 < 1000000) {
              iVar140 = (int)(uVar160 * 0x68db9 >> 0x20) * -10000 + iVar140;
              uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
              uVar106 = (ulong)(uVar160 < 100000);
              *(undefined2 *)pbVar157 =
                   *(undefined2 *)(digit_table + uVar106 + (uVar160 * 0x68db9 >> 0x20) * 2);
              *(undefined2 *)(pbVar157 + (2 - uVar106)) =
                   *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
              *(undefined2 *)(pbVar157 + (4 - uVar106)) =
                   *(undefined2 *)(digit_table + (uVar118 * -100 + iVar140) * 2);
              puVar154 = (uint *)(pbVar157 + (6 - uVar106));
              goto LAB_00f35188;
            }
            uVar118 = (uint)(uVar160 * 0x68db8bb >> 0x20);
            uVar132 = uVar118 >> 8;
            iVar140 = uVar132 * -10000 + iVar140;
            uVar132 = uVar132 * 0x147b >> 0x13;
            uVar141 = (uint)(iVar140 * 0x147b) >> 0x13;
            iVar140 = uVar141 * -100 + iVar140;
            *(undefined2 *)pbVar157 =
                 *(undefined2 *)(digit_table + (ulong)(uVar160 < 10000000) + (ulong)uVar132 * 2);
            pbVar157 = pbVar157 + -(ulong)(uVar160 < 10000000);
            *(undefined2 *)(pbVar157 + 2) =
                 *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
            uVar110 = *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
            goto LAB_00f350da;
          }
          uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
          *(undefined2 *)pbVar157 =
               *(undefined2 *)(digit_table + (ulong)(uVar160 < 1000) + (ulong)uVar118 * 2);
          puVar154 = (uint *)(pbVar157 + -(ulong)(uVar160 < 1000));
          *(ushort *)((long)puVar154 + 2) =
               *(ushort *)(digit_table + (uVar118 * -100 + iVar140) * 2);
          goto LAB_00f338cb;
        }
        uVar160 = uVar106 & 0xfffffffffffff;
        uVar118 = uVar118 >> 0x14 & 0x7ff;
        if (uVar118 == 0x7ff) {
          if ((flg & 0x10) != 0) {
            *local_110 = 0x6c6c756e;
            puVar154 = local_110 + 1;
            goto LAB_00f35188;
          }
          if ((flg & 8) != 0) {
            if (uVar160 == 0) {
              *(byte *)local_110 = 0x2d;
              lVar150 = -((long)uVar106 >> 0x3f);
              *(undefined8 *)((long)local_110 + lVar150) = 0x7974696e69666e49;
              puVar154 = (uint *)((long)local_110 + lVar150 + 8);
            }
            else {
              *local_110 = 0x4e614e;
              puVar154 = (uint *)((long)local_110 + 3);
            }
            goto LAB_00f35188;
          }
          (*p_Var5)(pvVar6,local_110);
          if (dat_len != (usize *)0x0) {
            *dat_len = 0;
          }
          pyVar116 = &dummy_err;
          if (err != (yyjson_write_err *)0x0) {
            pyVar116 = err;
          }
          pyVar117->code = 4;
          pcVar108 = "nan or inf number is not allowed";
          goto LAB_00f33a1d;
        }
        *(byte *)local_110 = 0x2d;
        lVar150 = -((long)uVar106 >> 0x3f);
        puVar129 = (undefined8 *)((long)local_110 + lVar150);
        if ((uVar106 & 0x7fffffffffffffff) == 0) {
          *(undefined4 *)puVar129 = 0x302e30;
          puVar154 = (uint *)((long)puVar129 + 3);
          goto LAB_00f35188;
        }
        if (uVar118 == 0) {
          uVar106 = (ulong)((uint)uVar106 & 1);
          uVar160 = uVar160 * 0x20;
          auVar61._8_8_ = 0;
          auVar61._0_8_ = uVar160 - 0x10;
          auVar100._8_8_ = 0;
          auVar100._0_8_ = SUB168(auVar61 * ZEXT816(0x6c07a2c26a8346d2),8);
          auVar62._8_8_ = 0;
          auVar62._0_8_ = uVar160 - 0x10;
          auVar100 = auVar62 * ZEXT816(0x9e19db92b4e31ba9) + auVar100;
          auVar63._8_8_ = 0;
          auVar63._0_8_ = uVar160;
          auVar101._8_8_ = 0;
          auVar101._0_8_ = SUB168(auVar63 * ZEXT816(0x6c07a2c26a8346d2),8);
          auVar64._8_8_ = 0;
          auVar64._0_8_ = uVar160;
          auVar101 = auVar64 * ZEXT816(0x9e19db92b4e31ba9) + auVar101;
          uVar105 = auVar101._8_8_;
          auVar65._8_8_ = 0;
          auVar65._0_8_ = uVar160 + 0x10;
          auVar102._8_8_ = 0;
          auVar102._0_8_ = SUB168(auVar65 * ZEXT816(0x6c07a2c26a8346d2),8);
          auVar66._8_8_ = 0;
          auVar66._0_8_ = uVar160 + 0x10;
          auVar102 = auVar66 * ZEXT816(0x9e19db92b4e31ba9) + auVar102;
          uVar160 = ((ulong)((auVar100 & (undefined1  [16])0xfffffffffffffffe) !=
                            (undefined1  [16])0x0) | auVar100._8_8_) + uVar106;
          uVar106 = ((ulong)((auVar102 & (undefined1  [16])0xfffffffffffffffe) !=
                            (undefined1  [16])0x0) | auVar102._8_8_) - uVar106;
          if (uVar105 < 0x28) {
LAB_00f355c9:
            uVar107 = (auVar101 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0 |
                      uVar105;
            uVar121 = uVar105 & 0x7ffffffffffffffc;
            bVar162 = true;
            if (uVar107 <= (uVar121 | 2)) {
              bVar162 = (bool)((byte)((uVar105 & 0xffffffff) >> 2) & 0x3f & uVar107 == (uVar121 | 2)
                              );
            }
            uVar107 = uVar105 >> 2;
            bVar161 = uVar121 + 4 <= uVar106;
            if (uVar121 < uVar160 == bVar161) {
              bVar162 = bVar161;
            }
            iVar140 = -0x144;
          }
          else {
            uVar107 = uVar105 / 0x28;
            bVar162 = uVar107 * 0x28 + 0x28 <= uVar106;
            if (uVar107 * 0x28 < uVar160 != bVar162) goto LAB_00f355c9;
            iVar140 = -0x143;
          }
          uVar107 = bVar162 + uVar107;
          pcVar108 = (char *)((long)puVar129 + 1);
          if (uVar107 < 1000000000000000) {
            if (uVar107 < 100000000) {
              if (uVar107 < 100) {
                *(undefined2 *)pcVar108 =
                     *(undefined2 *)(digit_table + (ulong)(uVar107 < 10) + uVar107 * 2);
                pcVar108 = pcVar108 + (2 - (ulong)(uVar107 < 10));
              }
              else {
                iVar138 = (int)uVar107;
                if (uVar107 < 10000) {
                  uVar118 = (uint)(iVar138 * 0x147b) >> 0x13;
                  uVar106 = (ulong)(uVar107 < 1000);
                  *(undefined2 *)pcVar108 =
                       *(undefined2 *)(digit_table + uVar106 + (ulong)uVar118 * 2);
                  *(undefined2 *)(pcVar108 + (2 - uVar106)) =
                       *(undefined2 *)(digit_table + (uVar118 * -100 + iVar138) * 2);
                  pcVar108 = pcVar108 + (4 - uVar106);
                }
                else {
                  if (999999 < uVar107) {
                    uVar118 = (uint)(uVar107 * 0x68db8bb >> 0x20);
                    uVar132 = uVar118 >> 8;
                    iVar138 = uVar132 * -10000 + iVar138;
                    uVar132 = uVar132 * 0x147b >> 0x13;
                    uVar141 = (uint)(iVar138 * 0x147b) >> 0x13;
                    iVar138 = uVar141 * -100 + iVar138;
                    *(undefined2 *)pcVar108 =
                         *(undefined2 *)
                          (digit_table + (ulong)(uVar107 < 10000000) + (ulong)uVar132 * 2);
                    pcVar108 = pcVar108 + -(ulong)(uVar107 < 10000000);
                    *(undefined2 *)(pcVar108 + 2) =
                         *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                    uVar110 = *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                    goto LAB_00f35b0d;
                  }
                  iVar138 = (int)(uVar107 * 0x68db9 >> 0x20) * -10000 + iVar138;
                  uVar118 = (uint)(iVar138 * 0x147b) >> 0x13;
                  uVar106 = (ulong)(uVar107 < 100000);
                  *(undefined2 *)pcVar108 =
                       *(undefined2 *)(digit_table + uVar106 + (uVar107 * 0x68db9 >> 0x20) * 2);
                  *(undefined2 *)(pcVar108 + (2 - uVar106)) =
                       *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                  *(undefined2 *)(pcVar108 + (4 - uVar106)) =
                       *(undefined2 *)(digit_table + (uVar118 * -100 + iVar138) * 2);
                  pcVar108 = pcVar108 + (6 - uVar106);
                }
              }
            }
            else {
              auVar30._8_8_ = 0;
              auVar30._0_8_ = uVar107;
              lVar150 = SUB168(auVar30 / ZEXT816(100000000),0);
              uVar106 = lVar150 * 0xfa0a1f00 + uVar107;
              if (uVar107 >> 10 < 0x9502f9) {
                *(undefined2 *)pcVar108 =
                     *(undefined2 *)(digit_table + (ulong)(uVar107 < 1000000000) + lVar150 * 2);
                pcVar108 = pcVar108 + (2 - (ulong)(uVar107 < 1000000000));
              }
              else {
                iVar138 = SUB164(auVar30 / ZEXT816(100000000),0);
                if (uVar107 >> 0xc < 0xe8d4a51) {
                  uVar118 = (uint)(iVar138 * 0x147b) >> 0x13;
                  uVar160 = (ulong)(uVar107 >> 0xb < 0x2e90edd);
                  *(undefined2 *)pcVar108 =
                       *(undefined2 *)(digit_table + uVar160 + (ulong)uVar118 * 2);
                  *(undefined2 *)(pcVar108 + (2 - uVar160)) =
                       *(undefined2 *)(digit_table + (uVar118 * -100 + iVar138) * 2);
                  pcVar108 = pcVar108 + (4 - uVar160);
                }
                else if (uVar107 < 100000000000000) {
                  iVar138 = (int)((ulong)(lVar150 * 0x68db9) >> 0x20) * -10000 + iVar138;
                  uVar118 = (uint)(iVar138 * 0x147b) >> 0x13;
                  uVar160 = (ulong)(uVar107 >> 0xd < 0x48c27395);
                  *(undefined2 *)pcVar108 =
                       *(undefined2 *)
                        (digit_table + uVar160 + ((ulong)(lVar150 * 0x68db9) >> 0x20) * 2);
                  *(undefined2 *)(pcVar108 + (2 - uVar160)) =
                       *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                  *(undefined2 *)(pcVar108 + (4 - uVar160)) =
                       *(undefined2 *)(digit_table + (uVar118 * -100 + iVar138) * 2);
                  pcVar108 = pcVar108 + (6 - uVar160);
                }
                else {
                  uVar118 = (uint)((ulong)(lVar150 * 0x68db8bb) >> 0x20);
                  uVar132 = uVar118 >> 8;
                  iVar138 = uVar132 * -10000 + iVar138;
                  uVar132 = uVar132 * 0x147b >> 0x13;
                  uVar141 = (uint)(iVar138 * 0x147b) >> 0x13;
                  *(undefined2 *)((long)puVar129 + 1) =
                       *(undefined2 *)(digit_table + (ulong)uVar132 * 2 + 1);
                  *(undefined2 *)((long)puVar129 + 2) =
                       *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                  *(undefined2 *)((long)puVar129 + 4) =
                       *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                  *(undefined2 *)((long)puVar129 + 6) =
                       *(undefined2 *)(digit_table + (uVar141 * -100 + iVar138) * 2);
                  pcVar108 = (char *)(puVar129 + 1);
                }
              }
              uVar118 = (uint)((uVar106 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar132 = uVar118 >> 8;
              iVar138 = uVar132 * -10000 + (int)uVar106;
              uVar132 = uVar132 * 0x147b >> 0x13;
              uVar141 = (uint)(iVar138 * 0x147b) >> 0x13;
              iVar138 = uVar141 * 0x7fffff9c + iVar138;
              *(undefined2 *)pcVar108 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
              *(undefined2 *)(pcVar108 + 2) =
                   *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
              uVar110 = *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
LAB_00f35b0d:
              *(undefined2 *)(pcVar108 + 4) = uVar110;
              *(undefined2 *)(pcVar108 + 6) = *(undefined2 *)(digit_table + (uint)(iVar138 * 2));
              pcVar108 = pcVar108 + 8;
            }
          }
          else {
            uVar106 = (uVar107 / 100000000) * 0xfa0a1f00 + uVar107;
            auVar29._8_8_ = 0;
            auVar29._0_8_ = uVar107;
            uVar160 = SUB168(auVar29 / ZEXT816(10000000000000000),0) * 0xfa0a1f00 +
                      uVar107 / 100000000;
            *pcVar108 = SUB161(auVar29 / ZEXT816(10000000000000000),0) + '0';
            pcVar108 = pcVar108 + (9999999999999999 < uVar107);
            uVar118 = (uint)((uVar160 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar132 = uVar118 >> 8;
            iVar138 = uVar132 * -10000 + (int)uVar160;
            uVar132 = uVar132 * 0x147b >> 0x13;
            uVar141 = (uint)(iVar138 * 0x147b) >> 0x13;
            *(undefined2 *)pcVar108 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
            *(undefined2 *)(pcVar108 + 2) =
                 *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
            *(undefined2 *)(pcVar108 + 4) = *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
            *(undefined2 *)(pcVar108 + 6) =
                 *(undefined2 *)(digit_table + (uVar141 * 0x7fffff9c + iVar138) * 2);
            uVar118 = (uint)((uVar106 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar132 = uVar118 >> 8;
            iVar138 = uVar132 * -10000 + (int)uVar106;
            uVar132 = uVar132 * 0x147b >> 0x13;
            uVar141 = (uint)(iVar138 * 0x147b) >> 0x13;
            *(undefined2 *)(pcVar108 + 8) = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
            *(undefined2 *)(pcVar108 + 10) =
                 *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
            *(undefined2 *)(pcVar108 + 0xc) = *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
            *(undefined2 *)(pcVar108 + 0xe) =
                 *(undefined2 *)(digit_table + (uVar141 * 0x7fffff9c + iVar138) * 2);
            pcVar108 = pcVar108 + 0x10;
          }
          *(undefined1 *)puVar129 = *(undefined1 *)((long)puVar129 + 1);
          *(undefined1 *)((long)puVar129 + 1) = 0x2e;
          lVar150 = 0;
          do {
            lVar152 = lVar150 + -1;
            lVar150 = lVar150 + -1;
          } while (pcVar108[lVar152] == '0');
          iVar140 = ((int)pcVar108 - (int)puVar129) + iVar140 + -2;
          pcVar108 = pcVar108 + lVar150 + (ulong)(pcVar108[lVar152] != '.');
          puVar154 = (uint *)(pcVar108 + 5);
          pcVar108[0] = 'e';
          pcVar108[1] = '-';
          uVar118 = iVar140 * -0x290;
          pcVar108[2] = (char)(uVar118 >> 0x10) + '0';
          *(undefined2 *)(pcVar108 + 3) =
               *(undefined2 *)(digit_table + ((uVar118 >> 0x10) * 0x7fffff9c - iVar140) * 2);
          goto LAB_00f35188;
        }
        uVar105 = uVar160 + 0x10000000000000;
        if (uVar118 - 0x3ff < 0x35) {
          lVar152 = 0;
          if (uVar105 != 0) {
            for (; (uVar105 >> lVar152 & 1) == 0; lVar152 = lVar152 + 1) {
            }
          }
          if (0x433 - uVar118 <= (uint)lVar152) {
            uVar105 = uVar105 >> ((byte)(0x433 - uVar118) & 0x3f);
            if (uVar105 < 100000000) {
              if (uVar105 < 100) {
                *(undefined2 *)puVar129 =
                     *(undefined2 *)(digit_table + (ulong)(uVar105 < 10) + uVar105 * 2);
                puVar154 = (uint *)((long)puVar129 + (2 - (ulong)(uVar105 < 10)));
              }
              else {
                iVar140 = (int)uVar105;
                if (uVar105 < 10000) {
                  uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
                  uVar106 = (ulong)(uVar105 < 1000);
                  *(undefined2 *)puVar129 =
                       *(undefined2 *)(digit_table + uVar106 + (ulong)uVar118 * 2);
                  *(undefined2 *)((long)puVar129 + (2 - uVar106)) =
                       *(undefined2 *)(digit_table + (uVar118 * -100 + iVar140) * 2);
                  puVar154 = (uint *)((long)puVar129 + (4 - uVar106));
                }
                else if (uVar105 < 1000000) {
                  iVar140 = (int)(uVar105 * 0x68db9 >> 0x20) * -10000 + iVar140;
                  uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
                  uVar106 = (ulong)(uVar105 < 100000);
                  *(undefined2 *)puVar129 =
                       *(undefined2 *)(digit_table + uVar106 + (uVar105 * 0x68db9 >> 0x20) * 2);
                  *(undefined2 *)((long)puVar129 + (2 - uVar106)) =
                       *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                  *(undefined2 *)((long)puVar129 + (4 - uVar106)) =
                       *(undefined2 *)(digit_table + (uVar118 * -100 + iVar140) * 2);
                  puVar154 = (uint *)((long)puVar129 + (6 - uVar106));
                }
                else {
                  uVar118 = (uint)(uVar105 * 0x68db8bb >> 0x20);
                  uVar132 = uVar118 >> 8;
                  iVar140 = uVar132 * -10000 + iVar140;
                  uVar132 = uVar132 * 0x147b >> 0x13;
                  uVar141 = (uint)(iVar140 * 0x147b) >> 0x13;
                  uVar106 = (ulong)(uVar105 < 10000000);
                  *(undefined2 *)puVar129 =
                       *(undefined2 *)(digit_table + uVar106 + (ulong)uVar132 * 2);
                  *(undefined2 *)((long)puVar129 + (2 - uVar106)) =
                       *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                  *(undefined2 *)((long)puVar129 + (4 - uVar106)) =
                       *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                  *(undefined2 *)((long)puVar129 + (6 - uVar106)) =
                       *(undefined2 *)(digit_table + (uVar141 * -100 + iVar140) * 2);
                  puVar154 = (uint *)((long)puVar129 + (8 - uVar106));
                }
              }
            }
            else {
              auVar28._8_8_ = 0;
              auVar28._0_8_ = uVar105;
              lVar150 = SUB168(auVar28 / ZEXT816(100000000),0);
              uVar106 = lVar150 * 0xfa0a1f00 + uVar105;
              if (uVar105 >> 10 < 0x9502f9) {
                *(undefined2 *)puVar129 =
                     *(undefined2 *)(digit_table + (ulong)(uVar105 < 1000000000) + lVar150 * 2);
                puVar142 = (undefined2 *)((long)puVar129 + (2 - (ulong)(uVar105 < 1000000000)));
              }
              else {
                iVar140 = SUB164(auVar28 / ZEXT816(100000000),0);
                if (uVar105 >> 0xc < 0xe8d4a51) {
                  uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
                  uVar160 = (ulong)(uVar105 >> 0xb < 0x2e90edd);
                  *(undefined2 *)puVar129 =
                       *(undefined2 *)(digit_table + uVar160 + (ulong)uVar118 * 2);
                  *(undefined2 *)((long)puVar129 + (2 - uVar160)) =
                       *(undefined2 *)(digit_table + (uVar118 * -100 + iVar140) * 2);
                  puVar142 = (undefined2 *)((long)puVar129 + (4 - uVar160));
                }
                else if (uVar105 < 100000000000000) {
                  iVar140 = (int)((ulong)(lVar150 * 0x68db9) >> 0x20) * -10000 + iVar140;
                  uVar118 = (uint)(iVar140 * 0x147b) >> 0x13;
                  uVar160 = (ulong)(uVar105 >> 0xd < 0x48c27395);
                  *(undefined2 *)puVar129 =
                       *(undefined2 *)
                        (digit_table + uVar160 + ((ulong)(lVar150 * 0x68db9) >> 0x20) * 2);
                  *(undefined2 *)((long)puVar129 + (2 - uVar160)) =
                       *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                  *(undefined2 *)((long)puVar129 + (4 - uVar160)) =
                       *(undefined2 *)(digit_table + (uVar118 * -100 + iVar140) * 2);
                  puVar142 = (undefined2 *)((long)puVar129 + (6 - uVar160));
                }
                else {
                  uVar118 = (uint)((ulong)(lVar150 * 0x68db8bb) >> 0x20);
                  uVar132 = uVar118 >> 8;
                  iVar140 = uVar132 * -10000 + iVar140;
                  uVar132 = uVar132 * 0x147b >> 0x13;
                  uVar141 = (uint)(iVar140 * 0x147b) >> 0x13;
                  uVar160 = (ulong)(uVar105 < 1000000000000000);
                  *(undefined2 *)puVar129 =
                       *(undefined2 *)(digit_table + uVar160 + (ulong)uVar132 * 2);
                  *(undefined2 *)((long)puVar129 + (2 - uVar160)) =
                       *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
                  *(undefined2 *)((long)puVar129 + (4 - uVar160)) =
                       *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
                  *(undefined2 *)((long)puVar129 + (6 - uVar160)) =
                       *(undefined2 *)(digit_table + (uVar141 * -100 + iVar140) * 2);
                  puVar142 = (undefined2 *)((long)puVar129 + (8 - uVar160));
                }
              }
              uVar118 = (uint)((uVar106 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar132 = uVar118 >> 8;
              iVar140 = uVar132 * -10000 + (int)uVar106;
              uVar132 = uVar132 * 0x147b >> 0x13;
              uVar141 = (uint)(iVar140 * 0x147b) >> 0x13;
              *puVar142 = *(undefined2 *)(digit_table + (ulong)uVar132 * 2);
              puVar142[1] = *(undefined2 *)(digit_table + (uVar132 * -100 + (uVar118 >> 8)) * 2);
              puVar142[2] = *(undefined2 *)(digit_table + (ulong)uVar141 * 2);
              puVar142[3] = *(undefined2 *)(digit_table + (uVar141 * 0x7fffff9c + iVar140) * 2);
              puVar154 = (uint *)(puVar142 + 4);
            }
            *(ushort *)puVar154 = 0x302e;
            goto LAB_00f339da;
          }
        }
        uVar106 = (ulong)((uint)uVar106 & 1);
        iVar140 = uVar118 * 0x4d105 + -0x200a5;
        if (uVar118 == 1 || uVar160 != 0) {
          iVar140 = uVar118 * 0x4d105;
        }
        iVar140 = iVar140 + -0x1439b7ff >> 0x14;
        uVar107 = *(ulong *)(pow10_sig_table + (ulong)(iVar140 * -2 + 0x2ae) * 8);
        uVar121 = *(long *)(pow10_sig_table + (ulong)(iVar140 * -2 + 0x2af) * 8) +
                  (ulong)(iVar140 - 1U < 0xffffffc8);
        bVar155 = ((char)((uint)(iVar140 * -0x3526b) >> 0x10) + (char)uVar118) - 0x32;
        uVar160 = (ulong)(uVar118 != 1 && uVar160 == 0) + uVar105 * 4 + -2 << (bVar155 & 0x3f);
        auVar55._8_8_ = 0;
        auVar55._0_8_ = uVar121;
        auVar79._8_8_ = 0;
        auVar79._0_8_ = uVar160;
        auVar97._8_8_ = 0;
        auVar97._0_8_ = SUB168(auVar55 * auVar79,8);
        auVar56._8_8_ = 0;
        auVar56._0_8_ = uVar107;
        auVar80._8_8_ = 0;
        auVar80._0_8_ = uVar160;
        auVar97 = auVar56 * auVar80 + auVar97;
        uVar160 = uVar105 * 4 << (bVar155 & 0x3f);
        auVar57._8_8_ = 0;
        auVar57._0_8_ = uVar121;
        auVar81._8_8_ = 0;
        auVar81._0_8_ = uVar160;
        auVar98._8_8_ = 0;
        auVar98._0_8_ = SUB168(auVar57 * auVar81,8);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = uVar107;
        auVar82._8_8_ = 0;
        auVar82._0_8_ = uVar160;
        auVar98 = auVar58 * auVar82 + auVar98;
        uVar160 = auVar98._8_8_;
        uVar105 = uVar105 * 4 + 2 << (bVar155 & 0x3f);
        auVar59._8_8_ = 0;
        auVar59._0_8_ = uVar121;
        auVar83._8_8_ = 0;
        auVar83._0_8_ = uVar105;
        auVar99._8_8_ = 0;
        auVar99._0_8_ = SUB168(auVar59 * auVar83,8);
        auVar60._8_8_ = 0;
        auVar60._0_8_ = uVar107;
        auVar84._8_8_ = 0;
        auVar84._0_8_ = uVar105;
        auVar99 = auVar60 * auVar84 + auVar99;
        uVar105 = ((ulong)((auVar97 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0
                          ) | auVar97._8_8_) + uVar106;
        uVar106 = ((ulong)((auVar99 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0
                          ) | auVar99._8_8_) - uVar106;
        if (uVar160 < 0x28) {
LAB_00f33c29:
          uVar121 = (auVar98 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0 |
                    uVar160;
          uVar107 = uVar160 & 0xfffffffffffffffc;
          bVar162 = true;
          if (uVar121 <= uVar107 + 2) {
            bVar162 = (bool)((byte)(uVar160 >> 2) & 0x3f & uVar121 == uVar107 + 2);
          }
          bVar161 = uVar107 + 4 <= uVar106;
          if (uVar107 < uVar105 == bVar161) {
            bVar162 = bVar161;
          }
          uVar106 = (uVar160 >> 2) + (ulong)bVar162;
        }
        else {
          uVar121 = (uVar160 / 0x28) * 0x28;
          uVar107 = uVar121 + 0x28;
          if (uVar121 < uVar105 != uVar107 <= uVar106) goto LAB_00f33c29;
          uVar106 = (uVar160 / 0x28 + 1) - (ulong)(uVar106 < uVar107);
          iVar140 = iVar140 + 1;
        }
        iVar148 = (0x11 - (uint)(uVar106 < 10000000000000000)) - (uint)(uVar106 < 1000000000000000);
        uVar141 = iVar148 + iVar140;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = uVar106;
        uVar160 = SUB168(auVar27 / ZEXT816(100000000),0);
        uVar106 = uVar160 * 0xfa0a1f00 + uVar106;
        uVar160 = (uVar160 & 0xffffffff) / 10000;
        iVar138 = (int)uVar160;
        uVar132 = SUB164(auVar27 / ZEXT816(100000000),0);
        iVar119 = iVar138 * -10000 + uVar132;
        iVar146 = (int)(uVar160 * 0x28f5d >> 0x18);
        uVar118 = (uint)(iVar146 * 0x29) >> 0xc;
        uVar151 = uVar118 * -100 + iVar146;
        uVar147 = iVar146 * -100 + iVar138;
        cVar130 = (char)uVar118 + '0';
        iVar138 = (int)uVar106;
        if (iVar148 + iVar140 + 5U < 0x1b) {
          if ((int)uVar141 < 1) {
            puVar142 = (undefined2 *)
                       ((long)puVar129 + (((ulong)(2 - uVar141) + 1) - (ulong)(uVar132 < 100000000))
                       );
            *(char *)((long)puVar129 + (ulong)(2 - uVar141)) = cVar130;
            uVar160 = (ulong)(uVar151 < 10 && uVar132 < 100000000);
            *puVar142 = *(undefined2 *)(digit_table + uVar160 + uVar151 * 2);
            *(undefined2 *)((long)puVar142 + (2 - uVar160)) =
                 *(undefined2 *)(digit_table + uVar147 * 2);
            if (iVar138 == 0) {
              if (iVar119 == 0) {
                uVar106 = 0;
                if (uVar147 == 0) {
                  uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar151];
                }
                uVar106 = 4 - (uVar106 + (byte)dec_trailing_zero_table[uVar147]);
              }
              else {
                uVar118 = (uint)(iVar119 * 0x147b) >> 0x13;
                uVar132 = uVar118 * -100 + iVar119;
                *(undefined2 *)((long)puVar142 + (4 - uVar160)) =
                     *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                *(undefined2 *)((long)puVar142 + (6 - uVar160)) =
                     *(undefined2 *)(digit_table + uVar132 * 2);
                uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar118] + 2;
                if (uVar132 != 0) {
                  uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar132];
                }
                uVar106 = 8 - uVar106;
              }
            }
            else {
              uVar147 = (uint)(iVar119 * 0x147b) >> 0x13;
              uVar118 = (uint)((uVar106 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar151 = uVar118 >> 8;
              uVar132 = uVar151 * 0x147b >> 0x13;
              uVar106 = (ulong)uVar132;
              uVar118 = uVar132 * -100 + (uVar118 >> 8);
              *(undefined2 *)((long)puVar142 + (4 - uVar160)) =
                   *(undefined2 *)(digit_table + (ulong)uVar147 * 2);
              *(undefined2 *)((long)puVar142 + (6 - uVar160)) =
                   *(undefined2 *)(digit_table + (uVar147 * 0x7fffff9c + iVar119) * 2);
              *(undefined2 *)((long)puVar142 + (8 - uVar160)) =
                   *(undefined2 *)(digit_table + uVar106 * 2);
              *(undefined2 *)((long)puVar142 + (10 - uVar160)) =
                   *(undefined2 *)(digit_table + uVar118 * 2);
              iVar138 = uVar151 * -10000 + iVar138;
              if (iVar138 == 0) {
                lStack_120 = 0xc;
              }
              else {
                uVar118 = (uint)(iVar138 * 0x147b) >> 0x13;
                uVar106 = (ulong)uVar118;
                uVar118 = uVar118 * -100 + iVar138;
                *(undefined2 *)((long)puVar142 + (0xc - uVar160)) =
                     *(undefined2 *)(digit_table + uVar106 * 2);
                *(undefined2 *)((long)puVar142 + (0xe - uVar160)) =
                     *(undefined2 *)(digit_table + uVar118 * 2);
                lStack_120 = 0x10;
              }
              uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar106] + 2;
              if (uVar118 != 0) {
                uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar118];
              }
              uVar106 = lStack_120 - uVar106;
            }
            puVar154 = (uint *)((long)puVar142 + ((uVar106 & 0xffffffff) - uVar160));
            *(undefined2 *)puVar129 = 0x2e30;
            for (uVar106 = 0; -uVar141 != uVar106; uVar106 = uVar106 + 1) {
              *(undefined1 *)((long)puVar129 + uVar106 + 2) = 0x30;
            }
          }
          else {
            puVar142 = (undefined2 *)((long)puVar129 + (2 - (ulong)(uVar132 < 100000000)));
            *puVar129 = 0x3030303030303030;
            puVar129[1] = 0x3030303030303030;
            puVar129[2] = 0x3030303030303030;
            *(char *)((long)puVar129 + 1) = cVar130;
            uVar160 = (ulong)(uVar151 < 10 && uVar132 < 100000000);
            *puVar142 = *(undefined2 *)(digit_table + uVar160 + uVar151 * 2);
            *(undefined2 *)((long)puVar142 + (2 - uVar160)) =
                 *(undefined2 *)(digit_table + uVar147 * 2);
            if (iVar138 == 0) {
              if (iVar119 == 0) {
                uVar106 = 0;
                if (uVar147 == 0) {
                  uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar151];
                }
                uVar106 = 4 - (uVar106 + (byte)dec_trailing_zero_table[uVar147]);
              }
              else {
                uVar118 = (uint)(iVar119 * 0x147b) >> 0x13;
                uVar132 = uVar118 * -100 + iVar119;
                *(undefined2 *)((long)puVar142 + (4 - uVar160)) =
                     *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
                *(undefined2 *)((long)puVar142 + (6 - uVar160)) =
                     *(undefined2 *)(digit_table + uVar132 * 2);
                uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar118] + 2;
                if (uVar132 != 0) {
                  uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar132];
                }
                uVar106 = 8 - uVar106;
              }
            }
            else {
              uVar147 = (uint)(iVar119 * 0x147b) >> 0x13;
              uVar118 = (uint)((uVar106 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar151 = uVar118 >> 8;
              uVar132 = uVar151 * 0x147b >> 0x13;
              uVar106 = (ulong)uVar132;
              uVar118 = uVar132 * -100 + (uVar118 >> 8);
              *(undefined2 *)((long)puVar142 + (4 - uVar160)) =
                   *(undefined2 *)(digit_table + (ulong)uVar147 * 2);
              *(undefined2 *)((long)puVar142 + (6 - uVar160)) =
                   *(undefined2 *)(digit_table + (uVar147 * 0x7fffff9c + iVar119) * 2);
              *(undefined2 *)((long)puVar142 + (8 - uVar160)) =
                   *(undefined2 *)(digit_table + uVar106 * 2);
              *(undefined2 *)((long)puVar142 + (10 - uVar160)) =
                   *(undefined2 *)(digit_table + uVar118 * 2);
              iVar138 = uVar151 * -10000 + iVar138;
              if (iVar138 == 0) {
                lStack_120 = 0xc;
              }
              else {
                uVar118 = (uint)(iVar138 * 0x147b) >> 0x13;
                uVar106 = (ulong)uVar118;
                uVar118 = uVar118 * -100 + iVar138;
                *(undefined2 *)((long)puVar142 + (0xc - uVar160)) =
                     *(undefined2 *)(digit_table + uVar106 * 2);
                *(undefined2 *)((long)puVar142 + (0xe - uVar160)) =
                     *(undefined2 *)(digit_table + uVar118 * 2);
                lStack_120 = 0x10;
              }
              uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar106] + 2;
              if (uVar118 != 0) {
                uVar106 = (ulong)(byte)dec_trailing_zero_table[uVar118];
              }
              uVar106 = lStack_120 - uVar106;
            }
            puVar126 = (uint *)((long)puVar142 + ((uVar106 & 0xffffffff) - uVar160));
            for (uVar106 = 0; uVar141 != uVar106; uVar106 = uVar106 + 1) {
              *(byte *)((long)local_110 + uVar106 + lVar150) =
                   *(byte *)((long)local_110 + uVar106 + lVar150 + 1);
            }
            puVar159 = (undefined1 *)((long)puVar129 + (ulong)uVar141);
            puVar154 = (uint *)(puVar159 + 2);
            *puVar159 = 0x2e;
            if (puVar154 < puVar126) {
              puVar154 = puVar126;
            }
          }
          goto LAB_00f35188;
        }
        lVar150 = 2 - (ulong)(uVar132 < 100000000);
        *(char *)((long)puVar129 + 1) = cVar130;
        uVar160 = (ulong)(uVar151 < 10 && uVar132 < 100000000);
        *(undefined2 *)((long)puVar129 + lVar150) =
             *(undefined2 *)(digit_table + uVar160 + uVar151 * 2);
        lVar150 = lVar150 - uVar160;
        *(undefined2 *)((long)puVar129 + lVar150 + 2) = *(undefined2 *)(digit_table + uVar147 * 2);
        if (iVar138 == 0) {
          if (iVar119 != 0) {
            uVar118 = (uint)(iVar119 * 0x147b) >> 0x13;
            uVar132 = uVar118 * -100 + iVar119;
            *(undefined2 *)((long)puVar129 + lVar150 + 4) =
                 *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
            *(undefined2 *)((long)puVar129 + lVar150 + 6) =
                 *(undefined2 *)(digit_table + uVar132 * 2);
            uVar118 = (byte)dec_trailing_zero_table[uVar118] + 2;
            if (uVar132 != 0) {
              uVar118 = (uint)(byte)dec_trailing_zero_table[uVar132];
            }
            iVar140 = 8;
            goto LAB_00f34c5f;
          }
          uVar118 = 0;
          if (uVar147 == 0) {
            uVar118 = (uint)(byte)dec_trailing_zero_table[uVar151];
          }
          uVar118 = uVar118 + (byte)dec_trailing_zero_table[uVar147];
          iVar140 = 4;
LAB_00f34f72:
          uVar118 = iVar140 - uVar118;
        }
        else {
          uVar151 = (uint)(iVar119 * 0x147b) >> 0x13;
          uVar118 = (uint)((uVar106 & 0xffffffff) * 0x68db8bb >> 0x20);
          uVar156 = uVar118 >> 8;
          uVar147 = uVar156 * 0x147b >> 0x13;
          uVar132 = uVar147 * -100 + (uVar118 >> 8);
          *(undefined2 *)((long)puVar129 + lVar150 + 4) =
               *(undefined2 *)(digit_table + (ulong)uVar151 * 2);
          *(undefined2 *)((long)puVar129 + lVar150 + 6) =
               *(undefined2 *)(digit_table + (uVar151 * 0x7fffff9c + iVar119) * 2);
          *(undefined2 *)((long)puVar129 + lVar150 + 8) =
               *(undefined2 *)(digit_table + (ulong)uVar147 * 2);
          *(undefined2 *)((long)puVar129 + lVar150 + 10) =
               *(undefined2 *)(digit_table + uVar132 * 2);
          iVar138 = uVar156 * -10000 + iVar138;
          if (iVar138 == 0) {
            uVar118 = (byte)dec_trailing_zero_table[uVar147] + 2;
            if (uVar132 != 0) {
              uVar118 = (uint)(byte)dec_trailing_zero_table[uVar132];
            }
            iVar140 = 0xc;
            goto LAB_00f34f72;
          }
          uVar118 = (uint)(iVar138 * 0x147b) >> 0x13;
          uVar132 = uVar118 * -100 + iVar138;
          *(undefined2 *)((long)puVar129 + lVar150 + 0xc) =
               *(undefined2 *)(digit_table + (ulong)uVar118 * 2);
          *(undefined2 *)((long)puVar129 + lVar150 + 0xe) =
               *(undefined2 *)(digit_table + uVar132 * 2);
          uVar118 = (byte)dec_trailing_zero_table[uVar118] + 2;
          if (uVar132 != 0) {
            uVar118 = (uint)(byte)dec_trailing_zero_table[uVar132];
          }
          iVar140 = 0x10;
LAB_00f34c5f:
          uVar118 = iVar140 - uVar118;
        }
        puVar142 = (undefined2 *)
                   ((long)puVar129 +
                   (((ulong)uVar118 + lVar150) - (ulong)((ulong)uVar118 + lVar150 == 2)));
        uVar141 = uVar141 - 1;
        *(undefined1 *)puVar129 = *(undefined1 *)((long)puVar129 + 1);
        *(undefined1 *)((long)puVar129 + 1) = 0x2e;
        *puVar142 = 0x2d65;
        uVar132 = uVar141 >> 0x1f;
        pcVar108 = (char *)((long)puVar142 + (ulong)uVar132 + 1);
        uVar118 = -uVar141;
        if (0 < (int)uVar141) {
          uVar118 = uVar141;
        }
        if (99 < uVar118) {
          *pcVar108 = (char)(uVar118 * 0x290 >> 0x10) + '0';
          *(undefined2 *)((long)puVar142 + (ulong)uVar132 + 2) =
               *(undefined2 *)(digit_table + ((uVar118 * 0x290 >> 0x10) * 0x7fffff9c + uVar118) * 2)
          ;
          puVar154 = (uint *)((long)puVar142 + (ulong)uVar132 + 4);
          goto LAB_00f35188;
        }
        *(undefined2 *)pcVar108 =
             *(undefined2 *)(digit_table + (ulong)(uVar118 < 10) + (ulong)uVar118 * 2);
        puVar154 = (uint *)(pcVar108 + -(ulong)(uVar118 < 10));
LAB_00f339da:
        puVar154 = (uint *)((long)puVar154 + 2);
LAB_00f35188:
        if (local_fc < '\0') {
          *(byte *)puVar154 = 10;
          puVar154 = (uint *)((long)puVar154 + 1);
        }
        *(byte *)puVar154 = 0;
        if (dat_len != (usize *)0x0) {
          *dat_len = (long)puVar154 - (long)local_110;
        }
        *(undefined8 *)pyVar117 = 0;
        pyVar117->msg = (char *)0x0;
        return (char *)local_110;
      }
      break;
    case 5:
switchD_00f2db12_caseD_5:
      uVar160 = uVar106 >> 8;
      pbVar157 = (byte *)(val->uni).str;
      local_110 = (uint *)(*p_Var4)(pvVar6,uVar160 * 6 + 4);
      if (local_110 != (uint *)0x0) {
        if ((puVar159 != enc_table_cpy) || ((val->tag & 0x18) == 0)) {
          puVar126 = (uint *)(pbVar157 + uVar160);
          *(byte *)local_110 = 0x22;
          puVar154 = local_110;
LAB_00f33ca4:
          lVar152 = (long)puVar126 - (long)pbVar157;
          lVar150 = 0;
          while( true ) {
            puVar122 = (uint *)(pbVar157 + lVar150);
            puVar112 = (uint *)((long)puVar154 + lVar150 + 1);
            if (lVar152 < 0x10) break;
            bVar155 = (byte)*puVar122;
            if (puVar159[bVar155] != '\0') {
              puVar122 = (uint *)(pbVar157 + lVar150);
              puVar112 = (uint *)((long)puVar154 + lVar150 + 1);
              goto LAB_00f34078;
            }
            if (puVar159[pbVar157[lVar150 + 1]] != '\0') {
              puVar122 = (uint *)(pbVar157 + lVar150);
              puVar112 = (uint *)((long)puVar154 + lVar150 + 1);
              goto LAB_00f3406c;
            }
            if (puVar159[pbVar157[lVar150 + 2]] != '\0') {
              puVar122 = (uint *)(pbVar157 + lVar150);
              puVar112 = (uint *)((long)puVar154 + lVar150 + 1);
              goto LAB_00f33e98;
            }
            if (puVar159[pbVar157[lVar150 + 3]] != '\0') {
              puVar122 = (uint *)(pbVar157 + lVar150);
              puVar112 = (uint *)((long)puVar154 + lVar150 + 1);
              goto LAB_00f33eba;
            }
            if (puVar159[pbVar157[lVar150 + 4]] != '\0') {
              puVar122 = (uint *)(pbVar157 + lVar150 + 4);
              puVar112 = (uint *)((long)puVar154 + lVar150 + 5);
              *(undefined4 *)((long)puVar154 + lVar150 + 1) = *(undefined4 *)(pbVar157 + lVar150);
              goto LAB_00f34078;
            }
            if (puVar159[pbVar157[lVar150 + 5]] != '\0') {
              pbVar157 = pbVar157 + lVar150;
              puVar122 = (uint *)(pbVar157 + 5);
              puVar112 = (uint *)((long)puVar154 + lVar150 + 6);
              *(byte *)((long)puVar112 + -1) = pbVar157[4];
              *(undefined4 *)((long)puVar112 + -5) = *(undefined4 *)pbVar157;
              goto LAB_00f34078;
            }
            if (puVar159[pbVar157[lVar150 + 6]] != '\0') {
              pbVar157 = pbVar157 + lVar150;
              puVar122 = (uint *)(pbVar157 + 6);
              puVar112 = (uint *)((long)puVar154 + lVar150 + 7);
              *(ushort *)((long)puVar112 + -2) = *(ushort *)(pbVar157 + 4);
              *(undefined4 *)((long)puVar112 + -6) = *(undefined4 *)pbVar157;
              goto LAB_00f34078;
            }
            if (puVar159[pbVar157[lVar150 + 7]] != '\0') {
              pbVar157 = pbVar157 + lVar150;
              puVar122 = (uint *)(pbVar157 + 7);
              uVar3 = *(undefined4 *)pbVar157;
              puVar112 = (uint *)((long)puVar154 + lVar150 + 8);
              *(undefined4 *)((long)puVar154 + lVar150 + 4) = *(undefined4 *)(pbVar157 + 3);
              *(undefined4 *)((long)puVar154 + lVar150 + 1) = uVar3;
              goto LAB_00f34078;
            }
            if (puVar159[pbVar157[lVar150 + 8]] != '\0') {
              puVar122 = (uint *)(pbVar157 + lVar150 + 8);
              puVar112 = (uint *)((long)puVar154 + lVar150 + 9);
              *(undefined8 *)((long)puVar154 + lVar150 + 1) = *(undefined8 *)(pbVar157 + lVar150);
              goto LAB_00f34078;
            }
            if (puVar159[pbVar157[lVar150 + 9]] != '\0') {
              pbVar157 = pbVar157 + lVar150;
              puVar122 = (uint *)(pbVar157 + 9);
              puVar112 = (uint *)((long)puVar154 + lVar150 + 10);
              *(byte *)((long)puVar112 + -1) = pbVar157[8];
              *(undefined8 *)((long)puVar112 + -9) = *(undefined8 *)pbVar157;
              goto LAB_00f34078;
            }
            if (puVar159[pbVar157[lVar150 + 10]] != '\0') {
              pbVar157 = pbVar157 + lVar150;
              puVar122 = (uint *)(pbVar157 + 10);
              puVar112 = (uint *)((long)puVar154 + lVar150 + 0xb);
              *(ushort *)((long)puVar112 + -2) = *(ushort *)(pbVar157 + 8);
              *(undefined8 *)((long)puVar112 + -10) = *(undefined8 *)pbVar157;
              goto LAB_00f34078;
            }
            if (puVar159[pbVar157[lVar150 + 0xb]] != '\0') {
              pbVar157 = pbVar157 + lVar150;
              puVar122 = (uint *)(pbVar157 + 0xb);
              puVar112 = (uint *)((long)puVar154 + lVar150 + 0xc);
              puVar112[-1] = *(uint *)(pbVar157 + 7);
              *(undefined8 *)((long)puVar112 + -0xb) = *(undefined8 *)pbVar157;
              goto LAB_00f34078;
            }
            if (puVar159[pbVar157[lVar150 + 0xc]] != '\0') {
              pbVar157 = pbVar157 + lVar150;
              puVar122 = (uint *)(pbVar157 + 0xc);
              puVar112 = (uint *)((long)puVar154 + lVar150 + 0xd);
              puVar112[-1] = *(uint *)(pbVar157 + 8);
              *(undefined8 *)(puVar112 + -3) = *(undefined8 *)pbVar157;
              goto LAB_00f34078;
            }
            if (puVar159[pbVar157[lVar150 + 0xd]] != '\0') {
              pbVar157 = pbVar157 + lVar150;
              puVar122 = (uint *)(pbVar157 + 0xd);
              uVar113 = *(undefined8 *)pbVar157;
              puVar112 = (uint *)((long)puVar154 + lVar150 + 0xe);
              *(undefined8 *)((long)puVar154 + lVar150 + 6) = *(undefined8 *)(pbVar157 + 5);
              *(undefined8 *)((long)puVar154 + lVar150 + 1) = uVar113;
              goto LAB_00f34078;
            }
            if (puVar159[pbVar157[lVar150 + 0xe]] != '\0') {
              pbVar157 = pbVar157 + lVar150;
              puVar122 = (uint *)(pbVar157 + 0xe);
              uVar113 = *(undefined8 *)pbVar157;
              puVar112 = (uint *)((long)puVar154 + lVar150 + 0xf);
              *(undefined8 *)((long)puVar154 + lVar150 + 7) = *(undefined8 *)(pbVar157 + 6);
              *(undefined8 *)((long)puVar154 + lVar150 + 1) = uVar113;
              goto LAB_00f34078;
            }
            if (puVar159[pbVar157[lVar150 + 0xf]] != '\0') {
              pbVar157 = pbVar157 + lVar150;
              puVar122 = (uint *)(pbVar157 + 0xf);
              uVar113 = *(undefined8 *)pbVar157;
              puVar112 = (uint *)((long)puVar154 + lVar150 + 0x10);
              *(undefined8 *)((long)puVar154 + lVar150 + 8) = *(undefined8 *)(pbVar157 + 7);
              *(undefined8 *)((long)puVar154 + lVar150 + 1) = uVar113;
              goto LAB_00f34078;
            }
            uVar118 = puVar122[1];
            uVar132 = puVar122[2];
            uVar141 = puVar122[3];
            *puVar112 = *puVar122;
            *(uint *)((long)puVar154 + lVar150 + 5) = uVar118;
            *(uint *)((long)puVar154 + lVar150 + 9) = uVar132;
            *(uint *)((long)puVar154 + lVar150 + 0xd) = uVar141;
            lVar150 = lVar150 + 0x10;
            lVar152 = lVar152 + -0x10;
          }
LAB_00f33dfc:
          if (3 < lVar152) {
            if (puVar159[(byte)*puVar122] == '\0') {
              if (puVar159[*(byte *)((long)puVar122 + 1)] == '\0') {
                if (puVar159[*(byte *)((long)puVar122 + 2)] == '\0') {
                  if (puVar159[*(byte *)((long)puVar122 + 3)] == '\0') goto LAB_00f33dea;
LAB_00f33eba:
                  *(byte *)((long)puVar112 + 2) = *(byte *)((long)puVar122 + 2);
                  *(ushort *)puVar112 = (ushort)*puVar122;
                  puVar112 = (uint *)((long)puVar112 + 3);
                  puVar122 = (uint *)((long)puVar122 + 3);
                }
                else {
LAB_00f33e98:
                  *(ushort *)puVar112 = (ushort)*puVar122;
                  puVar112 = (uint *)((long)puVar112 + 2);
                  puVar122 = (uint *)((long)puVar122 + 2);
                }
              }
              else {
                bVar155 = (byte)*puVar122;
LAB_00f3406c:
                *(byte *)puVar112 = bVar155;
                puVar112 = (uint *)((long)puVar112 + 1);
                puVar122 = (uint *)((long)puVar122 + 1);
              }
            }
            goto LAB_00f34078;
          }
          goto LAB_00f33e44;
        }
        *(byte *)local_110 = 0x22;
        puVar154 = (uint *)((long)local_110 + 2);
        for (uVar105 = uVar160; 0xf < uVar105; uVar105 = uVar105 - 0x10) {
          uVar113 = *(undefined8 *)(pbVar157 + 8);
          *(undefined8 *)((long)puVar154 + -1) = *(undefined8 *)pbVar157;
          *(undefined8 *)((long)puVar154 + 7) = uVar113;
          pbVar157 = pbVar157 + 0x10;
          puVar154 = puVar154 + 4;
        }
        for (uVar160 = uVar160 - (uVar106 >> 8 & 0xfffffffffffffff0); 3 < uVar160;
            uVar160 = uVar160 - 4) {
          *(undefined4 *)((long)puVar154 + -1) = *(undefined4 *)pbVar157;
          pbVar157 = pbVar157 + 4;
          puVar154 = puVar154 + 1;
        }
        for (uVar106 = 0; uVar160 != uVar106; uVar106 = uVar106 + 1) {
          *(byte *)((long)puVar154 + -1) = pbVar157[uVar106];
          puVar154 = (uint *)((long)puVar154 + 1);
        }
        *(byte *)((long)puVar154 + -1) = 0x22;
        goto LAB_00f35188;
      }
      break;
    case 6:
switchD_00f2db12_caseD_6:
      puVar154 = (uint *)(*p_Var4)(pvVar6,4);
      if (puVar154 != (uint *)0x0) {
        *(ushort *)puVar154 = 0x5d5b;
        local_110 = puVar154;
        goto LAB_00f339da;
      }
      break;
    case 7:
switchD_00f2db12_caseD_7:
      puVar154 = (uint *)(*p_Var4)(pvVar6,4);
      if (puVar154 != (uint *)0x0) {
        *(ushort *)puVar154 = 0x7d7b;
        local_110 = puVar154;
        goto LAB_00f339da;
      }
    }
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar116 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar116 = err;
    }
    pyVar117->code = 2;
    pcVar108 = "memory allocation failed";
  }
  else {
    puVar159 = enc_table_esc_slash;
    if ((flg & 4) == 0) {
      puVar159 = enc_table_esc;
    }
    switch(bVar155 & 7) {
    case 1:
      goto switchD_00f2db12_caseD_1;
    case 2:
      goto switchD_00f2db12_caseD_2;
    case 3:
      goto switchD_00f2db12_caseD_3;
    case 4:
      goto switchD_00f2db12_caseD_4;
    case 5:
      goto switchD_00f2db12_caseD_5;
    case 6:
      goto switchD_00f2db12_caseD_6;
    case 7:
      goto switchD_00f2db12_caseD_7;
    }
switchD_00f2db12_caseD_0:
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar116 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar116 = err;
    }
    pyVar117->code = 3;
    pcVar108 = "invalid JSON value type";
  }
LAB_00f33a1d:
  pyVar116->msg = pcVar108;
  return (char *)0x0;
LAB_00f33dea:
  *puVar112 = *puVar122;
  puVar112 = puVar112 + 1;
  puVar122 = puVar122 + 1;
  lVar152 = lVar152 + -4;
  goto LAB_00f33dfc;
LAB_00f33e44:
  if (puVar126 <= puVar122) {
    *(byte *)puVar112 = 0x22;
    puVar154 = (uint *)((long)puVar112 + 1);
    goto LAB_00f35188;
  }
  uVar118 = *puVar122;
  if (puVar159[(byte)uVar118] != '\0') goto LAB_00f34078;
  puVar122 = (uint *)((long)puVar122 + 1);
  *(byte *)puVar112 = (byte)uVar118;
  puVar112 = (uint *)((long)puVar112 + 1);
  goto LAB_00f33e44;
LAB_00f34078:
  puVar154 = puVar122 + 1;
  if (puVar126 < puVar154) {
    if (puVar126 == puVar122) goto switchD_00f340a3_default;
    bVar155 = (byte)*puVar122;
    uVar106 = (ulong)bVar155;
    bVar1 = puVar159[uVar106];
    if ((long)(ulong)(bVar1 >> 1) <= (long)puVar126 - (long)puVar122) goto LAB_00f34090;
switchD_00f340a3_caseD_1:
    if ((flg & 2) != 0) goto LAB_00f341ca;
    goto LAB_00f34381;
  }
  bVar155 = (byte)*puVar122;
  uVar106 = (ulong)bVar155;
  bVar1 = puVar159[uVar106];
LAB_00f34090:
  switch(bVar1) {
  case 0:
    goto switchD_00f340a3_caseD_0;
  case 1:
    goto switchD_00f340a3_caseD_1;
  case 2:
    *(ushort *)puVar112 = *(ushort *)(esc_single_char_table + uVar106 * 2);
    puVar112 = (uint *)((long)puVar112 + 2);
    puVar122 = (uint *)((long)puVar122 + 1);
    goto LAB_00f34078;
  case 3:
    *puVar112 = 0x3030755c;
    *(ushort *)(puVar112 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar122 * 2);
    goto LAB_00f341e0;
  case 4:
    uVar2 = (ushort)*puVar122;
    bVar155 = (byte)uVar2;
    if (((uVar2 & 0xc0e0) == 0x80c0) && ((uVar2 & 0x1e) != 0)) {
      *(ushort *)puVar112 = uVar2;
      puVar112 = (uint *)((long)puVar112 + 2);
      puVar122 = (uint *)((long)puVar122 + 2);
      goto LAB_00f34078;
    }
    break;
  case 5:
    uVar2 = (ushort)*puVar122;
    if (((uVar2 & 0xc0e0) != 0x80c0) || ((uVar2 & 0x1e) == 0)) goto LAB_00f341ca;
    *(ushort *)puVar112 = 0x755c;
    *(ushort *)((long)puVar112 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar2 >> 1) & 0xe));
    *(ushort *)(puVar112 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar2 >> 8) & 0x3f | (byte)uVar2 << 6) * 2);
    puVar112 = (uint *)((long)puVar112 + 6);
    puVar122 = (uint *)((long)puVar122 + 2);
    goto LAB_00f34078;
  case 6:
    if (puVar126 < puVar154) {
      uVar2 = (ushort)*puVar122;
      bVar155 = (byte)uVar2;
      uVar118 = (uint)(uint3)*puVar122;
      if ((((uVar118 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
         ((uVar2 & 0x200f) != 0x200d)) goto LAB_00f3417e;
    }
    else {
      uVar118 = *puVar122;
      bVar155 = (byte)uVar118;
      if ((((uVar118 & 0xc0c0f0) == 0x8080e0) && ((uVar118 & 0x200f) != 0)) &&
         ((uVar118 & 0x200f) != 0x200d)) {
LAB_00f3417e:
        *puVar112 = uVar118;
        puVar112 = (uint *)((long)puVar112 + 3);
        puVar122 = (uint *)((long)puVar122 + 3);
        goto LAB_00f34078;
      }
    }
    break;
  case 7:
    uVar2 = (ushort)*puVar122;
    bVar155 = *(byte *)((long)puVar122 + 2);
    if ((((*puVar122 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
       ((uVar2 & 0x200f) != 0x200d)) {
      uVar118 = *puVar122;
      *(ushort *)puVar112 = 0x755c;
      *(ushort *)((long)puVar112 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar2 >> 2 & 0xfc0 | (uint)(byte)uVar118 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar112 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar2 >> 2 & 0xc0 | bVar155 & 0x3f) * 2);
      puVar112 = (uint *)((long)puVar112 + 6);
      puVar122 = (uint *)((long)puVar122 + 3);
    }
    else {
LAB_00f341ca:
      if ((flg & 0x20) == 0) goto LAB_00f34adc;
      *(ushort *)puVar112 = 0x755c;
      ((ushort *)((long)puVar112 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar112 + 2))[1] = 0x4446;
LAB_00f341e0:
      puVar112 = (uint *)((long)puVar112 + 6);
      puVar122 = (uint *)((long)puVar122 + 1);
    }
    goto LAB_00f34078;
  case 8:
    uVar118 = *puVar122;
    bVar155 = (byte)uVar118;
    if ((((uVar118 & 0xc0c0c0f8) == 0x808080f0) && ((uVar118 & 0x3007) != 0)) &&
       ((bVar155 >> 2 & (uVar118 & 0x3003) != 0) == 0)) {
      *puVar112 = uVar118;
      puVar112 = puVar112 + 1;
      puVar122 = puVar154;
      goto LAB_00f34078;
    }
    break;
  case 9:
    uVar118 = *puVar122;
    if ((((uVar118 & 0xc0c0c0f8) != 0x808080f0) || ((uVar118 & 0x3007) == 0)) ||
       (((byte)uVar118 >> 2 & (uVar118 & 0x3003) != 0) != 0)) goto LAB_00f341ca;
    iVar140 = (uVar118 & 7) * 0x40000;
    iVar138 = (uVar118 & 0x3f00) * 0x10;
    *(ushort *)puVar112 = 0x755c;
    *(ushort *)((long)puVar112 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar140 + iVar138) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar112 + 1) =
         *(ushort *)
          (esc_hex_char_table +
          (((uVar118 >> 10 & 0xc00) - 0x10000) + iVar140 + iVar138 >> 9 & 0x1fe));
    *(ushort *)((long)puVar112 + 6) = 0x755c;
    *(ushort *)(puVar112 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar118 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)puVar112 + 10) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(uVar118 >> 10 & 0xc0 | uVar118 >> 0x18 & 0x3f) * 2);
    puVar112 = puVar112 + 3;
    puVar122 = puVar154;
    goto LAB_00f34078;
  default:
switchD_00f340a3_default:
    *(byte *)puVar112 = 0x22;
    puVar154 = (uint *)((long)puVar112 + 1);
    goto LAB_00f35188;
  }
LAB_00f34381:
  if ((flg & 0x20) == 0) {
LAB_00f34adc:
    (*p_Var5)(pvVar6,local_110);
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar116 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar116 = err;
    }
    pyVar117->code = 7;
    pcVar108 = "invalid utf-8 encoding in string";
    goto LAB_00f33a1d;
  }
  *(byte *)puVar112 = bVar155;
  puVar112 = (uint *)((long)puVar112 + 1);
  puVar122 = (uint *)((long)puVar122 + 1);
  goto LAB_00f34078;
switchD_00f340a3_caseD_0:
  pbVar157 = (byte *)((long)puVar122 + 1);
  *(byte *)puVar112 = bVar155;
  puVar154 = puVar112;
  goto LAB_00f33ca4;
LAB_00f31340:
  *puVar128 = *puVar126;
  puVar128 = puVar128 + 1;
  puVar126 = puVar126 + 1;
  lVar149 = lVar149 + -4;
  goto LAB_00f31350;
LAB_00f31393:
  if (puVar154 <= puVar126) goto switchD_00f315d6_default;
  uVar118 = *puVar126;
  if (puVar159[(byte)uVar118] != '\0') goto LAB_00f315a9;
  puVar126 = (uint *)((long)puVar126 + 1);
  *(byte *)puVar128 = (byte)uVar118;
  puVar128 = (uint *)((long)puVar128 + 1);
  goto LAB_00f31393;
LAB_00f315a9:
  puVar122 = puVar126 + 1;
  if (puVar154 < puVar122) {
    if (puVar154 != puVar126) {
      bVar155 = (byte)*puVar126;
      uVar106 = (ulong)bVar155;
      bVar1 = puVar159[uVar106];
      if ((long)(ulong)(bVar1 >> 1) <= (long)puVar154 - (long)puVar126) goto LAB_00f315c0;
switchD_00f315d6_caseD_1:
      if ((flg & 2) != 0) goto LAB_00f316e4;
      goto LAB_00f31899;
    }
    goto switchD_00f315d6_default;
  }
  bVar155 = (byte)*puVar126;
  uVar106 = (ulong)bVar155;
  bVar1 = puVar159[uVar106];
LAB_00f315c0:
  switch(bVar1) {
  case 0:
    goto switchD_00f315d6_caseD_0;
  case 1:
    goto switchD_00f315d6_caseD_1;
  case 2:
    *(ushort *)puVar128 = *(ushort *)(esc_single_char_table + uVar106 * 2);
    puVar128 = (uint *)((long)puVar128 + 2);
    puVar126 = (uint *)((long)puVar126 + 1);
    goto LAB_00f315a9;
  case 3:
    *puVar128 = 0x3030755c;
    *(ushort *)(puVar128 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar126 * 2);
    goto LAB_00f316fa;
  case 4:
    uVar2 = (ushort)*puVar126;
    bVar155 = (byte)uVar2;
    if (((uVar2 & 0xc0e0) == 0x80c0) && ((uVar2 & 0x1e) != 0)) {
      *(ushort *)puVar128 = uVar2;
      puVar128 = (uint *)((long)puVar128 + 2);
      puVar126 = (uint *)((long)puVar126 + 2);
      goto LAB_00f315a9;
    }
    break;
  case 5:
    uVar2 = (ushort)*puVar126;
    if (((uVar2 & 0xc0e0) != 0x80c0) || ((uVar2 & 0x1e) == 0)) goto LAB_00f316e4;
    *(ushort *)puVar128 = 0x755c;
    *(ushort *)((long)puVar128 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar2 >> 1) & 0xe));
    *(ushort *)(puVar128 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar2 >> 8) & 0x3f | (byte)uVar2 << 6) * 2);
    puVar128 = (uint *)((long)puVar128 + 6);
    puVar126 = (uint *)((long)puVar126 + 2);
    goto LAB_00f315a9;
  case 6:
    if (puVar154 < puVar122) {
      uVar2 = (ushort)*puVar126;
      bVar155 = (byte)uVar2;
      uVar118 = (uint)(uint3)*puVar126;
      if (((uVar118 & 0xc0c0f0) == 0x8080e0) &&
         (uVar141 = uVar2 & 0x200f, uVar132 = (uint)uVar2, (uVar2 & 0x200f) != 0))
      goto LAB_00f31697;
    }
    else {
      uVar118 = *puVar126;
      if (((uVar118 & 0xc0c0f0) == 0x8080e0) &&
         (uVar141 = uVar118 & 0x200f, uVar132 = uVar118, uVar141 != 0)) {
LAB_00f31697:
        bVar155 = (byte)uVar132;
        if (uVar141 != 0x200d) {
          *puVar128 = uVar118;
          puVar128 = (uint *)((long)puVar128 + 3);
          puVar126 = (uint *)((long)puVar126 + 3);
          goto LAB_00f315a9;
        }
      }
      else {
        bVar155 = (byte)uVar118;
      }
    }
    break;
  case 7:
    uVar2 = (ushort)*puVar126;
    bVar155 = *(byte *)((long)puVar126 + 2);
    if ((((*puVar126 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
       ((uVar2 & 0x200f) != 0x200d)) {
      uVar118 = *puVar126;
      *(ushort *)puVar128 = 0x755c;
      *(ushort *)((long)puVar128 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar2 >> 2 & 0xfc0 | (uint)(byte)uVar118 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar128 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar2 >> 2 & 0xc0 | bVar155 & 0x3f) * 2);
      puVar128 = (uint *)((long)puVar128 + 6);
      puVar126 = (uint *)((long)puVar126 + 3);
    }
    else {
LAB_00f316e4:
      if ((flg & 0x20) == 0) goto LAB_00f3364e;
      *(ushort *)puVar128 = 0x755c;
      ((ushort *)((long)puVar128 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar128 + 2))[1] = 0x4446;
LAB_00f316fa:
      puVar128 = (uint *)((long)puVar128 + 6);
      puVar126 = (uint *)((long)puVar126 + 1);
    }
    goto LAB_00f315a9;
  case 8:
    uVar118 = *puVar126;
    bVar155 = (byte)uVar118;
    if ((((uVar118 & 0xc0c0c0f8) == 0x808080f0) && ((uVar118 & 0x3007) != 0)) &&
       ((bVar155 >> 2 & (uVar118 & 0x3003) != 0) == 0)) {
      *puVar128 = uVar118;
      puVar128 = puVar128 + 1;
      puVar126 = puVar122;
      goto LAB_00f315a9;
    }
    break;
  case 9:
    uVar118 = *puVar126;
    if ((((uVar118 & 0xc0c0c0f8) != 0x808080f0) || ((uVar118 & 0x3007) == 0)) ||
       (((byte)uVar118 >> 2 & (uVar118 & 0x3003) != 0) != 0)) goto LAB_00f316e4;
    iVar140 = (uVar118 & 7) * 0x40000;
    iVar138 = (uVar118 & 0x3f00) * 0x10;
    *(ushort *)puVar128 = 0x755c;
    *(ushort *)((long)puVar128 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar140 + iVar138) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar128 + 1) =
         *(ushort *)
          (esc_hex_char_table +
          (((uVar118 >> 10 & 0xc00) + iVar140 + iVar138) - 0x10000 >> 9 & 0x1fe));
    *(ushort *)((long)puVar128 + 6) = 0x755c;
    *(ushort *)(puVar128 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar118 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)puVar128 + 10) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(uVar118 >> 10 & 0xc0 | uVar118 >> 0x18 & 0x3f) * 2);
    puVar128 = puVar128 + 3;
    puVar126 = puVar122;
    goto LAB_00f315a9;
  default:
    goto switchD_00f315d6_default;
  }
LAB_00f31899:
  if ((flg & 0x20) == 0) goto LAB_00f3364e;
  *(byte *)puVar128 = bVar155;
  puVar128 = (uint *)((long)puVar128 + 1);
  puVar126 = (uint *)((long)puVar126 + 1);
  goto LAB_00f315a9;
switchD_00f315d6_caseD_0:
  pbVar157 = (byte *)((long)puVar126 + 1);
  *(byte *)puVar128 = bVar155;
  puVar122 = puVar128;
  goto LAB_00f31202;
LAB_00f3372c:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar116 = &dummy_err;
  if (err != (yyjson_write_err *)0x0) {
    pyVar116 = err;
  }
  pyVar117->code = 4;
  pcVar108 = "nan or inf number is not allowed";
  goto LAB_00f33688;
code_r0x00f2e333:
  *puVar112 = *puVar122;
  puVar112 = puVar112 + 1;
  puVar122 = puVar122 + 1;
  lVar139 = lVar139 + -4;
  goto LAB_00f2e2f6;
LAB_00f2e34c:
  if (puVar126 <= puVar122) goto switchD_00f2e61f_default;
  uVar141 = *puVar122;
  if (puVar131[(byte)uVar141] != '\0') goto LAB_00f2e5f0;
  puVar122 = (uint *)((long)puVar122 + 1);
  *(byte *)puVar112 = (byte)uVar141;
  puVar112 = (uint *)((long)puVar112 + 1);
  goto LAB_00f2e34c;
LAB_00f2e5f0:
  puVar154 = puVar122 + 1;
  if (puVar126 < puVar154) {
    if (puVar126 != puVar122) {
      uVar141 = (uint)(byte)*puVar122;
      uVar121 = (ulong)(byte)*puVar122;
      bVar155 = puVar131[uVar121];
      if ((long)(ulong)(bVar155 >> 1) <= (long)puVar126 - (long)puVar122) goto LAB_00f2e609;
switchD_00f2e61f_caseD_1:
      if ((flg & 2) != 0) goto LAB_00f2e722;
      goto LAB_00f2e8ba;
    }
    goto switchD_00f2e61f_default;
  }
  uVar141 = (uint)(byte)*puVar122;
  uVar121 = (ulong)(byte)*puVar122;
  bVar155 = puVar131[uVar121];
LAB_00f2e609:
  switch(bVar155) {
  case 0:
    goto switchD_00f2e61f_caseD_0;
  case 1:
    goto switchD_00f2e61f_caseD_1;
  case 2:
    *(ushort *)puVar112 = *(ushort *)(esc_single_char_table + uVar121 * 2);
    puVar112 = (uint *)((long)puVar112 + 2);
    puVar122 = (uint *)((long)puVar122 + 1);
    goto LAB_00f2e5f0;
  case 3:
    *puVar112 = 0x3030755c;
    *(ushort *)(puVar112 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar122 * 2);
    goto LAB_00f2e738;
  case 4:
    uVar2 = (ushort)*puVar122;
    uVar141 = (uint)uVar2;
    if (((uVar141 & 0xc0e0) == 0x80c0) && ((uVar2 & 0x1e) != 0)) {
      *(ushort *)puVar112 = uVar2;
      puVar112 = (uint *)((long)puVar112 + 2);
      puVar122 = (uint *)((long)puVar122 + 2);
      goto LAB_00f2e5f0;
    }
    break;
  case 5:
    uVar2 = (ushort)*puVar122;
    if (((uVar2 & 0xc0e0) != 0x80c0) || ((uVar2 & 0x1e) == 0)) goto LAB_00f2e722;
    *(ushort *)puVar112 = 0x755c;
    *(ushort *)((long)puVar112 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar2 >> 1) & 0xe));
    *(ushort *)(puVar112 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar2 >> 8) & 0x3f | (byte)uVar2 << 6) * 2);
    puVar112 = (uint *)((long)puVar112 + 6);
    puVar122 = (uint *)((long)puVar122 + 2);
    goto LAB_00f2e5f0;
  case 6:
    if (puVar126 < puVar154) {
      uVar2 = (ushort)*puVar122;
      uVar141 = (uint)uVar2;
      uVar147 = (uint)(uint3)*puVar122;
      if (((uVar147 & 0xc0c0f0) == 0x8080e0) && (uVar151 = uVar2 & 0x200f, (uVar2 & 0x200f) != 0))
      goto LAB_00f2e6da;
    }
    else {
      uVar147 = *puVar122;
      uVar141 = uVar147;
      if (((uVar147 & 0xc0c0f0) == 0x8080e0) && (uVar151 = uVar147 & 0x200f, uVar151 != 0)) {
LAB_00f2e6da:
        if (uVar151 != 0x200d) {
          *puVar112 = uVar147;
          puVar112 = (uint *)((long)puVar112 + 3);
          puVar122 = (uint *)((long)puVar122 + 3);
          goto LAB_00f2e5f0;
        }
      }
    }
    break;
  case 7:
    uVar2 = (ushort)*puVar122;
    bVar155 = *(byte *)((long)puVar122 + 2);
    if ((((*puVar122 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
       ((uVar2 & 0x200f) != 0x200d)) {
      uVar141 = *puVar122;
      *(ushort *)puVar112 = 0x755c;
      *(ushort *)((long)puVar112 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar2 >> 2 & 0xfc0 | (uint)(byte)uVar141 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar112 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar2 >> 2 & 0xc0 | bVar155 & 0x3f) * 2);
      puVar112 = (uint *)((long)puVar112 + 6);
      puVar122 = (uint *)((long)puVar122 + 3);
    }
    else {
LAB_00f2e722:
      if ((flg & 0x20) == 0) goto LAB_00f3364e;
      *(ushort *)puVar112 = 0x755c;
      ((ushort *)((long)puVar112 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar112 + 2))[1] = 0x4446;
LAB_00f2e738:
      puVar112 = (uint *)((long)puVar112 + 6);
      puVar122 = (uint *)((long)puVar122 + 1);
    }
    goto LAB_00f2e5f0;
  case 8:
    uVar141 = *puVar122;
    if ((((uVar141 & 0xc0c0c0f8) == 0x808080f0) && ((uVar141 & 0x3007) != 0)) &&
       (((byte)(uVar141 >> 2) & 0x3f & (uVar141 & 0x3003) != 0) == 0)) {
      *puVar112 = uVar141;
      puVar112 = puVar112 + 1;
      puVar122 = puVar154;
      goto LAB_00f2e5f0;
    }
    break;
  case 9:
    uVar141 = *puVar122;
    if ((((uVar141 & 0xc0c0c0f8) != 0x808080f0) || ((uVar141 & 0x3007) == 0)) ||
       (((byte)uVar141 >> 2 & (uVar141 & 0x3003) != 0) != 0)) goto LAB_00f2e722;
    iVar140 = (uVar141 & 7) * 0x40000;
    iVar138 = (uVar141 & 0x3f00) * 0x10;
    *(ushort *)puVar112 = 0x755c;
    *(ushort *)((long)puVar112 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar140 + iVar138) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar112 + 1) =
         *(ushort *)
          (esc_hex_char_table +
          (((uVar141 >> 10 & 0xc00) + iVar140 + iVar138) - 0x10000 >> 9 & 0x1fe));
    *(ushort *)((long)puVar112 + 6) = 0x755c;
    *(ushort *)(puVar112 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar141 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)puVar112 + 10) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(uVar141 >> 10 & 0xc0 | uVar141 >> 0x18 & 0x3f) * 2);
    puVar112 = puVar112 + 3;
    puVar122 = puVar154;
    goto LAB_00f2e5f0;
  default:
    goto switchD_00f2e61f_default;
  }
LAB_00f2e8ba:
  if ((flg & 0x20) == 0) goto LAB_00f3364e;
  *(byte *)puVar112 = (byte)uVar141;
  puVar112 = (uint *)((long)puVar112 + 1);
  puVar122 = (uint *)((long)puVar122 + 1);
  goto LAB_00f2e5f0;
LAB_00f3364e:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar116 = &dummy_err;
  if (err != (yyjson_write_err *)0x0) {
    pyVar116 = err;
  }
  pyVar117->code = 7;
  pcVar108 = "invalid utf-8 encoding in string";
  goto LAB_00f33688;
switchD_00f2e61f_caseD_0:
  pbVar157 = (byte *)((long)puVar122 + 1);
  *(byte *)puVar112 = (byte)uVar141;
  puVar154 = puVar112;
  goto LAB_00f2e1b2;
  while( true ) {
    pyVar135 = local_80->next;
    local_f8 = puVar127 + 2;
    uVar160 = *puVar127;
    local_80 = (yyjson_mut_val *)puVar127[1];
    local_40 = uVar160 & 0xffffffffffffff01;
    puVar154 = (uint *)(pbVar111 + 2);
    pbVar111[0] = 0x2c;
    pbVar111[1] = 10;
    lVar152 = (uVar160 >> 1) - 1;
    sVar158 = sVar134;
    lVar137 = lVar149;
    if (lVar152 != 0) break;
LAB_00f30b13:
    pbVar157 = (byte *)((long)puVar154 + -1);
    *(byte *)((long)puVar154 + -2) = 10;
    puVar127 = local_f8;
    sVar134 = sVar158;
    if (local_f8 <= (ulong *)(lVar137 * 4 + -1 + (long)puVar154)) {
      uVar160 = sVar158 >> 1;
      if (sVar158 >> 1 <= (ulong)(lVar137 * 4)) {
        uVar160 = lVar137 * 4;
      }
      sVar134 = (uVar160 + 0xf & 0xfffffffffffffff0) + sVar158;
      pbVar111 = (byte *)(*p_Var7)(pvVar6,local_110,sVar158,sVar134);
      if (pbVar111 == (byte *)0x0) goto LAB_00f33695;
      puVar127 = (ulong *)(pbVar111 + (sVar134 - ((long)local_b0 - (long)local_f8)));
      memmove(puVar127,pbVar111 + ((long)local_f8 - (long)local_110),(long)local_b0 - (long)local_f8
             );
      pbVar157 = pbVar111 + ((long)pbVar157 - (long)local_110);
      local_b0 = (ulong *)(pbVar111 + sVar134);
      local_110 = (uint *)pbVar111;
    }
    lVar149 = lVar137 + -1;
    pbVar111 = pbVar157 + 1;
    pbVar157 = (byte *)((long)local_110 + ~(ulong)pbVar157);
    for (lVar152 = 1; lVar137 != lVar152; lVar152 = lVar152 + 1) {
      pbVar111[-1] = 0x20;
      pbVar111[0] = 0x20;
      pbVar111[1] = 0x20;
      pbVar111[2] = 0x20;
      pbVar111 = pbVar111 + lVar150;
      pbVar157 = pbVar157 + -lVar150;
    }
    pbVar111[-1] = (char)local_40 * ' ' + 0x5d;
    if (local_b0 <= puVar127) {
      if (local_fc < '\0') {
        if (puVar127 <= pbVar111 + 2) {
          uVar106 = 2;
          if (2 < sVar134 >> 1) {
            uVar106 = sVar134 >> 1;
          }
          sVar158 = (uVar106 + 0xf & 0xfffffffffffffff0) + sVar134;
          pbVar109 = (byte *)(*p_Var7)(pvVar6,local_110,sVar134,sVar158);
          if (pbVar109 == (byte *)0x0) goto LAB_00f33695;
          memmove(pbVar109 + (sVar158 - ((long)local_b0 - (long)puVar127)),
                  pbVar109 + ((long)puVar127 - (long)local_110),(long)local_b0 - (long)puVar127);
          pbVar111 = pbVar109 + -(long)pbVar157;
          local_110 = (uint *)pbVar109;
        }
        *pbVar111 = 10;
        pbVar111 = pbVar111 + 1;
      }
      *pbVar111 = 0;
      if (dat_len != (usize *)0x0) {
        *dat_len = (long)pbVar111 - (long)local_110;
      }
LAB_00f35866:
      pyVar117->code = 0;
      pyVar117 = &dummy_err;
      if (err != (yyjson_write_err *)0x0) {
        pyVar117 = err;
      }
      pyVar117->msg = "success";
      return (char *)(byte *)local_110;
    }
  }
  puVar154 = (uint *)(pbVar111 + 2);
  goto LAB_00f2dc2c;
LAB_00f336ed:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar116 = &dummy_err;
  if (err != (yyjson_write_err *)0x0) {
    pyVar116 = err;
  }
  pyVar117->code = 3;
  pcVar108 = "invalid JSON value type";
LAB_00f33688:
  pyVar116->msg = pcVar108;
LAB_00f336d3:
  if (local_110 != (uint *)0x0) {
    (*p_Var5)(pvVar6,local_110);
  }
  return (char *)0x0;
}

Assistant:

static char *yyjson_mut_write_opts_impl(const yyjson_mut_val *val,
                                        usize estimated_val_num,
                                        yyjson_write_flag flg,
                                        const yyjson_alc *alc_ptr,
                                        usize *dat_len,
                                        yyjson_write_err *err) {
    yyjson_write_err dummy_err;
    usize dummy_dat_len;
    yyjson_alc alc = alc_ptr ? *alc_ptr : YYJSON_DEFAULT_ALC;
    yyjson_mut_val *root = constcast(yyjson_mut_val *)val;

    err = err ? err : &dummy_err;
    dat_len = dat_len ? dat_len : &dummy_dat_len;

    if (unlikely(!root)) {
        *dat_len = 0;
        err->msg = "input JSON is NULL";
        err->code = YYJSON_WRITE_ERROR_INVALID_PARAMETER;
        return NULL;
    }

    if (!unsafe_yyjson_is_ctn(root) || unsafe_yyjson_get_len(root) == 0) {
        return (char *)yyjson_mut_write_single(root, flg, alc, dat_len, err);
    } else if (flg & (YYJSON_WRITE_PRETTY | YYJSON_WRITE_PRETTY_TWO_SPACES)) {
        return (char *)yyjson_mut_write_pretty(root, estimated_val_num,
                                               flg, alc, dat_len, err);
    } else {
        return (char *)yyjson_mut_write_minify(root, estimated_val_num,
                                               flg, alc, dat_len, err);
    }
}